

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution1D_x86_fma::forward
          (Convolution1D_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  uint uVar5;
  _func_int *p_Var6;
  _func_int **pp_Var7;
  _func_int *p_Var8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  void *pvVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int *piVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  int iVar33;
  void *pvVar34;
  long lVar35;
  void *pvVar36;
  ulong uVar37;
  long lVar38;
  uint *puVar39;
  int j_8;
  ulong uVar40;
  void *pvVar41;
  int iVar42;
  undefined1 (*pauVar43) [32];
  undefined1 (*pauVar44) [16];
  int q;
  int _elempack;
  undefined4 *puVar45;
  float *pfVar46;
  uint *puVar47;
  int j;
  int iVar48;
  int iVar49;
  float *pfVar50;
  int iVar51;
  int j_3;
  undefined1 (*pauVar52) [32];
  long lVar53;
  undefined1 (*pauVar54) [16];
  bool bVar55;
  float fVar56;
  float fVar57;
  __m128 one;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [28];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [16];
  undefined1 auVar160 [16];
  undefined1 auVar163 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar159 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar161 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar162 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar164 [16];
  undefined1 auVar248 [32];
  float fVar249;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [64];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [64];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [32];
  undefined1 auVar335 [64];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [64];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [64];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [64];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [64];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  undefined1 auVar440 [64];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  undefined1 auVar446 [64];
  __m128 one_2;
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar462 [36];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [32];
  undefined1 auVar486 [64];
  int local_d0;
  Mat local_98;
  void *local_48;
  void *local_40;
  long local_38;
  undefined1 auVar77 [32];
  undefined1 auVar81 [32];
  undefined1 auVar84 [32];
  undefined1 auVar151 [32];
  undefined1 auVar229 [32];
  undefined1 auVar238 [32];
  
  uVar37 = bottom_blob->elemsize;
  iVar4 = bottom_blob->elempack;
  p_Var6 = this->_vptr_Convolution1D_x86_fma[-3];
  iVar51 = *(int *)(&this->field_0xd4 + (long)p_Var6);
  iVar49 = *(int *)(&this->field_0xd8 + (long)p_Var6);
  local_98.cstep = 0;
  local_98.data = (Allocator *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_98.elempack = 0;
  local_98.h = 0;
  local_98.allocator = (Allocator *)local_98.data;
  local_98.dims = (int)local_98.refcount;
  local_98.w = local_98.refcount._4_4_;
  local_98.d = (int)local_98.refcount;
  local_98.c = local_98.elempack;
  Convolution1D::make_padding
            ((Convolution1D *)((long)&this->_vptr_Convolution1D_x86_fma + (long)p_Var6),bottom_blob,
             &local_98,opt);
  iVar33 = local_98.h;
  local_d0 = -100;
  if (((Allocator *)local_98.data != (Allocator *)0x0) && ((long)local_98.c * local_98.cstep != 0))
  {
    uVar5 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_fma[-3]);
    if (opt->use_packing_layout == true) {
      lVar35 = 8;
      if ((uVar5 & 7) != 0) {
        lVar35 = (ulong)((uVar5 & 3) == 0) * 3 + 1;
      }
    }
    else {
      lVar35 = 1;
    }
    _elempack = (int)lVar35;
    iVar51 = (local_98.w + ~((iVar51 + -1) * iVar49)) /
             *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_fma[-3]);
    pvVar34 = (void *)((long)(int)uVar5 / (long)_elempack & 0xffffffff);
    iVar49 = (int)((long)(int)uVar5 / (long)_elempack);
    Mat::create(top_blob,iVar51 + 1,iVar49,lVar35 * (uVar37 / (ulong)(long)iVar4),_elempack,
                opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if ((iVar4 == 8) && (_elempack == 8)) {
        uVar37 = 0;
        if (0 < iVar33) {
          uVar37 = (ulong)(uint)iVar33;
        }
        pvVar36 = (void *)0x0;
        if (0 < iVar49) {
          pvVar36 = pvVar34;
        }
        auVar138._8_4_ = 0x3f000000;
        auVar138._0_8_ = 0x3f0000003f000000;
        auVar138._12_4_ = 0x3f000000;
        auVar138._16_4_ = 0x3f000000;
        auVar138._20_4_ = 0x3f000000;
        auVar138._24_4_ = 0x3f000000;
        auVar138._28_4_ = 0x3f000000;
        auVar327 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar258 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar355._8_4_ = 0xb95e8083;
        auVar355._0_8_ = 0xb95e8083b95e8083;
        auVar355._12_4_ = 0xb95e8083;
        auVar355._16_4_ = 0xb95e8083;
        auVar355._20_4_ = 0xb95e8083;
        auVar355._24_4_ = 0xb95e8083;
        auVar355._28_4_ = 0xb95e8083;
        auVar150._8_4_ = 0x3ab743ce;
        auVar150._0_8_ = 0x3ab743ce3ab743ce;
        auVar150._12_4_ = 0x3ab743ce;
        auVar150._16_4_ = 0x3ab743ce;
        auVar150._20_4_ = 0x3ab743ce;
        auVar150._24_4_ = 0x3ab743ce;
        auVar150._28_4_ = 0x3ab743ce;
        auVar161._8_4_ = 0x3f800000;
        auVar161._0_8_ = 0x3f8000003f800000;
        auVar161._12_4_ = 0x3f800000;
        for (pvVar41 = (void *)0x0; pvVar41 != pvVar36; pvVar41 = (void *)((long)pvVar41 + 1)) {
          pauVar43 = (undefined1 (*) [32])
                     ((long)top_blob->w * (long)pvVar41 * top_blob->elemsize + (long)top_blob->data)
          ;
          pp_Var7 = this->_vptr_Convolution1D_x86_fma;
          for (iVar48 = 0; iVar48 <= iVar51; iVar48 = iVar48 + 1) {
            p_Var6 = pp_Var7[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
              auVar86 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar86 = ZEXT3264(*(undefined1 (*) [32])
                                  (*(long *)(&this->field_0x190 + (long)p_Var6) +
                                  (long)pvVar41 * 0x20));
            }
            pauVar52 = (undefined1 (*) [32])
                       ((this->weight_data_packed).cstep * (long)pvVar41 *
                        (this->weight_data_packed).elemsize + (long)(this->weight_data_packed).data)
            ;
            for (uVar40 = 0; uVar40 != uVar37; uVar40 = uVar40 + 1) {
              p_Var8 = this->_vptr_Convolution1D_x86_fma[-3];
              puVar45 = (undefined4 *)
                        ((long)(_func_int ***)local_98.data +
                        (long)(*(int *)(&this->field_0xdc + (long)p_Var8) * iVar48 * 8) * 4 +
                        (long)local_98.w * local_98.elemsize * uVar40);
              iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var8);
              if (*(int *)(&this->field_0xd4 + (long)p_Var8) < 1) {
                iVar42 = 0;
              }
              while (bVar55 = iVar42 != 0, iVar42 = iVar42 + -1, bVar55) {
                uVar1 = *puVar45;
                auVar80._4_4_ = uVar1;
                auVar80._0_4_ = uVar1;
                auVar80._8_4_ = uVar1;
                auVar80._12_4_ = uVar1;
                auVar80._16_4_ = uVar1;
                auVar80._20_4_ = uVar1;
                auVar80._24_4_ = uVar1;
                auVar80._28_4_ = uVar1;
                uVar1 = puVar45[1];
                auVar76._4_4_ = uVar1;
                auVar76._0_4_ = uVar1;
                auVar76._8_4_ = uVar1;
                auVar76._12_4_ = uVar1;
                auVar76._16_4_ = uVar1;
                auVar76._20_4_ = uVar1;
                auVar76._24_4_ = uVar1;
                auVar76._28_4_ = uVar1;
                uVar1 = puVar45[2];
                auVar253._4_4_ = uVar1;
                auVar253._0_4_ = uVar1;
                auVar253._8_4_ = uVar1;
                auVar253._12_4_ = uVar1;
                auVar253._16_4_ = uVar1;
                auVar253._20_4_ = uVar1;
                auVar253._24_4_ = uVar1;
                auVar253._28_4_ = uVar1;
                uVar1 = puVar45[3];
                auVar133._4_4_ = uVar1;
                auVar133._0_4_ = uVar1;
                auVar133._8_4_ = uVar1;
                auVar133._12_4_ = uVar1;
                auVar133._16_4_ = uVar1;
                auVar133._20_4_ = uVar1;
                auVar133._24_4_ = uVar1;
                auVar133._28_4_ = uVar1;
                uVar1 = puVar45[4];
                auVar408._4_4_ = uVar1;
                auVar408._0_4_ = uVar1;
                auVar408._8_4_ = uVar1;
                auVar408._12_4_ = uVar1;
                auVar408._16_4_ = uVar1;
                auVar408._20_4_ = uVar1;
                auVar408._24_4_ = uVar1;
                auVar408._28_4_ = uVar1;
                uVar1 = puVar45[5];
                auVar450._4_4_ = uVar1;
                auVar450._0_4_ = uVar1;
                auVar450._8_4_ = uVar1;
                auVar450._12_4_ = uVar1;
                auVar450._16_4_ = uVar1;
                auVar450._20_4_ = uVar1;
                auVar450._24_4_ = uVar1;
                auVar450._28_4_ = uVar1;
                uVar1 = puVar45[6];
                auVar428._4_4_ = uVar1;
                auVar428._0_4_ = uVar1;
                auVar428._8_4_ = uVar1;
                auVar428._12_4_ = uVar1;
                auVar428._16_4_ = uVar1;
                auVar428._20_4_ = uVar1;
                auVar428._24_4_ = uVar1;
                auVar428._28_4_ = uVar1;
                uVar1 = puVar45[7];
                auVar437._4_4_ = uVar1;
                auVar437._0_4_ = uVar1;
                auVar437._8_4_ = uVar1;
                auVar437._12_4_ = uVar1;
                auVar437._16_4_ = uVar1;
                auVar437._20_4_ = uVar1;
                auVar437._24_4_ = uVar1;
                auVar437._28_4_ = uVar1;
                auVar158 = vfmadd132ps_fma(auVar80,auVar86._0_32_,*pauVar52);
                auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar76,pauVar52[1]);
                auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar253,pauVar52[2]);
                auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar133,pauVar52[3]);
                auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar408,pauVar52[4]);
                auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar450,pauVar52[5]);
                auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar428,pauVar52[6]);
                auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar437,pauVar52[7]);
                puVar45 = puVar45 + (long)*(int *)(&this->field_0xd8 + (long)p_Var8) * 8;
                pauVar52 = pauVar52 + 8;
                auVar86 = ZEXT1664(auVar158);
              }
            }
            auVar76 = auVar86._0_32_;
            auVar80 = auVar76;
            if (5 < *(int *)(&this->field_0xf4 + (long)p_Var6) - 1U) goto switchD_004b9cb8_caseD_1;
            auVar253 = auVar258._0_32_;
            auVar80 = vmaxps_avx(auVar76,auVar253);
            auVar462 = ZEXT436(auVar80._28_4_);
            auVar133 = auVar327._0_32_;
            fVar57 = auVar327._0_4_;
            fVar56 = auVar327._4_4_;
            fVar2 = auVar327._8_4_;
            fVar3 = auVar327._12_4_;
            fVar249 = auVar327._16_4_;
            fVar13 = auVar327._20_4_;
            fVar14 = auVar327._24_4_;
            fVar15 = auVar327._28_4_;
            switch(*(int *)(&this->field_0xf4 + (long)p_Var6)) {
            case 2:
              auVar76 = vminps_avx(auVar76,auVar253);
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
              auVar119._4_4_ = uVar1;
              auVar119._0_4_ = uVar1;
              auVar119._8_4_ = uVar1;
              auVar119._12_4_ = uVar1;
              auVar119._16_4_ = uVar1;
              auVar119._20_4_ = uVar1;
              auVar119._24_4_ = uVar1;
              auVar119._28_4_ = uVar1;
              auVar158 = vfmadd231ps_fma(auVar80,auVar76,auVar119);
              auVar80 = ZEXT1632(auVar158);
              break;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
              auVar126._4_4_ = uVar1;
              auVar126._0_4_ = uVar1;
              auVar126._8_4_ = uVar1;
              auVar126._12_4_ = uVar1;
              auVar126._16_4_ = uVar1;
              auVar126._20_4_ = uVar1;
              auVar126._24_4_ = uVar1;
              auVar126._28_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
              auVar452._4_4_ = uVar1;
              auVar452._0_4_ = uVar1;
              auVar452._8_4_ = uVar1;
              auVar452._12_4_ = uVar1;
              auVar452._16_4_ = uVar1;
              auVar452._20_4_ = uVar1;
              auVar452._24_4_ = uVar1;
              auVar452._28_4_ = uVar1;
              auVar80 = vmaxps_avx(auVar76,auVar126);
              auVar80 = vminps_avx(auVar452,auVar80);
              break;
            case 4:
              auVar75._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
              auVar75._8_4_ = -auVar86._8_4_;
              auVar75._12_4_ = -auVar86._12_4_;
              auVar75._16_4_ = -auVar86._16_4_;
              auVar75._20_4_ = -auVar86._20_4_;
              auVar75._24_4_ = -auVar86._24_4_;
              auVar75._28_4_ = auVar86._28_4_ ^ 0x80000000;
              auVar127._8_4_ = 0x42b0c0a5;
              auVar127._0_8_ = 0x42b0c0a542b0c0a5;
              auVar127._12_4_ = 0x42b0c0a5;
              auVar127._16_4_ = 0x42b0c0a5;
              auVar127._20_4_ = 0x42b0c0a5;
              auVar127._24_4_ = 0x42b0c0a5;
              auVar127._28_4_ = 0x42b0c0a5;
              auVar80 = vminps_avx(auVar75,auVar127);
              auVar128._8_4_ = 0xc2b0c0a5;
              auVar128._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar128._12_4_ = 0xc2b0c0a5;
              auVar128._16_4_ = 0xc2b0c0a5;
              auVar128._20_4_ = 0xc2b0c0a5;
              auVar128._24_4_ = 0xc2b0c0a5;
              auVar128._28_4_ = 0xc2b0c0a5;
              auVar76 = vmaxps_avx(auVar80,auVar128);
              auVar129._8_4_ = 0x3fb8aa3b;
              auVar129._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar129._12_4_ = 0x3fb8aa3b;
              auVar129._16_4_ = 0x3fb8aa3b;
              auVar129._20_4_ = 0x3fb8aa3b;
              auVar129._24_4_ = 0x3fb8aa3b;
              auVar129._28_4_ = 0x3fb8aa3b;
              auVar158 = vfmadd213ps_fma(auVar129,auVar76,auVar138);
              auVar253 = vroundps_avx(ZEXT1632(auVar158),1);
              auVar80 = vcmpps_avx(ZEXT1632(auVar158),auVar253,1);
              auVar80 = vandps_avx(auVar80,auVar133);
              auVar80 = vsubps_avx(auVar253,auVar80);
              auVar221._8_4_ = 0x3f318000;
              auVar221._0_8_ = 0x3f3180003f318000;
              auVar221._12_4_ = 0x3f318000;
              auVar221._16_4_ = 0x3f318000;
              auVar221._20_4_ = 0x3f318000;
              auVar221._24_4_ = 0x3f318000;
              auVar221._28_4_ = 0x3f318000;
              auVar158 = vfmsub231ps_fma(auVar76,auVar80,auVar221);
              auVar222._8_4_ = 0x395e8083;
              auVar222._0_8_ = 0x395e8083395e8083;
              auVar222._12_4_ = 0x395e8083;
              auVar222._16_4_ = 0x395e8083;
              auVar222._20_4_ = 0x395e8083;
              auVar222._24_4_ = 0x395e8083;
              auVar222._28_4_ = 0x395e8083;
              auVar358 = vfmsub231ps_fma(ZEXT1632(auVar158),auVar80,auVar222);
              auVar76 = ZEXT1632(auVar358);
              auVar19._28_4_ = auVar253._28_4_;
              auVar19._0_28_ =
                   ZEXT1628(CONCAT412(auVar358._12_4_ * auVar358._12_4_,
                                      CONCAT48(auVar358._8_4_ * auVar358._8_4_,
                                               CONCAT44(auVar358._4_4_ * auVar358._4_4_,
                                                        auVar358._0_4_ * auVar358._0_4_))));
              auVar385._8_4_ = 0x39506967;
              auVar385._0_8_ = 0x3950696739506967;
              auVar385._12_4_ = 0x39506967;
              auVar385._16_4_ = 0x39506967;
              auVar385._20_4_ = 0x39506967;
              auVar385._24_4_ = 0x39506967;
              auVar385._28_4_ = 0x39506967;
              auVar223._8_4_ = 0x3ab743ce;
              auVar223._0_8_ = 0x3ab743ce3ab743ce;
              auVar223._12_4_ = 0x3ab743ce;
              auVar223._16_4_ = 0x3ab743ce;
              auVar223._20_4_ = 0x3ab743ce;
              auVar223._24_4_ = 0x3ab743ce;
              auVar223._28_4_ = 0x3ab743ce;
              auVar158 = vfmadd213ps_fma(auVar385,auVar76,auVar223);
              auVar224._8_4_ = 0x3c088908;
              auVar224._0_8_ = 0x3c0889083c088908;
              auVar224._12_4_ = 0x3c088908;
              auVar224._16_4_ = 0x3c088908;
              auVar224._20_4_ = 0x3c088908;
              auVar224._24_4_ = 0x3c088908;
              auVar224._28_4_ = 0x3c088908;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar76,auVar224);
              auVar225._8_4_ = 0x3d2aa9c1;
              auVar225._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar225._12_4_ = 0x3d2aa9c1;
              auVar225._16_4_ = 0x3d2aa9c1;
              auVar225._20_4_ = 0x3d2aa9c1;
              auVar225._24_4_ = 0x3d2aa9c1;
              auVar225._28_4_ = 0x3d2aa9c1;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar76,auVar225);
              auVar226._8_4_ = 0x3e2aaaaa;
              auVar226._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar226._12_4_ = 0x3e2aaaaa;
              auVar226._16_4_ = 0x3e2aaaaa;
              auVar226._20_4_ = 0x3e2aaaaa;
              auVar226._24_4_ = 0x3e2aaaaa;
              auVar226._28_4_ = 0x3e2aaaaa;
              auVar76 = ZEXT1632(auVar358);
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar76,auVar226);
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar76,auVar138);
              auVar398 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar19,auVar76);
              auVar58._0_4_ = (int)auVar80._0_4_;
              auVar58._4_4_ = (int)auVar80._4_4_;
              auVar58._8_4_ = (int)auVar80._8_4_;
              auVar58._12_4_ = (int)auVar80._12_4_;
              auVar77._16_4_ = (int)auVar80._16_4_;
              auVar77._0_16_ = auVar58;
              auVar77._20_4_ = (int)auVar80._20_4_;
              auVar77._24_4_ = (int)auVar80._24_4_;
              auVar77._28_4_ = (int)auVar80._28_4_;
              auVar358 = vpslld_avx(auVar58,0x17);
              auVar158 = vpslld_avx(auVar77._16_16_,0x17);
              auVar159._8_4_ = 0x3f800000;
              auVar159._0_8_ = 0x3f8000003f800000;
              auVar159._12_4_ = 0x3f800000;
              auVar158 = vpaddd_avx(auVar158,auVar159);
              auVar358 = vpaddd_avx(auVar358,auVar159);
              auVar453._16_16_ = auVar158;
              auVar453._0_16_ = auVar358;
              auVar78._0_4_ = auVar398._0_4_ + fVar57;
              auVar78._4_4_ = auVar398._4_4_ + fVar56;
              auVar78._8_4_ = auVar398._8_4_ + fVar2;
              auVar78._12_4_ = auVar398._12_4_ + fVar3;
              auVar78._16_4_ = fVar249 + 0.0;
              auVar78._20_4_ = fVar13 + 0.0;
              auVar78._24_4_ = fVar14 + 0.0;
              auVar78._28_4_ = fVar15 + 0.0;
              auVar158 = vfmadd213ps_fma(auVar453,auVar78,auVar133);
              auVar80 = vrcpps_avx(ZEXT1632(auVar158));
              auVar158 = vfmsub213ps_fma(ZEXT1632(auVar158),auVar80,auVar133);
              auVar158 = vfnmadd132ps_fma(ZEXT1632(auVar158),auVar80,auVar80);
              auVar80 = ZEXT1632(auVar158);
              break;
            case 5:
              auVar429._8_4_ = 0x42b0c0a5;
              auVar429._0_8_ = 0x42b0c0a542b0c0a5;
              auVar429._12_4_ = 0x42b0c0a5;
              auVar429._16_4_ = 0x42b0c0a5;
              auVar429._20_4_ = 0x42b0c0a5;
              auVar429._24_4_ = 0x42b0c0a5;
              auVar429._28_4_ = 0x42b0c0a5;
              auVar80 = vminps_avx(auVar429,auVar76);
              auVar438._8_4_ = 0xc2b0c0a5;
              auVar438._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar438._12_4_ = 0xc2b0c0a5;
              auVar438._16_4_ = 0xc2b0c0a5;
              auVar438._20_4_ = 0xc2b0c0a5;
              auVar438._24_4_ = 0xc2b0c0a5;
              auVar438._28_4_ = 0xc2b0c0a5;
              auVar76 = vmaxps_avx(auVar438,auVar80);
              auVar381._8_4_ = 0x3fb8aa3b;
              auVar381._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar381._12_4_ = 0x3fb8aa3b;
              auVar381._16_4_ = 0x3fb8aa3b;
              auVar381._20_4_ = 0x3fb8aa3b;
              auVar381._24_4_ = 0x3fb8aa3b;
              auVar381._28_4_ = 0x3fb8aa3b;
              auVar158 = vfmadd213ps_fma(auVar381,auVar76,auVar138);
              auVar253 = vroundps_avx(ZEXT1632(auVar158),1);
              auVar80 = vcmpps_avx(ZEXT1632(auVar158),auVar253,1);
              auVar80 = vandps_avx(auVar80,auVar133);
              auVar80 = vsubps_avx(auVar253,auVar80);
              auVar347._8_4_ = 0x3f318000;
              auVar347._0_8_ = 0x3f3180003f318000;
              auVar347._12_4_ = 0x3f318000;
              auVar347._16_4_ = 0x3f318000;
              auVar347._20_4_ = 0x3f318000;
              auVar347._24_4_ = 0x3f318000;
              auVar347._28_4_ = 0x3f318000;
              auVar158 = vfmsub231ps_fma(auVar76,auVar80,auVar347);
              auVar358 = vfnmsub231ps_fma(ZEXT1632(auVar158),auVar80,auVar355);
              auVar76 = ZEXT1632(auVar358);
              auVar16._28_4_ = auVar253._28_4_;
              auVar16._0_28_ =
                   ZEXT1628(CONCAT412(auVar358._12_4_ * auVar358._12_4_,
                                      CONCAT48(auVar358._8_4_ * auVar358._8_4_,
                                               CONCAT44(auVar358._4_4_ * auVar358._4_4_,
                                                        auVar358._0_4_ * auVar358._0_4_))));
              auVar214._8_4_ = 0x39506967;
              auVar214._0_8_ = 0x3950696739506967;
              auVar214._12_4_ = 0x39506967;
              auVar214._16_4_ = 0x39506967;
              auVar214._20_4_ = 0x39506967;
              auVar214._24_4_ = 0x39506967;
              auVar214._28_4_ = 0x39506967;
              auVar158 = vfmadd213ps_fma(auVar214,auVar76,auVar150);
              auVar254._8_4_ = 0x3c088908;
              auVar254._0_8_ = 0x3c0889083c088908;
              auVar254._12_4_ = 0x3c088908;
              auVar254._16_4_ = 0x3c088908;
              auVar254._20_4_ = 0x3c088908;
              auVar254._24_4_ = 0x3c088908;
              auVar254._28_4_ = 0x3c088908;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar76,auVar254);
              auVar307._8_4_ = 0x3d2aa9c1;
              auVar307._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar307._12_4_ = 0x3d2aa9c1;
              auVar307._16_4_ = 0x3d2aa9c1;
              auVar307._20_4_ = 0x3d2aa9c1;
              auVar307._24_4_ = 0x3d2aa9c1;
              auVar307._28_4_ = 0x3d2aa9c1;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar76,auVar307);
              auVar292._8_4_ = 0x3e2aaaaa;
              auVar292._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar292._12_4_ = 0x3e2aaaaa;
              auVar292._16_4_ = 0x3e2aaaaa;
              auVar292._20_4_ = 0x3e2aaaaa;
              auVar292._24_4_ = 0x3e2aaaaa;
              auVar292._28_4_ = 0x3e2aaaaa;
              auVar76 = ZEXT1632(auVar358);
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar76,auVar292);
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar76,auVar138);
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar16,auVar76);
              auVar120._0_4_ = auVar158._0_4_ + fVar57;
              auVar120._4_4_ = auVar158._4_4_ + fVar56;
              auVar120._8_4_ = auVar158._8_4_ + fVar2;
              auVar120._12_4_ = auVar158._12_4_ + fVar3;
              auVar120._16_4_ = fVar249 + 0.0;
              auVar120._20_4_ = fVar13 + 0.0;
              auVar120._24_4_ = fVar14 + 0.0;
              auVar120._28_4_ = fVar15 + 0.0;
              auVar358._0_4_ = (int)auVar80._0_4_;
              auVar358._4_4_ = (int)auVar80._4_4_;
              auVar358._8_4_ = (int)auVar80._8_4_;
              auVar358._12_4_ = (int)auVar80._12_4_;
              auVar215._16_4_ = (int)auVar80._16_4_;
              auVar215._0_16_ = auVar358;
              auVar215._20_4_ = (int)auVar80._20_4_;
              auVar215._24_4_ = (int)auVar80._24_4_;
              auVar215._28_4_ = (int)auVar80._28_4_;
              auVar358 = vpslld_avx(auVar358,0x17);
              auVar158 = vpslld_avx(auVar215._16_16_,0x17);
              auVar158 = vpaddd_avx(auVar158,auVar161);
              auVar358 = vpaddd_avx(auVar358,auVar161);
              auVar451._16_16_ = auVar158;
              auVar451._0_16_ = auVar358;
              auVar398 = vfmadd213ps_fma(auVar451,auVar120,auVar133);
              auVar462 = (undefined1  [36])0x0;
              auVar121._8_4_ = 0x800000;
              auVar121._0_8_ = 0x80000000800000;
              auVar121._12_4_ = 0x800000;
              auVar121._16_4_ = 0x800000;
              auVar121._20_4_ = 0x800000;
              auVar121._24_4_ = 0x800000;
              auVar121._28_4_ = 0x800000;
              auVar80 = vmaxps_avx(ZEXT1632(auVar398),auVar121);
              auVar358 = vpsrld_avx(auVar80._0_16_,0x17);
              auVar158 = vpsrld_avx(auVar80._16_16_,0x17);
              auVar293._8_4_ = 0x807fffff;
              auVar293._0_8_ = 0x807fffff807fffff;
              auVar293._12_4_ = 0x807fffff;
              auVar293._16_4_ = 0x807fffff;
              auVar293._20_4_ = 0x807fffff;
              auVar293._24_4_ = 0x807fffff;
              auVar293._28_4_ = 0x807fffff;
              auVar80 = vandps_avx(auVar80,auVar293);
              auVar253 = vorps_avx(auVar138,auVar80);
              auVar294._8_4_ = 0x3f3504f3;
              auVar294._0_8_ = 0x3f3504f33f3504f3;
              auVar294._12_4_ = 0x3f3504f3;
              auVar294._16_4_ = 0x3f3504f3;
              auVar294._20_4_ = 0x3f3504f3;
              auVar294._24_4_ = 0x3f3504f3;
              auVar294._28_4_ = 0x3f3504f3;
              auVar76 = vcmpps_avx(auVar294,auVar253,2);
              auVar80 = vandnps_avx(auVar76,auVar253);
              auVar430._8_4_ = 0xbf800000;
              auVar430._0_8_ = 0xbf800000bf800000;
              auVar430._12_4_ = 0xbf800000;
              auVar430._16_4_ = 0xbf800000;
              auVar430._20_4_ = 0xbf800000;
              auVar430._24_4_ = 0xbf800000;
              auVar430._28_4_ = 0xbf800000;
              auVar122._0_4_ = auVar80._0_4_ + auVar253._0_4_ + -1.0;
              auVar122._4_4_ = auVar80._4_4_ + auVar253._4_4_ + -1.0;
              auVar122._8_4_ = auVar80._8_4_ + auVar253._8_4_ + -1.0;
              auVar122._12_4_ = auVar80._12_4_ + auVar253._12_4_ + -1.0;
              auVar122._16_4_ = auVar80._16_4_ + auVar253._16_4_ + -1.0;
              auVar122._20_4_ = auVar80._20_4_ + auVar253._20_4_ + -1.0;
              auVar122._24_4_ = auVar80._24_4_ + auVar253._24_4_ + -1.0;
              auVar122._28_4_ = auVar80._28_4_ + auVar253._28_4_ + -1.0;
              auVar158 = vpsubd_avx(auVar158,auVar76._16_16_);
              auVar393._8_4_ = 0xffffff81;
              auVar393._0_8_ = 0xffffff81ffffff81;
              auVar393._12_4_ = 0xffffff81;
              auVar158 = vpaddd_avx(auVar158,auVar393);
              auVar358 = vpsubd_avx(auVar358,auVar76._0_16_);
              auVar358 = vpaddd_avx(auVar393,auVar358);
              auVar216._16_16_ = auVar158;
              auVar216._0_16_ = auVar358;
              auVar17._4_4_ = auVar122._4_4_ * auVar122._4_4_;
              auVar17._0_4_ = auVar122._0_4_ * auVar122._0_4_;
              auVar17._8_4_ = auVar122._8_4_ * auVar122._8_4_;
              auVar17._12_4_ = auVar122._12_4_ * auVar122._12_4_;
              auVar17._16_4_ = auVar122._16_4_ * auVar122._16_4_;
              auVar17._20_4_ = auVar122._20_4_ * auVar122._20_4_;
              auVar17._24_4_ = auVar122._24_4_ * auVar122._24_4_;
              auVar17._28_4_ = auVar76._28_4_;
              auVar382._8_4_ = 0x3d9021bb;
              auVar382._0_8_ = 0x3d9021bb3d9021bb;
              auVar382._12_4_ = 0x3d9021bb;
              auVar382._16_4_ = 0x3d9021bb;
              auVar382._20_4_ = 0x3d9021bb;
              auVar382._24_4_ = 0x3d9021bb;
              auVar382._28_4_ = 0x3d9021bb;
              auVar409._8_4_ = 0xbdebd1b8;
              auVar409._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar409._12_4_ = 0xbdebd1b8;
              auVar409._16_4_ = 0xbdebd1b8;
              auVar409._20_4_ = 0xbdebd1b8;
              auVar409._24_4_ = 0xbdebd1b8;
              auVar409._28_4_ = 0xbdebd1b8;
              auVar158 = vfmadd213ps_fma(auVar382,auVar122,auVar409);
              auVar410._8_4_ = 0x3def251a;
              auVar410._0_8_ = 0x3def251a3def251a;
              auVar410._12_4_ = 0x3def251a;
              auVar410._16_4_ = 0x3def251a;
              auVar410._20_4_ = 0x3def251a;
              auVar410._24_4_ = 0x3def251a;
              auVar410._28_4_ = 0x3def251a;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar122,auVar410);
              auVar411._8_4_ = 0xbdfe5d4f;
              auVar411._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar411._12_4_ = 0xbdfe5d4f;
              auVar411._16_4_ = 0xbdfe5d4f;
              auVar411._20_4_ = 0xbdfe5d4f;
              auVar411._24_4_ = 0xbdfe5d4f;
              auVar411._28_4_ = 0xbdfe5d4f;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar122,auVar411);
              auVar412._8_4_ = 0x3e11e9bf;
              auVar412._0_8_ = 0x3e11e9bf3e11e9bf;
              auVar412._12_4_ = 0x3e11e9bf;
              auVar412._16_4_ = 0x3e11e9bf;
              auVar412._20_4_ = 0x3e11e9bf;
              auVar412._24_4_ = 0x3e11e9bf;
              auVar412._28_4_ = 0x3e11e9bf;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar122,auVar412);
              auVar413._8_4_ = 0xbe2aae50;
              auVar413._0_8_ = 0xbe2aae50be2aae50;
              auVar413._12_4_ = 0xbe2aae50;
              auVar413._16_4_ = 0xbe2aae50;
              auVar413._20_4_ = 0xbe2aae50;
              auVar413._24_4_ = 0xbe2aae50;
              auVar413._28_4_ = 0xbe2aae50;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar122,auVar413);
              auVar414._8_4_ = 0x3e4cceac;
              auVar414._0_8_ = 0x3e4cceac3e4cceac;
              auVar414._12_4_ = 0x3e4cceac;
              auVar414._16_4_ = 0x3e4cceac;
              auVar414._20_4_ = 0x3e4cceac;
              auVar414._24_4_ = 0x3e4cceac;
              auVar414._28_4_ = 0x3e4cceac;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar122,auVar414);
              auVar415._8_4_ = 0xbe7ffffc;
              auVar415._0_8_ = 0xbe7ffffcbe7ffffc;
              auVar415._12_4_ = 0xbe7ffffc;
              auVar415._16_4_ = 0xbe7ffffc;
              auVar415._20_4_ = 0xbe7ffffc;
              auVar415._24_4_ = 0xbe7ffffc;
              auVar415._28_4_ = 0xbe7ffffc;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar122,auVar415);
              auVar416._8_4_ = 0x3eaaaaaa;
              auVar416._0_8_ = 0x3eaaaaaa3eaaaaaa;
              auVar416._12_4_ = 0x3eaaaaaa;
              auVar416._16_4_ = 0x3eaaaaaa;
              auVar416._20_4_ = 0x3eaaaaaa;
              auVar416._24_4_ = 0x3eaaaaaa;
              auVar416._28_4_ = 0x3eaaaaaa;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar122,auVar416);
              auVar383._0_4_ = auVar122._0_4_ * auVar122._0_4_ * auVar122._0_4_ * auVar158._0_4_;
              auVar383._4_4_ = auVar122._4_4_ * auVar122._4_4_ * auVar122._4_4_ * auVar158._4_4_;
              auVar383._8_4_ = auVar122._8_4_ * auVar122._8_4_ * auVar122._8_4_ * auVar158._8_4_;
              auVar383._12_4_ =
                   auVar122._12_4_ * auVar122._12_4_ * auVar122._12_4_ * auVar158._12_4_;
              auVar383._16_4_ = auVar122._16_4_ * auVar122._16_4_ * auVar122._16_4_ * 0.0;
              auVar383._20_4_ = auVar122._20_4_ * auVar122._20_4_ * auVar122._20_4_ * 0.0;
              auVar383._24_4_ = auVar122._24_4_ * auVar122._24_4_ * auVar122._24_4_ * 0.0;
              auVar383._28_4_ = 0;
              auVar76 = vcvtdq2ps_avx(auVar216);
              auVar158 = vfmadd231ps_fma(auVar383,auVar76,auVar355);
              auVar158 = vfmsub231ps_fma(ZEXT1632(auVar158),auVar138,auVar17);
              auVar80 = vcmpps_avx(ZEXT1632(auVar398),_DAT_004dd0e0,2);
              auVar253 = vsubps_avx(ZEXT1632(auVar158),auVar122);
              auVar158 = vfmsub231ps_fma(auVar253,auVar347,auVar76);
              auVar417._8_4_ = 0xc0000000;
              auVar417._0_8_ = 0xc0000000c0000000;
              auVar417._12_4_ = 0xc0000000;
              auVar417._16_4_ = 0xc0000000;
              auVar417._20_4_ = 0xc0000000;
              auVar417._24_4_ = 0xc0000000;
              auVar417._28_4_ = 0xc0000000;
              auVar123._0_4_ = auVar158._0_4_ * -2.0;
              auVar123._4_4_ = auVar158._4_4_ * -2.0;
              auVar123._8_4_ = auVar158._8_4_ * -2.0;
              auVar123._12_4_ = auVar158._12_4_ * -2.0;
              auVar123._16_4_ = 0x80000000;
              auVar123._20_4_ = 0x80000000;
              auVar123._24_4_ = 0x80000000;
              auVar123._28_4_ = 0;
              auVar217._8_4_ = 0x7fffffff;
              auVar217._0_8_ = 0x7fffffff7fffffff;
              auVar217._12_4_ = 0x7fffffff;
              auVar217._16_4_ = 0x7fffffff;
              auVar217._20_4_ = 0x7fffffff;
              auVar217._24_4_ = 0x7fffffff;
              auVar217._28_4_ = 0x7fffffff;
              auVar80 = vblendvps_avx(auVar123,auVar217,auVar80);
              auVar218._8_4_ = 0x42b0c0a5;
              auVar218._0_8_ = 0x42b0c0a542b0c0a5;
              auVar218._12_4_ = 0x42b0c0a5;
              auVar218._16_4_ = 0x42b0c0a5;
              auVar218._20_4_ = 0x42b0c0a5;
              auVar218._24_4_ = 0x42b0c0a5;
              auVar218._28_4_ = 0x42b0c0a5;
              auVar80 = vminps_avx(auVar80,auVar218);
              auVar76 = vmaxps_avx(auVar438,auVar80);
              auVar219._8_4_ = 0x3fb8aa3b;
              auVar219._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar219._12_4_ = 0x3fb8aa3b;
              auVar219._16_4_ = 0x3fb8aa3b;
              auVar219._20_4_ = 0x3fb8aa3b;
              auVar219._24_4_ = 0x3fb8aa3b;
              auVar219._28_4_ = 0x3fb8aa3b;
              auVar158 = vfmadd213ps_fma(auVar219,auVar76,auVar138);
              auVar253 = vroundps_avx(ZEXT1632(auVar158),1);
              auVar80 = vcmpps_avx(ZEXT1632(auVar158),auVar253,1);
              auVar80 = vandps_avx(auVar80,auVar133);
              auVar80 = vsubps_avx(auVar253,auVar80);
              auVar158 = vfmsub231ps_fma(auVar76,auVar80,auVar347);
              auVar358 = vfnmsub231ps_fma(ZEXT1632(auVar158),auVar80,auVar355);
              auVar76 = ZEXT1632(auVar358);
              auVar18._28_4_ = auVar253._28_4_;
              auVar18._0_28_ =
                   ZEXT1628(CONCAT412(auVar358._12_4_ * auVar358._12_4_,
                                      CONCAT48(auVar358._8_4_ * auVar358._8_4_,
                                               CONCAT44(auVar358._4_4_ * auVar358._4_4_,
                                                        auVar358._0_4_ * auVar358._0_4_))));
              auVar384._8_4_ = 0x39506967;
              auVar384._0_8_ = 0x3950696739506967;
              auVar384._12_4_ = 0x39506967;
              auVar384._16_4_ = 0x39506967;
              auVar384._20_4_ = 0x39506967;
              auVar384._24_4_ = 0x39506967;
              auVar384._28_4_ = 0x39506967;
              auVar158 = vfmadd213ps_fma(auVar384,auVar76,auVar150);
              auVar348._8_4_ = 0x3c088908;
              auVar348._0_8_ = 0x3c0889083c088908;
              auVar348._12_4_ = 0x3c088908;
              auVar348._16_4_ = 0x3c088908;
              auVar348._20_4_ = 0x3c088908;
              auVar348._24_4_ = 0x3c088908;
              auVar348._28_4_ = 0x3c088908;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar76,auVar348);
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar76,auVar307);
              auVar327 = ZEXT3264(auVar133);
              auVar258 = ZEXT864(0) << 0x20;
              auVar349._8_4_ = 0x3e2aaaaa;
              auVar349._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar349._12_4_ = 0x3e2aaaaa;
              auVar349._16_4_ = 0x3e2aaaaa;
              auVar349._20_4_ = 0x3e2aaaaa;
              auVar349._24_4_ = 0x3e2aaaaa;
              auVar349._28_4_ = 0x3e2aaaaa;
              auVar76 = ZEXT1632(auVar358);
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar76,auVar349);
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar76,auVar138);
              auVar398 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar18,auVar76);
              auVar158._0_4_ = (int)auVar80._0_4_;
              auVar158._4_4_ = (int)auVar80._4_4_;
              auVar158._8_4_ = (int)auVar80._8_4_;
              auVar158._12_4_ = (int)auVar80._12_4_;
              auVar124._16_4_ = (int)auVar80._16_4_;
              auVar124._0_16_ = auVar158;
              auVar124._20_4_ = (int)auVar80._20_4_;
              auVar124._24_4_ = (int)auVar80._24_4_;
              auVar124._28_4_ = (int)auVar80._28_4_;
              auVar358 = vpslld_avx(auVar158,0x17);
              auVar158 = vpslld_avx(auVar124._16_16_,0x17);
              auVar158 = vpaddd_avx(auVar158,auVar161);
              auVar358 = vpaddd_avx(auVar358,auVar161);
              auVar125._16_16_ = auVar158;
              auVar125._0_16_ = auVar358;
              auVar220._0_4_ = auVar398._0_4_ + fVar57;
              auVar220._4_4_ = auVar398._4_4_ + fVar56;
              auVar220._8_4_ = auVar398._8_4_ + fVar2;
              auVar220._12_4_ = auVar398._12_4_ + fVar3;
              auVar220._16_4_ = fVar249 + 0.0;
              auVar220._20_4_ = fVar13 + 0.0;
              auVar220._24_4_ = fVar14 + 0.0;
              auVar220._28_4_ = fVar15 + 0.0;
              auVar158 = vfmadd213ps_fma(auVar125,auVar220,auVar133);
              auVar80 = vrcpps_avx(ZEXT1632(auVar158));
              auVar158 = vfmsub213ps_fma(ZEXT1632(auVar158),auVar80,auVar133);
              auVar158 = vfnmadd132ps_fma(ZEXT1632(auVar158),auVar80,auVar80);
              auVar158 = vfnmadd213ps_fma(ZEXT1632(auVar158),auVar417,auVar430);
              auVar118 = ZEXT1628(auVar158);
              goto LAB_004ba0d3;
            case 6:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
              auVar130._4_4_ = uVar1;
              auVar130._0_4_ = uVar1;
              auVar130._8_4_ = uVar1;
              auVar130._12_4_ = uVar1;
              auVar130._16_4_ = uVar1;
              auVar130._20_4_ = uVar1;
              auVar130._24_4_ = uVar1;
              auVar130._28_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
              auVar227._4_4_ = uVar1;
              auVar227._0_4_ = uVar1;
              auVar227._8_4_ = uVar1;
              auVar227._12_4_ = uVar1;
              auVar227._16_4_ = uVar1;
              auVar227._20_4_ = uVar1;
              auVar227._24_4_ = uVar1;
              auVar227._28_4_ = uVar1;
              auVar158 = vfmadd231ps_fma(auVar227,auVar76,auVar130);
              auVar80 = vmaxps_avx(ZEXT1632(auVar158),auVar253);
              auVar80 = vminps_avx(auVar80,auVar133);
              auVar118 = auVar80._0_28_;
LAB_004ba0d3:
              auVar335._0_4_ = auVar118._0_4_ * auVar86._0_4_;
              auVar335._4_4_ = auVar118._4_4_ * auVar86._4_4_;
              auVar335._8_4_ = auVar118._8_4_ * auVar86._8_4_;
              auVar335._12_4_ = auVar118._12_4_ * auVar86._12_4_;
              auVar335._16_4_ = auVar118._16_4_ * auVar86._16_4_;
              auVar335._20_4_ = auVar118._20_4_ * auVar86._20_4_;
              auVar335._24_4_ = auVar118._24_4_ * auVar86._24_4_;
              auVar335._28_36_ = auVar462;
              auVar80 = auVar335._0_32_;
            }
switchD_004b9cb8_caseD_1:
            *pauVar43 = auVar80;
            pauVar43 = pauVar43 + 1;
          }
        }
      }
      if ((iVar4 == 1) && (_elempack == 8)) {
        uVar37 = 0;
        if (0 < iVar33) {
          uVar37 = (ulong)(uint)iVar33;
        }
        pvVar36 = (void *)0x0;
        if (0 < iVar49) {
          pvVar36 = pvVar34;
        }
        auVar432 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar258 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar440 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar327 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar335 = ZEXT3264(CONCAT428(0x3f318000,
                                      CONCAT424(0x3f318000,
                                                CONCAT420(0x3f318000,
                                                          CONCAT416(0x3f318000,
                                                                    CONCAT412(0x3f318000,
                                                                              CONCAT48(0x3f318000,
                                                                                                                                                                              
                                                  0x3f3180003f318000)))))));
        auVar357 = ZEXT3264(CONCAT428(0x3ab743ce,
                                      CONCAT424(0x3ab743ce,
                                                CONCAT420(0x3ab743ce,
                                                          CONCAT416(0x3ab743ce,
                                                                    CONCAT412(0x3ab743ce,
                                                                              CONCAT48(0x3ab743ce,
                                                                                                                                                                              
                                                  0x3ab743ce3ab743ce)))))));
        auVar446 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        auVar351 = ZEXT3264(CONCAT428(0x3c088908,
                                      CONCAT424(0x3c088908,
                                                CONCAT420(0x3c088908,
                                                          CONCAT416(0x3c088908,
                                                                    CONCAT412(0x3c088908,
                                                                              CONCAT48(0x3c088908,
                                                                                                                                                                              
                                                  0x3c0889083c088908)))))));
        auVar486 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                      CONCAT424(0x3d2aa9c1,
                                                CONCAT420(0x3d2aa9c1,
                                                          CONCAT416(0x3d2aa9c1,
                                                                    CONCAT412(0x3d2aa9c1,
                                                                              CONCAT48(0x3d2aa9c1,
                                                                                                                                                                              
                                                  0x3d2aa9c13d2aa9c1)))))));
        auVar86 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                     CONCAT424(0x3e2aaaaa,
                                               CONCAT420(0x3e2aaaaa,
                                                         CONCAT416(0x3e2aaaaa,
                                                                   CONCAT412(0x3e2aaaaa,
                                                                             CONCAT48(0x3e2aaaaa,
                                                                                                                                                                            
                                                  0x3e2aaaaa3e2aaaaa)))))));
        auVar392 = ZEXT1664(ZEXT816(0) << 0x40);
        for (pvVar41 = (void *)0x0; pvVar41 != pvVar36; pvVar41 = (void *)((long)pvVar41 + 1)) {
          pauVar43 = (undefined1 (*) [32])
                     ((long)top_blob->w * (long)pvVar41 * top_blob->elemsize + (long)top_blob->data)
          ;
          pp_Var7 = this->_vptr_Convolution1D_x86_fma;
          for (iVar48 = 0; iVar48 <= iVar51; iVar48 = iVar48 + 1) {
            p_Var6 = pp_Var7[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
              auVar87 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar87 = ZEXT3264(*(undefined1 (*) [32])
                                  (*(long *)(&this->field_0x190 + (long)p_Var6) +
                                  (long)pvVar41 * 0x20));
            }
            pauVar52 = (undefined1 (*) [32])
                       ((this->weight_data_packed).cstep * (long)pvVar41 *
                        (this->weight_data_packed).elemsize + (long)(this->weight_data_packed).data)
            ;
            for (uVar40 = 0; uVar40 != uVar37; uVar40 = uVar40 + 1) {
              p_Var8 = this->_vptr_Convolution1D_x86_fma[-3];
              puVar45 = (undefined4 *)
                        ((long)(_func_int ***)local_98.data +
                        (long)*(int *)(&this->field_0xdc + (long)p_Var8) * (long)iVar48 * 4 +
                        (long)local_98.w * local_98.elemsize * uVar40);
              iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var8);
              if (*(int *)(&this->field_0xd4 + (long)p_Var8) < 1) {
                iVar42 = 0;
              }
              while (bVar55 = iVar42 != 0, iVar42 = iVar42 + -1, bVar55) {
                uVar1 = *puVar45;
                auVar131._4_4_ = uVar1;
                auVar131._0_4_ = uVar1;
                auVar131._8_4_ = uVar1;
                auVar131._12_4_ = uVar1;
                auVar131._16_4_ = uVar1;
                auVar131._20_4_ = uVar1;
                auVar131._24_4_ = uVar1;
                auVar131._28_4_ = uVar1;
                auVar161 = vfmadd231ps_fma(auVar87._0_32_,auVar131,*pauVar52);
                auVar87 = ZEXT1664(auVar161);
                puVar45 = puVar45 + *(int *)(&this->field_0xd8 + (long)p_Var8);
                pauVar52 = pauVar52 + 1;
              }
            }
            auVar355 = auVar87._0_32_;
            auVar455 = auVar355;
            if (5 < *(int *)(&this->field_0xf4 + (long)p_Var6) - 1U) goto switchD_004ba2b7_caseD_1;
            auVar133 = auVar392._0_32_;
            auVar455 = vmaxps_avx(auVar133,auVar355);
            auVar138 = auVar327._0_32_;
            auVar80 = auVar335._0_32_;
            auVar408 = auVar432._0_32_;
            auVar428 = auVar440._0_32_;
            auVar150 = auVar258._0_32_;
            auVar437 = auVar446._0_32_;
            auVar253 = auVar357._0_32_;
            auVar76 = auVar351._0_32_;
            switch(*(int *)(&this->field_0xf4 + (long)p_Var6)) {
            case 2:
              auVar355 = vminps_avx(auVar133,auVar355);
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
              auVar132._4_4_ = uVar1;
              auVar132._0_4_ = uVar1;
              auVar132._8_4_ = uVar1;
              auVar132._12_4_ = uVar1;
              auVar132._16_4_ = uVar1;
              auVar132._20_4_ = uVar1;
              auVar132._24_4_ = uVar1;
              auVar132._28_4_ = uVar1;
              auVar161 = vfmadd231ps_fma(auVar455,auVar355,auVar132);
              auVar455 = ZEXT1632(auVar161);
              break;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
              auVar141._4_4_ = uVar1;
              auVar141._0_4_ = uVar1;
              auVar141._8_4_ = uVar1;
              auVar141._12_4_ = uVar1;
              auVar141._16_4_ = uVar1;
              auVar141._20_4_ = uVar1;
              auVar141._24_4_ = uVar1;
              auVar141._28_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
              auVar456._4_4_ = uVar1;
              auVar456._0_4_ = uVar1;
              auVar456._8_4_ = uVar1;
              auVar456._12_4_ = uVar1;
              auVar456._16_4_ = uVar1;
              auVar456._20_4_ = uVar1;
              auVar456._24_4_ = uVar1;
              auVar456._28_4_ = uVar1;
              auVar355 = vmaxps_avx(auVar355,auVar141);
              auVar455 = vminps_avx(auVar456,auVar355);
              break;
            case 4:
              auVar79._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
              auVar79._8_4_ = -auVar87._8_4_;
              auVar79._12_4_ = -auVar87._12_4_;
              auVar79._16_4_ = -auVar87._16_4_;
              auVar79._20_4_ = -auVar87._20_4_;
              auVar79._24_4_ = -auVar87._24_4_;
              auVar79._28_4_ = auVar87._28_4_ ^ 0x80000000;
              auVar142._8_4_ = 0x42b0c0a5;
              auVar142._0_8_ = 0x42b0c0a542b0c0a5;
              auVar142._12_4_ = 0x42b0c0a5;
              auVar142._16_4_ = 0x42b0c0a5;
              auVar142._20_4_ = 0x42b0c0a5;
              auVar142._24_4_ = 0x42b0c0a5;
              auVar142._28_4_ = 0x42b0c0a5;
              auVar355 = vminps_avx(auVar79,auVar142);
              auVar133 = vmaxps_avx(auVar408,auVar355);
              auVar161 = vfmadd213ps_fma(auVar428,auVar133,auVar150);
              auVar408 = vroundps_avx(ZEXT1632(auVar161),1);
              auVar355 = vcmpps_avx(ZEXT1632(auVar161),auVar408,1);
              auVar355 = vandps_avx(auVar355,auVar138);
              auVar355 = vsubps_avx(auVar408,auVar355);
              auVar161 = vfmsub231ps_fma(auVar133,auVar355,auVar80);
              auVar234._8_4_ = 0x395e8083;
              auVar234._0_8_ = 0x395e8083395e8083;
              auVar234._12_4_ = 0x395e8083;
              auVar234._16_4_ = 0x395e8083;
              auVar234._20_4_ = 0x395e8083;
              auVar234._24_4_ = 0x395e8083;
              auVar234._28_4_ = 0x395e8083;
              auVar158 = vfmsub231ps_fma(ZEXT1632(auVar161),auVar355,auVar234);
              auVar80 = ZEXT1632(auVar158);
              auVar23._28_4_ = auVar408._28_4_;
              auVar23._0_28_ =
                   ZEXT1628(CONCAT412(auVar158._12_4_ * auVar158._12_4_,
                                      CONCAT48(auVar158._8_4_ * auVar158._8_4_,
                                               CONCAT44(auVar158._4_4_ * auVar158._4_4_,
                                                        auVar158._0_4_ * auVar158._0_4_))));
              auVar161 = vfmadd213ps_fma(auVar437,auVar80,auVar253);
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar80,auVar76);
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar80,auVar486._0_32_);
              auVar80 = ZEXT1632(auVar158);
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar80,auVar86._0_32_);
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar80,auVar150);
              auVar358 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar23,auVar80);
              auVar59._0_4_ = (int)auVar355._0_4_;
              auVar59._4_4_ = (int)auVar355._4_4_;
              auVar59._8_4_ = (int)auVar355._8_4_;
              auVar59._12_4_ = (int)auVar355._12_4_;
              auVar81._16_4_ = (int)auVar355._16_4_;
              auVar81._0_16_ = auVar59;
              auVar81._20_4_ = (int)auVar355._20_4_;
              auVar81._24_4_ = (int)auVar355._24_4_;
              auVar81._28_4_ = (int)auVar355._28_4_;
              auVar158 = vpslld_avx(auVar59,0x17);
              auVar161 = vpslld_avx(auVar81._16_16_,0x17);
              auVar162._8_4_ = 0x3f800000;
              auVar162._0_8_ = 0x3f8000003f800000;
              auVar162._12_4_ = 0x3f800000;
              auVar161 = vpaddd_avx(auVar161,auVar162);
              auVar158 = vpaddd_avx(auVar158,auVar162);
              auVar457._16_16_ = auVar161;
              auVar457._0_16_ = auVar158;
              auVar82._0_4_ = auVar358._0_4_ + auVar327._0_4_;
              auVar82._4_4_ = auVar358._4_4_ + auVar327._4_4_;
              auVar82._8_4_ = auVar358._8_4_ + auVar327._8_4_;
              auVar82._12_4_ = auVar358._12_4_ + auVar327._12_4_;
              auVar82._16_4_ = auVar327._16_4_ + 0.0;
              auVar82._20_4_ = auVar327._20_4_ + 0.0;
              auVar82._24_4_ = auVar327._24_4_ + 0.0;
              auVar82._28_4_ = auVar327._28_4_ + 0.0;
              auVar392 = ZEXT864(0) << 0x20;
              auVar161 = vfmadd213ps_fma(auVar457,auVar82,auVar138);
              auVar355 = vrcpps_avx(ZEXT1632(auVar161));
              auVar161 = vfmsub213ps_fma(ZEXT1632(auVar161),auVar355,auVar138);
              auVar161 = vfnmadd132ps_fma(ZEXT1632(auVar161),auVar355,auVar355);
              auVar455 = ZEXT1632(auVar161);
              break;
            case 5:
              auVar418._8_4_ = 0x42b0c0a5;
              auVar418._0_8_ = 0x42b0c0a542b0c0a5;
              auVar418._12_4_ = 0x42b0c0a5;
              auVar418._16_4_ = 0x42b0c0a5;
              auVar418._20_4_ = 0x42b0c0a5;
              auVar418._24_4_ = 0x42b0c0a5;
              auVar418._28_4_ = 0x42b0c0a5;
              auVar355 = vminps_avx(auVar418,auVar355);
              auVar133 = vmaxps_avx(auVar408,auVar355);
              auVar161 = vfmadd213ps_fma(auVar428,auVar133,auVar150);
              auVar450 = vroundps_avx(ZEXT1632(auVar161),1);
              auVar355 = vcmpps_avx(ZEXT1632(auVar161),auVar450,1);
              auVar355 = vandps_avx(auVar355,auVar138);
              auVar355 = vsubps_avx(auVar450,auVar355);
              auVar161 = vfmsub231ps_fma(auVar133,auVar355,auVar80);
              auVar228._8_4_ = 0xb95e8083;
              auVar228._0_8_ = 0xb95e8083b95e8083;
              auVar228._12_4_ = 0xb95e8083;
              auVar228._16_4_ = 0xb95e8083;
              auVar228._20_4_ = 0xb95e8083;
              auVar228._24_4_ = 0xb95e8083;
              auVar228._28_4_ = 0xb95e8083;
              auVar158 = vfnmsub231ps_fma(ZEXT1632(auVar161),auVar355,auVar228);
              auVar133 = ZEXT1632(auVar158);
              auVar20._28_4_ = auVar450._28_4_;
              auVar20._0_28_ =
                   ZEXT1628(CONCAT412(auVar158._12_4_ * auVar158._12_4_,
                                      CONCAT48(auVar158._8_4_ * auVar158._8_4_,
                                               CONCAT44(auVar158._4_4_ * auVar158._4_4_,
                                                        auVar158._0_4_ * auVar158._0_4_))));
              auVar161 = vfmadd213ps_fma(auVar437,auVar133,auVar253);
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar133,auVar76);
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar133,auVar486._0_32_);
              auVar133 = ZEXT1632(auVar158);
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar133,auVar86._0_32_);
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar133,auVar150);
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar20,auVar133);
              auVar134._0_4_ = auVar161._0_4_ + auVar327._0_4_;
              auVar134._4_4_ = auVar161._4_4_ + auVar327._4_4_;
              auVar134._8_4_ = auVar161._8_4_ + auVar327._8_4_;
              auVar134._12_4_ = auVar161._12_4_ + auVar327._12_4_;
              auVar134._16_4_ = auVar327._16_4_ + 0.0;
              auVar134._20_4_ = auVar327._20_4_ + 0.0;
              auVar134._24_4_ = auVar327._24_4_ + 0.0;
              auVar134._28_4_ = auVar327._28_4_ + 0.0;
              auVar160._0_4_ = (int)auVar355._0_4_;
              auVar160._4_4_ = (int)auVar355._4_4_;
              auVar160._8_4_ = (int)auVar355._8_4_;
              auVar160._12_4_ = (int)auVar355._12_4_;
              auVar229._16_4_ = (int)auVar355._16_4_;
              auVar229._0_16_ = auVar160;
              auVar229._20_4_ = (int)auVar355._20_4_;
              auVar229._24_4_ = (int)auVar355._24_4_;
              auVar229._28_4_ = (int)auVar355._28_4_;
              auVar158 = vpslld_avx(auVar160,0x17);
              auVar161 = vpslld_avx(auVar229._16_16_,0x17);
              auVar304._8_4_ = 0x3f800000;
              auVar304._0_8_ = 0x3f8000003f800000;
              auVar304._12_4_ = 0x3f800000;
              auVar161 = vpaddd_avx(auVar161,auVar304);
              auVar158 = vpaddd_avx(auVar158,auVar304);
              auVar454._16_16_ = auVar161;
              auVar454._0_16_ = auVar158;
              auVar358 = vfmadd213ps_fma(auVar454,auVar134,auVar138);
              auVar135._8_4_ = 0x800000;
              auVar135._0_8_ = 0x80000000800000;
              auVar135._12_4_ = 0x800000;
              auVar135._16_4_ = 0x800000;
              auVar135._20_4_ = 0x800000;
              auVar135._24_4_ = 0x800000;
              auVar135._28_4_ = 0x800000;
              auVar355 = vmaxps_avx(ZEXT1632(auVar358),auVar135);
              auVar158 = vpsrld_avx(auVar355._0_16_,0x17);
              auVar161 = vpsrld_avx(auVar355._16_16_,0x17);
              auVar295._8_4_ = 0x807fffff;
              auVar295._0_8_ = 0x807fffff807fffff;
              auVar295._12_4_ = 0x807fffff;
              auVar295._16_4_ = 0x807fffff;
              auVar295._20_4_ = 0x807fffff;
              auVar295._24_4_ = 0x807fffff;
              auVar295._28_4_ = 0x807fffff;
              auVar355 = vandps_avx(auVar355,auVar295);
              auVar133 = vorps_avx(auVar355,auVar150);
              auVar296._8_4_ = 0x3f3504f3;
              auVar296._0_8_ = 0x3f3504f33f3504f3;
              auVar296._12_4_ = 0x3f3504f3;
              auVar296._16_4_ = 0x3f3504f3;
              auVar296._20_4_ = 0x3f3504f3;
              auVar296._24_4_ = 0x3f3504f3;
              auVar296._28_4_ = 0x3f3504f3;
              auVar138 = vcmpps_avx(auVar296,auVar133,2);
              auVar355 = vandnps_avx(auVar138,auVar133);
              auVar136._0_4_ = auVar355._0_4_ + auVar133._0_4_ + -1.0;
              auVar136._4_4_ = auVar355._4_4_ + auVar133._4_4_ + -1.0;
              auVar136._8_4_ = auVar355._8_4_ + auVar133._8_4_ + -1.0;
              auVar136._12_4_ = auVar355._12_4_ + auVar133._12_4_ + -1.0;
              auVar136._16_4_ = auVar355._16_4_ + auVar133._16_4_ + -1.0;
              auVar136._20_4_ = auVar355._20_4_ + auVar133._20_4_ + -1.0;
              auVar136._24_4_ = auVar355._24_4_ + auVar133._24_4_ + -1.0;
              auVar136._28_4_ = auVar355._28_4_ + auVar133._28_4_ + -1.0;
              auVar161 = vpsubd_avx(auVar161,auVar138._16_16_);
              auVar394._8_4_ = 0xffffff81;
              auVar394._0_8_ = 0xffffff81ffffff81;
              auVar394._12_4_ = 0xffffff81;
              auVar161 = vpaddd_avx(auVar161,auVar394);
              auVar158 = vpsubd_avx(auVar158,auVar138._0_16_);
              auVar158 = vpaddd_avx(auVar394,auVar158);
              auVar230._16_16_ = auVar161;
              auVar230._0_16_ = auVar158;
              auVar21._4_4_ = auVar136._4_4_ * auVar136._4_4_;
              auVar21._0_4_ = auVar136._0_4_ * auVar136._0_4_;
              auVar21._8_4_ = auVar136._8_4_ * auVar136._8_4_;
              auVar21._12_4_ = auVar136._12_4_ * auVar136._12_4_;
              auVar21._16_4_ = auVar136._16_4_ * auVar136._16_4_;
              auVar21._20_4_ = auVar136._20_4_ * auVar136._20_4_;
              auVar21._24_4_ = auVar136._24_4_ * auVar136._24_4_;
              auVar21._28_4_ = auVar138._28_4_;
              auVar386._8_4_ = 0x3d9021bb;
              auVar386._0_8_ = 0x3d9021bb3d9021bb;
              auVar386._12_4_ = 0x3d9021bb;
              auVar386._16_4_ = 0x3d9021bb;
              auVar386._20_4_ = 0x3d9021bb;
              auVar386._24_4_ = 0x3d9021bb;
              auVar386._28_4_ = 0x3d9021bb;
              auVar308._8_4_ = 0xbdebd1b8;
              auVar308._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar308._12_4_ = 0xbdebd1b8;
              auVar308._16_4_ = 0xbdebd1b8;
              auVar308._20_4_ = 0xbdebd1b8;
              auVar308._24_4_ = 0xbdebd1b8;
              auVar308._28_4_ = 0xbdebd1b8;
              auVar161 = vfmadd213ps_fma(auVar386,auVar136,auVar308);
              auVar309._8_4_ = 0x3def251a;
              auVar309._0_8_ = 0x3def251a3def251a;
              auVar309._12_4_ = 0x3def251a;
              auVar309._16_4_ = 0x3def251a;
              auVar309._20_4_ = 0x3def251a;
              auVar309._24_4_ = 0x3def251a;
              auVar309._28_4_ = 0x3def251a;
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar136,auVar309);
              auVar310._8_4_ = 0xbdfe5d4f;
              auVar310._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar310._12_4_ = 0xbdfe5d4f;
              auVar310._16_4_ = 0xbdfe5d4f;
              auVar310._20_4_ = 0xbdfe5d4f;
              auVar310._24_4_ = 0xbdfe5d4f;
              auVar310._28_4_ = 0xbdfe5d4f;
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar136,auVar310);
              auVar311._8_4_ = 0x3e11e9bf;
              auVar311._0_8_ = 0x3e11e9bf3e11e9bf;
              auVar311._12_4_ = 0x3e11e9bf;
              auVar311._16_4_ = 0x3e11e9bf;
              auVar311._20_4_ = 0x3e11e9bf;
              auVar311._24_4_ = 0x3e11e9bf;
              auVar311._28_4_ = 0x3e11e9bf;
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar136,auVar311);
              auVar312._8_4_ = 0xbe2aae50;
              auVar312._0_8_ = 0xbe2aae50be2aae50;
              auVar312._12_4_ = 0xbe2aae50;
              auVar312._16_4_ = 0xbe2aae50;
              auVar312._20_4_ = 0xbe2aae50;
              auVar312._24_4_ = 0xbe2aae50;
              auVar312._28_4_ = 0xbe2aae50;
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar136,auVar312);
              auVar313._8_4_ = 0x3e4cceac;
              auVar313._0_8_ = 0x3e4cceac3e4cceac;
              auVar313._12_4_ = 0x3e4cceac;
              auVar313._16_4_ = 0x3e4cceac;
              auVar313._20_4_ = 0x3e4cceac;
              auVar313._24_4_ = 0x3e4cceac;
              auVar313._28_4_ = 0x3e4cceac;
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar136,auVar313);
              auVar314._8_4_ = 0xbe7ffffc;
              auVar314._0_8_ = 0xbe7ffffcbe7ffffc;
              auVar314._12_4_ = 0xbe7ffffc;
              auVar314._16_4_ = 0xbe7ffffc;
              auVar314._20_4_ = 0xbe7ffffc;
              auVar314._24_4_ = 0xbe7ffffc;
              auVar314._28_4_ = 0xbe7ffffc;
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar136,auVar314);
              auVar315._8_4_ = 0x3eaaaaaa;
              auVar315._0_8_ = 0x3eaaaaaa3eaaaaaa;
              auVar315._12_4_ = 0x3eaaaaaa;
              auVar315._16_4_ = 0x3eaaaaaa;
              auVar315._20_4_ = 0x3eaaaaaa;
              auVar315._24_4_ = 0x3eaaaaaa;
              auVar315._28_4_ = 0x3eaaaaaa;
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar136,auVar315);
              auVar387._0_4_ = auVar136._0_4_ * auVar136._0_4_ * auVar136._0_4_ * auVar161._0_4_;
              auVar387._4_4_ = auVar136._4_4_ * auVar136._4_4_ * auVar136._4_4_ * auVar161._4_4_;
              auVar387._8_4_ = auVar136._8_4_ * auVar136._8_4_ * auVar136._8_4_ * auVar161._8_4_;
              auVar387._12_4_ =
                   auVar136._12_4_ * auVar136._12_4_ * auVar136._12_4_ * auVar161._12_4_;
              auVar387._16_4_ = auVar136._16_4_ * auVar136._16_4_ * auVar136._16_4_ * 0.0;
              auVar387._20_4_ = auVar136._20_4_ * auVar136._20_4_ * auVar136._20_4_ * 0.0;
              auVar387._24_4_ = auVar136._24_4_ * auVar136._24_4_ * auVar136._24_4_ * 0.0;
              auVar387._28_4_ = 0;
              auVar432 = ZEXT3264(auVar408);
              auVar440 = ZEXT3264(auVar428);
              auVar357 = ZEXT3264(auVar253);
              auVar446 = ZEXT3264(auVar437);
              auVar335 = ZEXT3264(auVar80);
              auVar351 = ZEXT3264(auVar76);
              auVar258 = ZEXT3264(auVar150);
              auVar485._8_4_ = 0x3d2aa9c1;
              auVar485._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar485._12_4_ = 0x3d2aa9c1;
              auVar485._16_4_ = 0x3d2aa9c1;
              auVar485._20_4_ = 0x3d2aa9c1;
              auVar485._24_4_ = 0x3d2aa9c1;
              auVar485._28_4_ = 0x3d2aa9c1;
              auVar486 = ZEXT3264(auVar485);
              auVar138 = vcvtdq2ps_avx(auVar230);
              auVar419._8_4_ = 0xb95e8083;
              auVar419._0_8_ = 0xb95e8083b95e8083;
              auVar419._12_4_ = 0xb95e8083;
              auVar419._16_4_ = 0xb95e8083;
              auVar419._20_4_ = 0xb95e8083;
              auVar419._24_4_ = 0xb95e8083;
              auVar419._28_4_ = 0xb95e8083;
              auVar161 = vfmadd231ps_fma(auVar387,auVar138,auVar419);
              auVar161 = vfmsub231ps_fma(ZEXT1632(auVar161),auVar150,auVar21);
              auVar355 = vcmpps_avx(ZEXT1632(auVar358),_DAT_004dd0e0,2);
              auVar133 = vsubps_avx(ZEXT1632(auVar161),auVar136);
              auVar161 = vfmsub231ps_fma(auVar133,auVar80,auVar138);
              auVar455._8_4_ = 0xc0000000;
              auVar455._0_8_ = 0xc0000000c0000000;
              auVar455._12_4_ = 0xc0000000;
              auVar455._16_4_ = 0xc0000000;
              auVar455._20_4_ = 0xc0000000;
              auVar455._24_4_ = 0xc0000000;
              auVar455._28_4_ = 0xc0000000;
              auVar137._0_4_ = auVar161._0_4_ * -2.0;
              auVar137._4_4_ = auVar161._4_4_ * -2.0;
              auVar137._8_4_ = auVar161._8_4_ * -2.0;
              auVar137._12_4_ = auVar161._12_4_ * -2.0;
              auVar137._16_4_ = 0x80000000;
              auVar137._20_4_ = 0x80000000;
              auVar137._24_4_ = 0x80000000;
              auVar137._28_4_ = 0;
              auVar231._8_4_ = 0x7fffffff;
              auVar231._0_8_ = 0x7fffffff7fffffff;
              auVar231._12_4_ = 0x7fffffff;
              auVar231._16_4_ = 0x7fffffff;
              auVar231._20_4_ = 0x7fffffff;
              auVar231._24_4_ = 0x7fffffff;
              auVar231._28_4_ = 0x7fffffff;
              auVar355 = vblendvps_avx(auVar137,auVar231,auVar355);
              auVar355 = vminps_avx(auVar355,auVar418);
              auVar138 = vmaxps_avx(auVar408,auVar355);
              auVar161 = vfmadd213ps_fma(auVar428,auVar138,auVar150);
              auVar133 = vroundps_avx(ZEXT1632(auVar161),1);
              auVar355 = vcmpps_avx(ZEXT1632(auVar161),auVar133,1);
              auVar316._8_4_ = 0x3f800000;
              auVar316._0_8_ = 0x3f8000003f800000;
              auVar316._12_4_ = 0x3f800000;
              auVar316._16_4_ = 0x3f800000;
              auVar316._20_4_ = 0x3f800000;
              auVar316._24_4_ = 0x3f800000;
              auVar316._28_4_ = 0x3f800000;
              auVar355 = vandps_avx(auVar355,auVar316);
              auVar317._8_4_ = 0x3e2aaaaa;
              auVar317._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar317._12_4_ = 0x3e2aaaaa;
              auVar317._16_4_ = 0x3e2aaaaa;
              auVar317._20_4_ = 0x3e2aaaaa;
              auVar317._24_4_ = 0x3e2aaaaa;
              auVar317._28_4_ = 0x3e2aaaaa;
              auVar86 = ZEXT3264(auVar317);
              auVar355 = vsubps_avx(auVar133,auVar355);
              auVar161 = vfmsub231ps_fma(auVar138,auVar355,auVar80);
              auVar158 = vfnmsub231ps_fma(ZEXT1632(auVar161),auVar355,auVar419);
              auVar138 = ZEXT1632(auVar158);
              auVar22._28_4_ = auVar133._28_4_;
              auVar22._0_28_ =
                   ZEXT1628(CONCAT412(auVar158._12_4_ * auVar158._12_4_,
                                      CONCAT48(auVar158._8_4_ * auVar158._8_4_,
                                               CONCAT44(auVar158._4_4_ * auVar158._4_4_,
                                                        auVar158._0_4_ * auVar158._0_4_))));
              auVar161 = vfmadd213ps_fma(auVar437,auVar138,auVar253);
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar138,auVar76);
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar138,auVar485);
              auVar138 = ZEXT1632(auVar158);
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar138,auVar317);
              auVar161 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar138,auVar150);
              auVar358 = vfmadd213ps_fma(ZEXT1632(auVar161),auVar22,auVar138);
              auVar297._8_4_ = 0x3f800000;
              auVar297._0_8_ = 0x3f8000003f800000;
              auVar297._12_4_ = 0x3f800000;
              auVar297._16_4_ = 0x3f800000;
              auVar297._20_4_ = 0x3f800000;
              auVar297._24_4_ = 0x3f800000;
              auVar297._28_4_ = 0x3f800000;
              auVar327 = ZEXT3264(auVar297);
              auVar398._0_4_ = (int)auVar355._0_4_;
              auVar398._4_4_ = (int)auVar355._4_4_;
              auVar398._8_4_ = (int)auVar355._8_4_;
              auVar398._12_4_ = (int)auVar355._12_4_;
              auVar139._16_4_ = (int)auVar355._16_4_;
              auVar139._0_16_ = auVar398;
              auVar139._20_4_ = (int)auVar355._20_4_;
              auVar139._24_4_ = (int)auVar355._24_4_;
              auVar139._28_4_ = (int)auVar355._28_4_;
              auVar158 = vpslld_avx(auVar398,0x17);
              auVar161 = vpslld_avx(auVar139._16_16_,0x17);
              auVar395._8_4_ = 0x3f800000;
              auVar395._0_8_ = 0x3f8000003f800000;
              auVar395._12_4_ = 0x3f800000;
              auVar161 = vpaddd_avx(auVar395,auVar161);
              auVar158 = vpaddd_avx(auVar395,auVar158);
              auVar140._16_16_ = auVar161;
              auVar140._0_16_ = auVar158;
              auVar232._0_4_ = auVar358._0_4_ + 1.0;
              auVar232._4_4_ = auVar358._4_4_ + 1.0;
              auVar232._8_4_ = auVar358._8_4_ + 1.0;
              auVar232._12_4_ = auVar358._12_4_ + 1.0;
              auVar232._16_4_ = 0x3f800000;
              auVar232._20_4_ = 0x3f800000;
              auVar232._24_4_ = 0x3f800000;
              auVar232._28_4_ = 0x3f800000;
              auVar392 = ZEXT864(0) << 0x20;
              auVar161 = vfmadd213ps_fma(auVar140,auVar232,auVar297);
              auVar355 = vrcpps_avx(ZEXT1632(auVar161));
              auVar161 = vfmsub213ps_fma(ZEXT1632(auVar161),auVar355,auVar297);
              auVar161 = vfnmadd132ps_fma(ZEXT1632(auVar161),auVar355,auVar355);
              auVar233._8_4_ = 0xbf800000;
              auVar233._0_8_ = 0xbf800000bf800000;
              auVar233._12_4_ = 0xbf800000;
              auVar233._16_4_ = 0xbf800000;
              auVar233._20_4_ = 0xbf800000;
              auVar233._24_4_ = 0xbf800000;
              auVar233._28_4_ = 0xbf800000;
              auVar161 = vfnmadd213ps_fma(ZEXT1632(auVar161),auVar455,auVar233);
              auVar118 = ZEXT1628(auVar161);
              goto LAB_004ba6cf;
            case 6:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
              auVar143._4_4_ = uVar1;
              auVar143._0_4_ = uVar1;
              auVar143._8_4_ = uVar1;
              auVar143._12_4_ = uVar1;
              auVar143._16_4_ = uVar1;
              auVar143._20_4_ = uVar1;
              auVar143._24_4_ = uVar1;
              auVar143._28_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
              auVar235._4_4_ = uVar1;
              auVar235._0_4_ = uVar1;
              auVar235._8_4_ = uVar1;
              auVar235._12_4_ = uVar1;
              auVar235._16_4_ = uVar1;
              auVar235._20_4_ = uVar1;
              auVar235._24_4_ = uVar1;
              auVar235._28_4_ = uVar1;
              auVar161 = vfmadd231ps_fma(auVar235,auVar355,auVar143);
              auVar355 = vmaxps_avx(auVar133,ZEXT1632(auVar161));
              auVar355 = vminps_avx(auVar355,auVar138);
              auVar118 = auVar355._0_28_;
LAB_004ba6cf:
              auVar31._4_4_ = auVar118._4_4_ * auVar87._4_4_;
              auVar31._0_4_ = auVar118._0_4_ * auVar87._0_4_;
              auVar31._8_4_ = auVar118._8_4_ * auVar87._8_4_;
              auVar31._12_4_ = auVar118._12_4_ * auVar87._12_4_;
              auVar31._16_4_ = auVar118._16_4_ * auVar87._16_4_;
              auVar31._20_4_ = auVar118._20_4_ * auVar87._20_4_;
              auVar31._24_4_ = auVar118._24_4_ * auVar87._24_4_;
              auVar31._28_4_ = auVar455._28_4_;
              auVar455 = auVar31;
            }
switchD_004ba2b7_caseD_1:
            *pauVar43 = auVar455;
            pauVar43 = pauVar43 + 1;
          }
        }
      }
      if ((iVar4 == 4) && (_elempack == 8)) {
        uVar37 = 0;
        if (0 < iVar33) {
          uVar37 = (ulong)(uint)iVar33;
        }
        pvVar36 = (void *)0x0;
        if (0 < iVar49) {
          pvVar36 = pvVar34;
        }
        auVar258 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar327 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar86 = ZEXT3264(CONCAT428(0x3c088908,
                                     CONCAT424(0x3c088908,
                                               CONCAT420(0x3c088908,
                                                         CONCAT416(0x3c088908,
                                                                   CONCAT412(0x3c088908,
                                                                             CONCAT48(0x3c088908,
                                                                                                                                                                            
                                                  0x3c0889083c088908)))))));
        auVar161 = ZEXT816(0) << 0x40;
        auVar431._8_4_ = 0x42b0c0a5;
        auVar431._0_8_ = 0x42b0c0a542b0c0a5;
        auVar431._12_4_ = 0x42b0c0a5;
        auVar431._16_4_ = 0x42b0c0a5;
        auVar431._20_4_ = 0x42b0c0a5;
        auVar431._24_4_ = 0x42b0c0a5;
        auVar431._28_4_ = 0x42b0c0a5;
        auVar439._8_4_ = 0xc2b0c0a5;
        auVar439._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar439._12_4_ = 0xc2b0c0a5;
        auVar439._16_4_ = 0xc2b0c0a5;
        auVar439._20_4_ = 0xc2b0c0a5;
        auVar439._24_4_ = 0xc2b0c0a5;
        auVar439._28_4_ = 0xc2b0c0a5;
        auVar350._8_4_ = 0x3f318000;
        auVar350._0_8_ = 0x3f3180003f318000;
        auVar350._12_4_ = 0x3f318000;
        auVar350._16_4_ = 0x3f318000;
        auVar350._20_4_ = 0x3f318000;
        auVar350._24_4_ = 0x3f318000;
        auVar350._28_4_ = 0x3f318000;
        for (pvVar41 = (void *)0x0; pvVar41 != pvVar36; pvVar41 = (void *)((long)pvVar41 + 1)) {
          pauVar43 = (undefined1 (*) [32])
                     ((long)top_blob->w * (long)pvVar41 * top_blob->elemsize + (long)top_blob->data)
          ;
          pp_Var7 = this->_vptr_Convolution1D_x86_fma;
          for (iVar48 = 0; iVar48 <= iVar51; iVar48 = iVar48 + 1) {
            p_Var6 = pp_Var7[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
              auVar335 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar335 = ZEXT3264(*(undefined1 (*) [32])
                                   (*(long *)(&this->field_0x190 + (long)p_Var6) +
                                   (long)pvVar41 * 0x20));
            }
            pauVar52 = (undefined1 (*) [32])
                       ((this->weight_data_packed).cstep * (long)pvVar41 *
                        (this->weight_data_packed).elemsize + (long)(this->weight_data_packed).data)
            ;
            for (uVar40 = 0; uVar40 != uVar37; uVar40 = uVar40 + 1) {
              p_Var8 = this->_vptr_Convolution1D_x86_fma[-3];
              puVar45 = (undefined4 *)
                        ((long)(_func_int ***)local_98.data +
                        (long)(*(int *)(&this->field_0xdc + (long)p_Var8) * iVar48 * 4) * 4 +
                        (long)local_98.w * local_98.elemsize * uVar40);
              iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var8);
              if (iVar42 < 1) {
                iVar42 = 0;
              }
              while (bVar55 = iVar42 != 0, iVar42 = iVar42 + -1, bVar55) {
                uVar1 = *puVar45;
                auVar144._4_4_ = uVar1;
                auVar144._0_4_ = uVar1;
                auVar144._8_4_ = uVar1;
                auVar144._12_4_ = uVar1;
                auVar144._16_4_ = uVar1;
                auVar144._20_4_ = uVar1;
                auVar144._24_4_ = uVar1;
                auVar144._28_4_ = uVar1;
                uVar1 = puVar45[1];
                auVar236._4_4_ = uVar1;
                auVar236._0_4_ = uVar1;
                auVar236._8_4_ = uVar1;
                auVar236._12_4_ = uVar1;
                auVar236._16_4_ = uVar1;
                auVar236._20_4_ = uVar1;
                auVar236._24_4_ = uVar1;
                auVar236._28_4_ = uVar1;
                uVar1 = puVar45[2];
                auVar298._4_4_ = uVar1;
                auVar298._0_4_ = uVar1;
                auVar298._8_4_ = uVar1;
                auVar298._12_4_ = uVar1;
                auVar298._16_4_ = uVar1;
                auVar298._20_4_ = uVar1;
                auVar298._24_4_ = uVar1;
                auVar298._28_4_ = uVar1;
                uVar1 = puVar45[3];
                auVar388._4_4_ = uVar1;
                auVar388._0_4_ = uVar1;
                auVar388._8_4_ = uVar1;
                auVar388._12_4_ = uVar1;
                auVar388._16_4_ = uVar1;
                auVar388._20_4_ = uVar1;
                auVar388._24_4_ = uVar1;
                auVar388._28_4_ = uVar1;
                auVar158 = vfmadd231ps_fma(auVar335._0_32_,auVar144,*pauVar52);
                auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar236,pauVar52[1]);
                auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar298,pauVar52[2]);
                auVar158 = vfmadd231ps_fma(ZEXT1632(auVar158),auVar388,pauVar52[3]);
                auVar335 = ZEXT1664(auVar158);
                puVar45 = puVar45 + (long)*(int *)(&this->field_0xd8 + (long)p_Var8) * 4;
                pauVar52 = pauVar52 + 4;
              }
            }
            auVar355 = auVar335._0_32_;
            auVar459 = auVar355;
            if (5 < *(int *)(&this->field_0xf4 + (long)p_Var6) - 1U) goto switchD_004ba8be_caseD_1;
            auVar459 = vmaxps_avx(ZEXT1632(auVar161),auVar355);
            auVar150 = auVar258._0_32_;
            auVar138 = auVar327._0_32_;
            switch(*(int *)(&this->field_0xf4 + (long)p_Var6)) {
            case 2:
              auVar355 = vminps_avx(ZEXT1632(auVar161),auVar355);
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
              auVar145._4_4_ = uVar1;
              auVar145._0_4_ = uVar1;
              auVar145._8_4_ = uVar1;
              auVar145._12_4_ = uVar1;
              auVar145._16_4_ = uVar1;
              auVar145._20_4_ = uVar1;
              auVar145._24_4_ = uVar1;
              auVar145._28_4_ = uVar1;
              auVar158 = vfmadd231ps_fma(auVar459,auVar355,auVar145);
              auVar459 = ZEXT1632(auVar158);
              break;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
              auVar153._4_4_ = uVar1;
              auVar153._0_4_ = uVar1;
              auVar153._8_4_ = uVar1;
              auVar153._12_4_ = uVar1;
              auVar153._16_4_ = uVar1;
              auVar153._20_4_ = uVar1;
              auVar153._24_4_ = uVar1;
              auVar153._28_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
              auVar460._4_4_ = uVar1;
              auVar460._0_4_ = uVar1;
              auVar460._8_4_ = uVar1;
              auVar460._12_4_ = uVar1;
              auVar460._16_4_ = uVar1;
              auVar460._20_4_ = uVar1;
              auVar460._24_4_ = uVar1;
              auVar460._28_4_ = uVar1;
              auVar355 = vmaxps_avx(auVar355,auVar153);
              auVar459 = vminps_avx(auVar460,auVar355);
              break;
            case 4:
              auVar83._0_8_ = auVar335._0_8_ ^ 0x8000000080000000;
              auVar83._8_4_ = -auVar335._8_4_;
              auVar83._12_4_ = -auVar335._12_4_;
              auVar83._16_4_ = -auVar335._16_4_;
              auVar83._20_4_ = -auVar335._20_4_;
              auVar83._24_4_ = -auVar335._24_4_;
              auVar83._28_4_ = auVar335._28_4_ ^ 0x80000000;
              auVar154._8_4_ = 0x42b0c0a5;
              auVar154._0_8_ = 0x42b0c0a542b0c0a5;
              auVar154._12_4_ = 0x42b0c0a5;
              auVar154._16_4_ = 0x42b0c0a5;
              auVar154._20_4_ = 0x42b0c0a5;
              auVar154._24_4_ = 0x42b0c0a5;
              auVar154._28_4_ = 0x42b0c0a5;
              auVar355 = vminps_avx(auVar83,auVar154);
              auVar155._8_4_ = 0xc2b0c0a5;
              auVar155._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar155._12_4_ = 0xc2b0c0a5;
              auVar155._16_4_ = 0xc2b0c0a5;
              auVar155._20_4_ = 0xc2b0c0a5;
              auVar155._24_4_ = 0xc2b0c0a5;
              auVar155._28_4_ = 0xc2b0c0a5;
              auVar80 = vmaxps_avx(auVar355,auVar155);
              auVar156._8_4_ = 0x3fb8aa3b;
              auVar156._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar156._12_4_ = 0x3fb8aa3b;
              auVar156._16_4_ = 0x3fb8aa3b;
              auVar156._20_4_ = 0x3fb8aa3b;
              auVar156._24_4_ = 0x3fb8aa3b;
              auVar156._28_4_ = 0x3fb8aa3b;
              auVar158 = vfmadd213ps_fma(auVar156,auVar80,auVar150);
              auVar76 = vroundps_avx(ZEXT1632(auVar158),1);
              auVar355 = vcmpps_avx(ZEXT1632(auVar158),auVar76,1);
              auVar355 = vandps_avx(auVar355,auVar138);
              auVar355 = vsubps_avx(auVar76,auVar355);
              auVar243._8_4_ = 0x3f318000;
              auVar243._0_8_ = 0x3f3180003f318000;
              auVar243._12_4_ = 0x3f318000;
              auVar243._16_4_ = 0x3f318000;
              auVar243._20_4_ = 0x3f318000;
              auVar243._24_4_ = 0x3f318000;
              auVar243._28_4_ = 0x3f318000;
              auVar158 = vfmsub231ps_fma(auVar80,auVar355,auVar243);
              auVar244._8_4_ = 0x395e8083;
              auVar244._0_8_ = 0x395e8083395e8083;
              auVar244._12_4_ = 0x395e8083;
              auVar244._16_4_ = 0x395e8083;
              auVar244._20_4_ = 0x395e8083;
              auVar244._24_4_ = 0x395e8083;
              auVar244._28_4_ = 0x395e8083;
              auVar358 = vfmsub231ps_fma(ZEXT1632(auVar158),auVar355,auVar244);
              auVar80 = ZEXT1632(auVar358);
              auVar27._28_4_ = auVar76._28_4_;
              auVar27._0_28_ =
                   ZEXT1628(CONCAT412(auVar358._12_4_ * auVar358._12_4_,
                                      CONCAT48(auVar358._8_4_ * auVar358._8_4_,
                                               CONCAT44(auVar358._4_4_ * auVar358._4_4_,
                                                        auVar358._0_4_ * auVar358._0_4_))));
              auVar391._8_4_ = 0x39506967;
              auVar391._0_8_ = 0x3950696739506967;
              auVar391._12_4_ = 0x39506967;
              auVar391._16_4_ = 0x39506967;
              auVar391._20_4_ = 0x39506967;
              auVar391._24_4_ = 0x39506967;
              auVar391._28_4_ = 0x39506967;
              auVar245._8_4_ = 0x3ab743ce;
              auVar245._0_8_ = 0x3ab743ce3ab743ce;
              auVar245._12_4_ = 0x3ab743ce;
              auVar245._16_4_ = 0x3ab743ce;
              auVar245._20_4_ = 0x3ab743ce;
              auVar245._24_4_ = 0x3ab743ce;
              auVar245._28_4_ = 0x3ab743ce;
              auVar158 = vfmadd213ps_fma(auVar391,auVar80,auVar245);
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar80,auVar86._0_32_);
              auVar246._8_4_ = 0x3d2aa9c1;
              auVar246._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar246._12_4_ = 0x3d2aa9c1;
              auVar246._16_4_ = 0x3d2aa9c1;
              auVar246._20_4_ = 0x3d2aa9c1;
              auVar246._24_4_ = 0x3d2aa9c1;
              auVar246._28_4_ = 0x3d2aa9c1;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar80,auVar246);
              auVar247._8_4_ = 0x3e2aaaaa;
              auVar247._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar247._12_4_ = 0x3e2aaaaa;
              auVar247._16_4_ = 0x3e2aaaaa;
              auVar247._20_4_ = 0x3e2aaaaa;
              auVar247._24_4_ = 0x3e2aaaaa;
              auVar247._28_4_ = 0x3e2aaaaa;
              auVar80 = ZEXT1632(auVar358);
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar80,auVar247);
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar80,auVar150);
              auVar398 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar27,auVar80);
              auVar60._0_4_ = (int)auVar355._0_4_;
              auVar60._4_4_ = (int)auVar355._4_4_;
              auVar60._8_4_ = (int)auVar355._8_4_;
              auVar60._12_4_ = (int)auVar355._12_4_;
              auVar84._16_4_ = (int)auVar355._16_4_;
              auVar84._0_16_ = auVar60;
              auVar84._20_4_ = (int)auVar355._20_4_;
              auVar84._24_4_ = (int)auVar355._24_4_;
              auVar84._28_4_ = (int)auVar355._28_4_;
              auVar358 = vpslld_avx(auVar60,0x17);
              auVar158 = vpslld_avx(auVar84._16_16_,0x17);
              auVar164._8_4_ = 0x3f800000;
              auVar164._0_8_ = 0x3f8000003f800000;
              auVar164._12_4_ = 0x3f800000;
              auVar158 = vpaddd_avx(auVar158,auVar164);
              auVar358 = vpaddd_avx(auVar358,auVar164);
              auVar461._16_16_ = auVar158;
              auVar461._0_16_ = auVar358;
              auVar85._0_4_ = auVar398._0_4_ + auVar327._0_4_;
              auVar85._4_4_ = auVar398._4_4_ + auVar327._4_4_;
              auVar85._8_4_ = auVar398._8_4_ + auVar327._8_4_;
              auVar85._12_4_ = auVar398._12_4_ + auVar327._12_4_;
              auVar85._16_4_ = auVar327._16_4_ + 0.0;
              auVar85._20_4_ = auVar327._20_4_ + 0.0;
              auVar85._24_4_ = auVar327._24_4_ + 0.0;
              auVar85._28_4_ = auVar327._28_4_ + 0.0;
              auVar158 = vfmadd213ps_fma(auVar461,auVar85,auVar138);
              auVar355 = vrcpps_avx(ZEXT1632(auVar158));
              auVar158 = vfmsub213ps_fma(ZEXT1632(auVar158),auVar355,auVar138);
              auVar158 = vfnmadd132ps_fma(ZEXT1632(auVar158),auVar355,auVar355);
              auVar459 = ZEXT1632(auVar158);
              break;
            case 5:
              auVar355 = vminps_avx(auVar431,auVar355);
              auVar80 = vmaxps_avx(auVar439,auVar355);
              auVar356._8_4_ = 0x3fb8aa3b;
              auVar356._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar356._12_4_ = 0x3fb8aa3b;
              auVar356._16_4_ = 0x3fb8aa3b;
              auVar356._20_4_ = 0x3fb8aa3b;
              auVar356._24_4_ = 0x3fb8aa3b;
              auVar356._28_4_ = 0x3fb8aa3b;
              auVar158 = vfmadd213ps_fma(auVar356,auVar80,auVar150);
              auVar76 = vroundps_avx(ZEXT1632(auVar158),1);
              auVar355 = vcmpps_avx(ZEXT1632(auVar158),auVar76,1);
              auVar355 = vandps_avx(auVar355,auVar138);
              auVar355 = vsubps_avx(auVar76,auVar355);
              auVar158 = vfmsub231ps_fma(auVar80,auVar355,auVar350);
              auVar237._8_4_ = 0xb95e8083;
              auVar237._0_8_ = 0xb95e8083b95e8083;
              auVar237._12_4_ = 0xb95e8083;
              auVar237._16_4_ = 0xb95e8083;
              auVar237._20_4_ = 0xb95e8083;
              auVar237._24_4_ = 0xb95e8083;
              auVar237._28_4_ = 0xb95e8083;
              auVar358 = vfnmsub231ps_fma(ZEXT1632(auVar158),auVar355,auVar237);
              auVar80 = ZEXT1632(auVar358);
              auVar24._28_4_ = auVar76._28_4_;
              auVar24._0_28_ =
                   ZEXT1628(CONCAT412(auVar358._12_4_ * auVar358._12_4_,
                                      CONCAT48(auVar358._8_4_ * auVar358._8_4_,
                                               CONCAT44(auVar358._4_4_ * auVar358._4_4_,
                                                        auVar358._0_4_ * auVar358._0_4_))));
              auVar334._8_4_ = 0x39506967;
              auVar334._0_8_ = 0x3950696739506967;
              auVar334._12_4_ = 0x39506967;
              auVar334._16_4_ = 0x39506967;
              auVar334._20_4_ = 0x39506967;
              auVar334._24_4_ = 0x39506967;
              auVar334._28_4_ = 0x39506967;
              auVar444._8_4_ = 0x3ab743ce;
              auVar444._0_8_ = 0x3ab743ce3ab743ce;
              auVar444._12_4_ = 0x3ab743ce;
              auVar444._16_4_ = 0x3ab743ce;
              auVar444._20_4_ = 0x3ab743ce;
              auVar444._24_4_ = 0x3ab743ce;
              auVar444._28_4_ = 0x3ab743ce;
              auVar158 = vfmadd213ps_fma(auVar334,auVar80,auVar444);
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar80,auVar86._0_32_);
              auVar299._8_4_ = 0x3d2aa9c1;
              auVar299._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar299._12_4_ = 0x3d2aa9c1;
              auVar299._16_4_ = 0x3d2aa9c1;
              auVar299._20_4_ = 0x3d2aa9c1;
              auVar299._24_4_ = 0x3d2aa9c1;
              auVar299._28_4_ = 0x3d2aa9c1;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar80,auVar299);
              auVar300._8_4_ = 0x3e2aaaaa;
              auVar300._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar300._12_4_ = 0x3e2aaaaa;
              auVar300._16_4_ = 0x3e2aaaaa;
              auVar300._20_4_ = 0x3e2aaaaa;
              auVar300._24_4_ = 0x3e2aaaaa;
              auVar300._28_4_ = 0x3e2aaaaa;
              auVar80 = ZEXT1632(auVar358);
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar80,auVar300);
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar80,auVar150);
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar24,auVar80);
              auVar146._0_4_ = auVar158._0_4_ + auVar327._0_4_;
              auVar146._4_4_ = auVar158._4_4_ + auVar327._4_4_;
              auVar146._8_4_ = auVar158._8_4_ + auVar327._8_4_;
              auVar146._12_4_ = auVar158._12_4_ + auVar327._12_4_;
              auVar146._16_4_ = auVar327._16_4_ + 0.0;
              auVar146._20_4_ = auVar327._20_4_ + 0.0;
              auVar146._24_4_ = auVar327._24_4_ + 0.0;
              auVar146._28_4_ = auVar327._28_4_ + 0.0;
              auVar163._0_4_ = (int)auVar355._0_4_;
              auVar163._4_4_ = (int)auVar355._4_4_;
              auVar163._8_4_ = (int)auVar355._8_4_;
              auVar163._12_4_ = (int)auVar355._12_4_;
              auVar238._16_4_ = (int)auVar355._16_4_;
              auVar238._0_16_ = auVar163;
              auVar238._20_4_ = (int)auVar355._20_4_;
              auVar238._24_4_ = (int)auVar355._24_4_;
              auVar238._28_4_ = (int)auVar355._28_4_;
              auVar358 = vpslld_avx(auVar163,0x17);
              auVar158 = vpslld_avx(auVar238._16_16_,0x17);
              auVar259._8_4_ = 0x3f800000;
              auVar259._0_8_ = 0x3f8000003f800000;
              auVar259._12_4_ = 0x3f800000;
              auVar158 = vpaddd_avx(auVar158,auVar259);
              auVar358 = vpaddd_avx(auVar358,auVar259);
              auVar458._16_16_ = auVar158;
              auVar458._0_16_ = auVar358;
              auVar398 = vfmadd213ps_fma(auVar458,auVar146,auVar138);
              auVar147._8_4_ = 0x800000;
              auVar147._0_8_ = 0x80000000800000;
              auVar147._12_4_ = 0x800000;
              auVar147._16_4_ = 0x800000;
              auVar147._20_4_ = 0x800000;
              auVar147._24_4_ = 0x800000;
              auVar147._28_4_ = 0x800000;
              auVar355 = vmaxps_avx(ZEXT1632(auVar398),auVar147);
              auVar358 = vpsrld_avx(auVar355._0_16_,0x17);
              auVar158 = vpsrld_avx(auVar355._16_16_,0x17);
              auVar301._8_4_ = 0x807fffff;
              auVar301._0_8_ = 0x807fffff807fffff;
              auVar301._12_4_ = 0x807fffff;
              auVar301._16_4_ = 0x807fffff;
              auVar301._20_4_ = 0x807fffff;
              auVar301._24_4_ = 0x807fffff;
              auVar301._28_4_ = 0x807fffff;
              auVar355 = vandps_avx(auVar355,auVar301);
              auVar138 = vorps_avx(auVar355,auVar150);
              auVar302._8_4_ = 0x3f3504f3;
              auVar302._0_8_ = 0x3f3504f33f3504f3;
              auVar302._12_4_ = 0x3f3504f3;
              auVar302._16_4_ = 0x3f3504f3;
              auVar302._20_4_ = 0x3f3504f3;
              auVar302._24_4_ = 0x3f3504f3;
              auVar302._28_4_ = 0x3f3504f3;
              auVar150 = vcmpps_avx(auVar302,auVar138,2);
              auVar355 = vandnps_avx(auVar150,auVar138);
              auVar148._0_4_ = auVar355._0_4_ + auVar138._0_4_ + -1.0;
              auVar148._4_4_ = auVar355._4_4_ + auVar138._4_4_ + -1.0;
              auVar148._8_4_ = auVar355._8_4_ + auVar138._8_4_ + -1.0;
              auVar148._12_4_ = auVar355._12_4_ + auVar138._12_4_ + -1.0;
              auVar148._16_4_ = auVar355._16_4_ + auVar138._16_4_ + -1.0;
              auVar148._20_4_ = auVar355._20_4_ + auVar138._20_4_ + -1.0;
              auVar148._24_4_ = auVar355._24_4_ + auVar138._24_4_ + -1.0;
              auVar148._28_4_ = auVar355._28_4_ + auVar138._28_4_ + -1.0;
              auVar158 = vpsubd_avx(auVar158,auVar150._16_16_);
              auVar396._8_4_ = 0xffffff81;
              auVar396._0_8_ = 0xffffff81ffffff81;
              auVar396._12_4_ = 0xffffff81;
              auVar158 = vpaddd_avx(auVar158,auVar396);
              auVar358 = vpsubd_avx(auVar358,auVar150._0_16_);
              auVar358 = vpaddd_avx(auVar396,auVar358);
              auVar239._16_16_ = auVar158;
              auVar239._0_16_ = auVar358;
              auVar25._4_4_ = auVar148._4_4_ * auVar148._4_4_;
              auVar25._0_4_ = auVar148._0_4_ * auVar148._0_4_;
              auVar25._8_4_ = auVar148._8_4_ * auVar148._8_4_;
              auVar25._12_4_ = auVar148._12_4_ * auVar148._12_4_;
              auVar25._16_4_ = auVar148._16_4_ * auVar148._16_4_;
              auVar25._20_4_ = auVar148._20_4_ * auVar148._20_4_;
              auVar25._24_4_ = auVar148._24_4_ * auVar148._24_4_;
              auVar25._28_4_ = auVar150._28_4_;
              auVar389._8_4_ = 0x3d9021bb;
              auVar389._0_8_ = 0x3d9021bb3d9021bb;
              auVar389._12_4_ = 0x3d9021bb;
              auVar389._16_4_ = 0x3d9021bb;
              auVar389._20_4_ = 0x3d9021bb;
              auVar389._24_4_ = 0x3d9021bb;
              auVar389._28_4_ = 0x3d9021bb;
              auVar318._8_4_ = 0xbdebd1b8;
              auVar318._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar318._12_4_ = 0xbdebd1b8;
              auVar318._16_4_ = 0xbdebd1b8;
              auVar318._20_4_ = 0xbdebd1b8;
              auVar318._24_4_ = 0xbdebd1b8;
              auVar318._28_4_ = 0xbdebd1b8;
              auVar158 = vfmadd213ps_fma(auVar389,auVar148,auVar318);
              auVar319._8_4_ = 0x3def251a;
              auVar319._0_8_ = 0x3def251a3def251a;
              auVar319._12_4_ = 0x3def251a;
              auVar319._16_4_ = 0x3def251a;
              auVar319._20_4_ = 0x3def251a;
              auVar319._24_4_ = 0x3def251a;
              auVar319._28_4_ = 0x3def251a;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar148,auVar319);
              auVar320._8_4_ = 0xbdfe5d4f;
              auVar320._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar320._12_4_ = 0xbdfe5d4f;
              auVar320._16_4_ = 0xbdfe5d4f;
              auVar320._20_4_ = 0xbdfe5d4f;
              auVar320._24_4_ = 0xbdfe5d4f;
              auVar320._28_4_ = 0xbdfe5d4f;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar148,auVar320);
              auVar321._8_4_ = 0x3e11e9bf;
              auVar321._0_8_ = 0x3e11e9bf3e11e9bf;
              auVar321._12_4_ = 0x3e11e9bf;
              auVar321._16_4_ = 0x3e11e9bf;
              auVar321._20_4_ = 0x3e11e9bf;
              auVar321._24_4_ = 0x3e11e9bf;
              auVar321._28_4_ = 0x3e11e9bf;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar148,auVar321);
              auVar322._8_4_ = 0xbe2aae50;
              auVar322._0_8_ = 0xbe2aae50be2aae50;
              auVar322._12_4_ = 0xbe2aae50;
              auVar322._16_4_ = 0xbe2aae50;
              auVar322._20_4_ = 0xbe2aae50;
              auVar322._24_4_ = 0xbe2aae50;
              auVar322._28_4_ = 0xbe2aae50;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar148,auVar322);
              auVar323._8_4_ = 0x3e4cceac;
              auVar323._0_8_ = 0x3e4cceac3e4cceac;
              auVar323._12_4_ = 0x3e4cceac;
              auVar323._16_4_ = 0x3e4cceac;
              auVar323._20_4_ = 0x3e4cceac;
              auVar323._24_4_ = 0x3e4cceac;
              auVar323._28_4_ = 0x3e4cceac;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar148,auVar323);
              auVar324._8_4_ = 0xbe7ffffc;
              auVar324._0_8_ = 0xbe7ffffcbe7ffffc;
              auVar324._12_4_ = 0xbe7ffffc;
              auVar324._16_4_ = 0xbe7ffffc;
              auVar324._20_4_ = 0xbe7ffffc;
              auVar324._24_4_ = 0xbe7ffffc;
              auVar324._28_4_ = 0xbe7ffffc;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar148,auVar324);
              auVar325._8_4_ = 0x3eaaaaaa;
              auVar325._0_8_ = 0x3eaaaaaa3eaaaaaa;
              auVar325._12_4_ = 0x3eaaaaaa;
              auVar325._16_4_ = 0x3eaaaaaa;
              auVar325._20_4_ = 0x3eaaaaaa;
              auVar325._24_4_ = 0x3eaaaaaa;
              auVar325._28_4_ = 0x3eaaaaaa;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar148,auVar325);
              auVar390._0_4_ = auVar148._0_4_ * auVar148._0_4_ * auVar148._0_4_ * auVar158._0_4_;
              auVar390._4_4_ = auVar148._4_4_ * auVar148._4_4_ * auVar148._4_4_ * auVar158._4_4_;
              auVar390._8_4_ = auVar148._8_4_ * auVar148._8_4_ * auVar148._8_4_ * auVar158._8_4_;
              auVar390._12_4_ =
                   auVar148._12_4_ * auVar148._12_4_ * auVar148._12_4_ * auVar158._12_4_;
              auVar390._16_4_ = auVar148._16_4_ * auVar148._16_4_ * auVar148._16_4_ * 0.0;
              auVar390._20_4_ = auVar148._20_4_ * auVar148._20_4_ * auVar148._20_4_ * 0.0;
              auVar390._24_4_ = auVar148._24_4_ * auVar148._24_4_ * auVar148._24_4_ * 0.0;
              auVar390._28_4_ = 0;
              auVar445._8_4_ = 0x3f000000;
              auVar445._0_8_ = 0x3f0000003f000000;
              auVar445._12_4_ = 0x3f000000;
              auVar445._16_4_ = 0x3f000000;
              auVar445._20_4_ = 0x3f000000;
              auVar445._24_4_ = 0x3f000000;
              auVar445._28_4_ = 0x3f000000;
              auVar326._8_4_ = 0x3f800000;
              auVar326._0_8_ = 0x3f8000003f800000;
              auVar326._12_4_ = 0x3f800000;
              auVar326._16_4_ = 0x3f800000;
              auVar326._20_4_ = 0x3f800000;
              auVar326._24_4_ = 0x3f800000;
              auVar326._28_4_ = 0x3f800000;
              auVar150 = vcvtdq2ps_avx(auVar239);
              auVar420._8_4_ = 0xb95e8083;
              auVar420._0_8_ = 0xb95e8083b95e8083;
              auVar420._12_4_ = 0xb95e8083;
              auVar420._16_4_ = 0xb95e8083;
              auVar420._20_4_ = 0xb95e8083;
              auVar420._24_4_ = 0xb95e8083;
              auVar420._28_4_ = 0xb95e8083;
              auVar158 = vfmadd231ps_fma(auVar390,auVar150,auVar420);
              auVar158 = vfmsub231ps_fma(ZEXT1632(auVar158),auVar445,auVar25);
              auVar355 = vcmpps_avx(ZEXT1632(auVar398),ZEXT1632(auVar161),2);
              auVar138 = vsubps_avx(ZEXT1632(auVar158),auVar148);
              auVar158 = vfmsub231ps_fma(auVar138,auVar350,auVar150);
              auVar459._8_4_ = 0xc0000000;
              auVar459._0_8_ = 0xc0000000c0000000;
              auVar459._12_4_ = 0xc0000000;
              auVar459._16_4_ = 0xc0000000;
              auVar459._20_4_ = 0xc0000000;
              auVar459._24_4_ = 0xc0000000;
              auVar459._28_4_ = 0xc0000000;
              auVar149._0_4_ = auVar158._0_4_ * -2.0;
              auVar149._4_4_ = auVar158._4_4_ * -2.0;
              auVar149._8_4_ = auVar158._8_4_ * -2.0;
              auVar149._12_4_ = auVar158._12_4_ * -2.0;
              auVar149._16_4_ = 0x80000000;
              auVar149._20_4_ = 0x80000000;
              auVar149._24_4_ = 0x80000000;
              auVar149._28_4_ = 0;
              auVar240._8_4_ = 0x7fffffff;
              auVar240._0_8_ = 0x7fffffff7fffffff;
              auVar240._12_4_ = 0x7fffffff;
              auVar240._16_4_ = 0x7fffffff;
              auVar240._20_4_ = 0x7fffffff;
              auVar240._24_4_ = 0x7fffffff;
              auVar240._28_4_ = 0x7fffffff;
              auVar355 = vblendvps_avx(auVar149,auVar240,auVar355);
              auVar355 = vminps_avx(auVar431,auVar355);
              auVar150 = vmaxps_avx(auVar439,auVar355);
              auVar158 = vfmadd213ps_fma(auVar356,auVar150,auVar445);
              auVar138 = vroundps_avx(ZEXT1632(auVar158),1);
              auVar355 = vcmpps_avx(ZEXT1632(auVar158),auVar138,1);
              auVar355 = vandps_avx(auVar355,auVar326);
              auVar355 = vsubps_avx(auVar138,auVar355);
              auVar158 = vfmsub231ps_fma(auVar150,auVar355,auVar350);
              auVar303._8_4_ = 0xb95e8083;
              auVar303._0_8_ = 0xb95e8083b95e8083;
              auVar303._12_4_ = 0xb95e8083;
              auVar303._16_4_ = 0xb95e8083;
              auVar303._20_4_ = 0xb95e8083;
              auVar303._24_4_ = 0xb95e8083;
              auVar303._28_4_ = 0xb95e8083;
              auVar358 = vfnmsub231ps_fma(ZEXT1632(auVar158),auVar355,auVar303);
              auVar150 = ZEXT1632(auVar358);
              auVar26._28_4_ = 0xb95e8083;
              auVar26._0_28_ =
                   ZEXT1628(CONCAT412(auVar358._12_4_ * auVar358._12_4_,
                                      CONCAT48(auVar358._8_4_ * auVar358._8_4_,
                                               CONCAT44(auVar358._4_4_ * auVar358._4_4_,
                                                        auVar358._0_4_ * auVar358._0_4_))));
              auVar158 = vfmadd213ps_fma(auVar334,auVar150,auVar444);
              auVar255._8_4_ = 0x3c088908;
              auVar255._0_8_ = 0x3c0889083c088908;
              auVar255._12_4_ = 0x3c088908;
              auVar255._16_4_ = 0x3c088908;
              auVar255._20_4_ = 0x3c088908;
              auVar255._24_4_ = 0x3c088908;
              auVar255._28_4_ = 0x3c088908;
              auVar86 = ZEXT3264(auVar255);
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar150,auVar255);
              auVar256._8_4_ = 0x3d2aa9c1;
              auVar256._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar256._12_4_ = 0x3d2aa9c1;
              auVar256._16_4_ = 0x3d2aa9c1;
              auVar256._20_4_ = 0x3d2aa9c1;
              auVar256._24_4_ = 0x3d2aa9c1;
              auVar256._28_4_ = 0x3d2aa9c1;
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar150,auVar256);
              auVar257._8_4_ = 0x3e2aaaaa;
              auVar257._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar257._12_4_ = 0x3e2aaaaa;
              auVar257._16_4_ = 0x3e2aaaaa;
              auVar257._20_4_ = 0x3e2aaaaa;
              auVar257._24_4_ = 0x3e2aaaaa;
              auVar257._28_4_ = 0x3e2aaaaa;
              auVar150 = ZEXT1632(auVar358);
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar150,auVar257);
              auVar258 = ZEXT3264(auVar445);
              auVar158 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar150,auVar445);
              auVar398 = vfmadd213ps_fma(ZEXT1632(auVar158),auVar26,auVar150);
              auVar88._0_4_ = (int)auVar355._0_4_;
              auVar88._4_4_ = (int)auVar355._4_4_;
              auVar88._8_4_ = (int)auVar355._8_4_;
              auVar88._12_4_ = (int)auVar355._12_4_;
              auVar151._16_4_ = (int)auVar355._16_4_;
              auVar151._0_16_ = auVar88;
              auVar151._20_4_ = (int)auVar355._20_4_;
              auVar151._24_4_ = (int)auVar355._24_4_;
              auVar151._28_4_ = (int)auVar355._28_4_;
              auVar358 = vpslld_avx(auVar88,0x17);
              auVar158 = vpslld_avx(auVar151._16_16_,0x17);
              auVar260._8_4_ = 0x3f800000;
              auVar260._0_8_ = 0x3f8000003f800000;
              auVar260._12_4_ = 0x3f800000;
              auVar158 = vpaddd_avx(auVar158,auVar260);
              auVar358 = vpaddd_avx(auVar358,auVar260);
              auVar152._16_16_ = auVar158;
              auVar152._0_16_ = auVar358;
              auVar241._0_4_ = auVar398._0_4_ + 1.0;
              auVar241._4_4_ = auVar398._4_4_ + 1.0;
              auVar241._8_4_ = auVar398._8_4_ + 1.0;
              auVar241._12_4_ = auVar398._12_4_ + 1.0;
              auVar241._16_4_ = 0x3f800000;
              auVar241._20_4_ = 0x3f800000;
              auVar241._24_4_ = 0x3f800000;
              auVar241._28_4_ = 0x3f800000;
              auVar158 = vfmadd213ps_fma(auVar152,auVar241,auVar326);
              auVar355 = vrcpps_avx(ZEXT1632(auVar158));
              auVar327 = ZEXT3264(auVar326);
              auVar158 = vfmsub213ps_fma(ZEXT1632(auVar158),auVar355,auVar326);
              auVar158 = vfnmadd132ps_fma(ZEXT1632(auVar158),auVar355,auVar355);
              auVar242._8_4_ = 0xbf800000;
              auVar242._0_8_ = 0xbf800000bf800000;
              auVar242._12_4_ = 0xbf800000;
              auVar242._16_4_ = 0xbf800000;
              auVar242._20_4_ = 0xbf800000;
              auVar242._24_4_ = 0xbf800000;
              auVar242._28_4_ = 0xbf800000;
              auVar158 = vfnmadd213ps_fma(ZEXT1632(auVar158),auVar459,auVar242);
              auVar118 = ZEXT1628(auVar158);
              goto LAB_004bacf9;
            case 6:
              uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
              auVar157._4_4_ = uVar1;
              auVar157._0_4_ = uVar1;
              auVar157._8_4_ = uVar1;
              auVar157._12_4_ = uVar1;
              auVar157._16_4_ = uVar1;
              auVar157._20_4_ = uVar1;
              auVar157._24_4_ = uVar1;
              auVar157._28_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
              auVar248._4_4_ = uVar1;
              auVar248._0_4_ = uVar1;
              auVar248._8_4_ = uVar1;
              auVar248._12_4_ = uVar1;
              auVar248._16_4_ = uVar1;
              auVar248._20_4_ = uVar1;
              auVar248._24_4_ = uVar1;
              auVar248._28_4_ = uVar1;
              auVar158 = vfmadd231ps_fma(auVar248,auVar355,auVar157);
              auVar355 = vmaxps_avx(ZEXT1632(auVar161),ZEXT1632(auVar158));
              auVar355 = vminps_avx(auVar355,auVar138);
              auVar118 = auVar355._0_28_;
LAB_004bacf9:
              auVar32._4_4_ = auVar118._4_4_ * auVar335._4_4_;
              auVar32._0_4_ = auVar118._0_4_ * auVar335._0_4_;
              auVar32._8_4_ = auVar118._8_4_ * auVar335._8_4_;
              auVar32._12_4_ = auVar118._12_4_ * auVar335._12_4_;
              auVar32._16_4_ = auVar118._16_4_ * auVar335._16_4_;
              auVar32._20_4_ = auVar118._20_4_ * auVar335._20_4_;
              auVar32._24_4_ = auVar118._24_4_ * auVar335._24_4_;
              auVar32._28_4_ = auVar459._28_4_;
              auVar459 = auVar32;
            }
switchD_004ba8be_caseD_1:
            *pauVar43 = auVar459;
            pauVar43 = pauVar43 + 1;
          }
        }
      }
      lVar35 = (long)iVar51;
      if ((iVar4 == 8) && (_elempack == 1)) {
        local_48 = top_blob->data;
        local_38 = (long)top_blob->w * top_blob->elemsize;
        uVar37 = 0;
        if (0 < iVar33) {
          uVar37 = (ulong)(uint)iVar33;
        }
        local_40 = (void *)0x0;
        if (0 < iVar49) {
          local_40 = pvVar34;
        }
        for (pvVar36 = (void *)0x0; pvVar41 = local_48, pvVar36 != local_40;
            pvVar36 = (void *)((long)pvVar36 + 1)) {
          lVar38 = local_38 * (long)pvVar36;
          sVar9 = (this->weight_data_packed).cstep;
          sVar10 = (this->weight_data_packed).elemsize;
          pp_Var7 = this->_vptr_Convolution1D_x86_fma;
          pvVar11 = (this->weight_data_packed).data;
          for (lVar53 = 0; lVar53 <= lVar35; lVar53 = lVar53 + 1) {
            p_Var6 = pp_Var7[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
              fVar57 = 0.0;
            }
            else {
              fVar57 = *(float *)(*(long *)(&this->field_0x190 + (long)p_Var6) + (long)pvVar36 * 4);
            }
            auVar258 = ZEXT1664(ZEXT816(0) << 0x40);
            pauVar43 = (undefined1 (*) [32])(sVar9 * (long)pvVar36 * sVar10 + (long)pvVar11);
            for (uVar40 = 0; uVar40 != uVar37; uVar40 = uVar40 + 1) {
              p_Var8 = this->_vptr_Convolution1D_x86_fma[-3];
              pauVar52 = (undefined1 (*) [32])
                         ((long)(_func_int ***)local_98.data +
                         (long)(*(int *)(&this->field_0xdc + (long)p_Var8) * (int)lVar53 * 8) * 4 +
                         (long)local_98.w * local_98.elemsize * uVar40);
              iVar48 = *(int *)(&this->field_0xd4 + (long)p_Var8);
              if (*(int *)(&this->field_0xd4 + (long)p_Var8) < 1) {
                iVar48 = 0;
              }
              while (bVar55 = iVar48 != 0, iVar48 = iVar48 + -1, bVar55) {
                auVar161 = vfmadd231ps_fma(auVar258._0_32_,*pauVar43,*pauVar52);
                auVar258 = ZEXT1664(auVar161);
                pauVar52 = pauVar52 + *(int *)(&this->field_0xd8 + (long)p_Var8);
                pauVar43 = pauVar43 + 1;
              }
            }
            auVar89._0_4_ = auVar258._16_4_ + auVar258._0_4_;
            auVar89._4_4_ = auVar258._20_4_ + auVar258._4_4_;
            auVar89._8_4_ = auVar258._24_4_ + auVar258._8_4_;
            auVar89._12_4_ = auVar258._28_4_ + auVar258._12_4_;
            auVar161 = vshufpd_avx(auVar89,auVar89,1);
            auVar90._0_4_ = auVar161._0_4_ + auVar89._0_4_;
            auVar90._4_4_ = auVar161._4_4_ + auVar89._4_4_;
            auVar90._8_4_ = auVar161._8_4_ + auVar89._8_4_;
            auVar90._12_4_ = auVar161._12_4_ + auVar89._12_4_;
            auVar161 = vmovshdup_avx(auVar90);
            fVar57 = auVar161._0_4_ + fVar57 + auVar90._0_4_;
            fVar56 = fVar57;
            if (*(int *)(&this->field_0xf4 + (long)p_Var6) - 1U < 6) {
              auVar161 = ZEXT416((uint)fVar57);
              switch(*(int *)(&this->field_0xf4 + (long)p_Var6)) {
              case 1:
                auVar161 = vmaxss_avx(auVar161,ZEXT416(0));
                fVar56 = auVar161._0_4_;
                break;
              case 2:
                auVar61._0_12_ = ZEXT812(0);
                auVar61._12_4_ = 0;
                auVar161 = vcmpss_avx(auVar61,auVar161,1);
                auVar166._8_4_ = 0x3f800000;
                auVar166._0_8_ = 0x3f8000003f800000;
                auVar166._12_4_ = 0x3f800000;
                auVar161 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var6)),
                                         auVar166,auVar161);
                fVar56 = auVar161._0_4_ * fVar57;
                break;
              case 3:
                fVar57 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar161 = vmaxss_avx(auVar161,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var6)
                                                      ));
                fVar56 = auVar161._0_4_;
                if (fVar57 < auVar161._0_4_) {
                  fVar56 = fVar57;
                }
                break;
              case 4:
                auVar161 = vminss_avx(auVar161,ZEXT416(0x42b0c0a5));
                auVar91._0_8_ = auVar161._0_8_ ^ 0x8000000080000000;
                auVar91._8_4_ = auVar161._8_4_ ^ 0x80000000;
                auVar91._12_4_ = auVar161._12_4_ ^ 0x80000000;
                auVar161 = vcmpss_avx(auVar161,ZEXT416(0xc2b0c0a5),1);
                auVar165._8_4_ = 0x42b0c0a5;
                auVar165._0_8_ = 0x42b0c0a542b0c0a5;
                auVar165._12_4_ = 0x42b0c0a5;
                auVar161 = vblendvps_avx(auVar91,auVar165,auVar161);
                fVar57 = expf(auVar161._0_4_);
                fVar56 = 1.0 / (fVar57 + 1.0);
                break;
              case 5:
                fVar56 = expf(fVar57);
                fVar56 = logf(fVar56 + 1.0);
                fVar56 = tanhf(fVar56);
                fVar56 = fVar56 * fVar57;
                break;
              case 6:
                fVar2 = **(float **)(&this->field_0xf8 + (long)p_Var6);
                fVar3 = (*(float **)(&this->field_0xf8 + (long)p_Var6))[1];
                fVar249 = -fVar3 / fVar2;
                fVar56 = 0.0;
                if ((fVar249 <= fVar57) && (fVar56 = fVar57, fVar57 <= fVar249 + 1.0 / fVar2)) {
                  auVar161 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar57),
                                             ZEXT416((uint)fVar3));
                  fVar56 = auVar161._0_4_ * fVar57;
                }
              }
            }
            *(float *)((long)pvVar41 + lVar53 * 4 + lVar38) = fVar56;
          }
        }
      }
      if ((iVar4 == 8) && (_elempack == 4)) {
        uVar37 = 0;
        if (0 < iVar33) {
          uVar37 = (ulong)(uint)iVar33;
        }
        pvVar36 = (void *)0x0;
        if (0 < iVar49) {
          pvVar36 = pvVar34;
        }
        auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar258 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar62._8_4_ = 0x3f800000;
        auVar62._0_8_ = 0x3f8000003f800000;
        auVar62._12_4_ = 0x3f800000;
        auVar447._8_4_ = 0x3ab743ce;
        auVar447._0_8_ = 0x3ab743ce3ab743ce;
        auVar447._12_4_ = 0x3ab743ce;
        for (pvVar41 = (void *)0x0; pvVar41 != pvVar36; pvVar41 = (void *)((long)pvVar41 + 1)) {
          pauVar44 = (undefined1 (*) [16])
                     ((long)top_blob->w * (long)pvVar41 * top_blob->elemsize + (long)top_blob->data)
          ;
          pp_Var7 = this->_vptr_Convolution1D_x86_fma;
          for (iVar48 = 0; iVar48 <= iVar51; iVar48 = iVar48 + 1) {
            p_Var6 = pp_Var7[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
              auVar161 = ZEXT816(0) << 0x40;
            }
            else {
              auVar161 = *(undefined1 (*) [16])
                          (*(long *)(&this->field_0x190 + (long)p_Var6) + (long)pvVar41 * 0x10);
            }
            auVar86 = ZEXT1664(auVar161);
            pauVar54 = (undefined1 (*) [16])
                       ((this->weight_data_packed).cstep * (long)pvVar41 *
                        (this->weight_data_packed).elemsize + (long)(this->weight_data_packed).data)
            ;
            for (uVar40 = 0; uVar40 != uVar37; uVar40 = uVar40 + 1) {
              p_Var8 = this->_vptr_Convolution1D_x86_fma[-3];
              puVar45 = (undefined4 *)
                        ((long)(_func_int ***)local_98.data +
                        (long)(*(int *)(&this->field_0xdc + (long)p_Var8) * iVar48 * 8) * 4 +
                        (long)local_98.w * local_98.elemsize * uVar40);
              iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var8);
              if (*(int *)(&this->field_0xd4 + (long)p_Var8) < 1) {
                iVar42 = 0;
              }
              while (bVar55 = iVar42 != 0, iVar42 = iVar42 + -1, bVar55) {
                uVar1 = *puVar45;
                auVar92._4_4_ = uVar1;
                auVar92._0_4_ = uVar1;
                auVar92._8_4_ = uVar1;
                auVar92._12_4_ = uVar1;
                uVar1 = puVar45[1];
                auVar167._4_4_ = uVar1;
                auVar167._0_4_ = uVar1;
                auVar167._8_4_ = uVar1;
                auVar167._12_4_ = uVar1;
                uVar1 = puVar45[2];
                auVar261._4_4_ = uVar1;
                auVar261._0_4_ = uVar1;
                auVar261._8_4_ = uVar1;
                auVar261._12_4_ = uVar1;
                uVar1 = puVar45[3];
                auVar359._4_4_ = uVar1;
                auVar359._0_4_ = uVar1;
                auVar359._8_4_ = uVar1;
                auVar359._12_4_ = uVar1;
                uVar1 = puVar45[4];
                auVar397._4_4_ = uVar1;
                auVar397._0_4_ = uVar1;
                auVar397._8_4_ = uVar1;
                auVar397._12_4_ = uVar1;
                uVar1 = puVar45[5];
                auVar463._4_4_ = uVar1;
                auVar463._0_4_ = uVar1;
                auVar463._8_4_ = uVar1;
                auVar463._12_4_ = uVar1;
                uVar1 = puVar45[6];
                auVar421._4_4_ = uVar1;
                auVar421._0_4_ = uVar1;
                auVar421._8_4_ = uVar1;
                auVar421._12_4_ = uVar1;
                uVar1 = puVar45[7];
                auVar433._4_4_ = uVar1;
                auVar433._0_4_ = uVar1;
                auVar433._8_4_ = uVar1;
                auVar433._12_4_ = uVar1;
                auVar161 = vfmadd231ps_fma(auVar86._0_16_,auVar92,*pauVar54);
                auVar161 = vfmadd231ps_fma(auVar161,auVar167,pauVar54[1]);
                auVar161 = vfmadd231ps_fma(auVar161,auVar261,pauVar54[2]);
                auVar161 = vfmadd231ps_fma(auVar161,auVar359,pauVar54[3]);
                auVar161 = vfmadd231ps_fma(auVar161,auVar397,pauVar54[4]);
                auVar161 = vfmadd231ps_fma(auVar161,auVar463,pauVar54[5]);
                auVar161 = vfmadd231ps_fma(auVar161,auVar421,pauVar54[6]);
                auVar161 = vfmadd231ps_fma(auVar161,auVar433,pauVar54[7]);
                auVar86 = ZEXT1664(auVar161);
                puVar45 = puVar45 + (long)*(int *)(&this->field_0xd8 + (long)p_Var8) * 8;
                pauVar54 = pauVar54 + 8;
              }
            }
            auVar161 = auVar86._0_16_;
            auVar99 = auVar161;
            if (*(int *)(&this->field_0xf4 + (long)p_Var6) - 1U < 6) {
              auVar358 = auVar327._0_16_;
              auVar99 = vmaxps_avx(auVar161,auVar358);
              auVar158 = auVar258._0_16_;
              switch(*(int *)(&this->field_0xf4 + (long)p_Var6)) {
              case 2:
                auVar161 = vminps_avx(auVar161,auVar358);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar464._4_4_ = uVar1;
                auVar464._0_4_ = uVar1;
                auVar464._8_4_ = uVar1;
                auVar464._12_4_ = uVar1;
                auVar99 = vfmadd231ps_fma(auVar99,auVar161,auVar464);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar95._4_4_ = uVar1;
                auVar95._0_4_ = uVar1;
                auVar95._8_4_ = uVar1;
                auVar95._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar468._4_4_ = uVar1;
                auVar468._0_4_ = uVar1;
                auVar468._8_4_ = uVar1;
                auVar468._12_4_ = uVar1;
                auVar161 = vmaxps_avx(auVar161,auVar95);
                auVar99 = vminps_avx(auVar468,auVar161);
                break;
              case 4:
                auVar96._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
                auVar96._8_4_ = -auVar86._8_4_;
                auVar96._12_4_ = -auVar86._12_4_;
                auVar173._8_4_ = 0x42b0c0a5;
                auVar173._0_8_ = 0x42b0c0a542b0c0a5;
                auVar173._12_4_ = 0x42b0c0a5;
                auVar161 = vminps_avx(auVar96,auVar173);
                auVar174._8_4_ = 0xc2b0c0a5;
                auVar174._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar174._12_4_ = 0xc2b0c0a5;
                auVar398 = vmaxps_avx(auVar161,auVar174);
                auVar352._8_4_ = 0x3fb8aa3b;
                auVar352._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar352._12_4_ = 0x3fb8aa3b;
                auVar161 = vfmadd213ps_fma(auVar352,auVar398,auVar158);
                auVar469._0_4_ = (int)auVar161._0_4_;
                auVar469._4_4_ = (int)auVar161._4_4_;
                auVar469._8_4_ = (int)auVar161._8_4_;
                auVar469._12_4_ = (int)auVar161._12_4_;
                auVar358 = vcvtdq2ps_avx(auVar469);
                auVar161 = vcmpps_avx(auVar161,auVar358,1);
                auVar161 = vandps_avx(auVar161,auVar62);
                auVar161 = vsubps_avx(auVar358,auVar161);
                auVar175._8_4_ = 0x3f318000;
                auVar175._0_8_ = 0x3f3180003f318000;
                auVar175._12_4_ = 0x3f318000;
                auVar358 = vfmsub231ps_fma(auVar398,auVar161,auVar175);
                auVar176._8_4_ = 0x395e8083;
                auVar176._0_8_ = 0x395e8083395e8083;
                auVar176._12_4_ = 0x395e8083;
                auVar398 = vfmsub231ps_fma(auVar358,auVar161,auVar176);
                auVar470._0_4_ = auVar398._0_4_ * auVar398._0_4_;
                auVar470._4_4_ = auVar398._4_4_ * auVar398._4_4_;
                auVar470._8_4_ = auVar398._8_4_ * auVar398._8_4_;
                auVar470._12_4_ = auVar398._12_4_ * auVar398._12_4_;
                auVar400._8_4_ = 0x39506967;
                auVar400._0_8_ = 0x3950696739506967;
                auVar400._12_4_ = 0x39506967;
                auVar177._8_4_ = 0x3ab743ce;
                auVar177._0_8_ = 0x3ab743ce3ab743ce;
                auVar177._12_4_ = 0x3ab743ce;
                auVar358 = vfmadd213ps_fma(auVar400,auVar398,auVar177);
                auVar178._8_4_ = 0x3c088908;
                auVar178._0_8_ = 0x3c0889083c088908;
                auVar178._12_4_ = 0x3c088908;
                auVar358 = vfmadd213ps_fma(auVar358,auVar398,auVar178);
                auVar179._8_4_ = 0x3d2aa9c1;
                auVar179._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar179._12_4_ = 0x3d2aa9c1;
                auVar358 = vfmadd213ps_fma(auVar358,auVar398,auVar179);
                auVar180._8_4_ = 0x3e2aaaaa;
                auVar180._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar180._12_4_ = 0x3e2aaaaa;
                auVar358 = vfmadd213ps_fma(auVar358,auVar398,auVar180);
                auVar158 = vfmadd213ps_fma(auVar358,auVar398,auVar158);
                auVar158 = vfmadd213ps_fma(auVar158,auVar470,auVar398);
                auVar401._0_4_ = auVar158._0_4_ + 1.0;
                auVar401._4_4_ = auVar158._4_4_ + 1.0;
                auVar401._8_4_ = auVar158._8_4_ + 1.0;
                auVar401._12_4_ = auVar158._12_4_ + 1.0;
                auVar97._0_4_ = (int)auVar161._0_4_;
                auVar97._4_4_ = (int)auVar161._4_4_;
                auVar97._8_4_ = (int)auVar161._8_4_;
                auVar97._12_4_ = (int)auVar161._12_4_;
                auVar161 = vpslld_avx(auVar97,0x17);
                auVar161 = vpaddd_avx(auVar161,auVar62);
                auVar158 = vfmadd213ps_fma(auVar161,auVar401,auVar62);
                auVar161 = vrcpps_avx(auVar158);
                auVar158 = vfmsub213ps_fma(auVar158,auVar161,auVar62);
                auVar99 = vfnmadd132ps_fma(auVar158,auVar161,auVar161);
                break;
              case 5:
                auVar422._8_4_ = 0x42b0c0a5;
                auVar422._0_8_ = 0x42b0c0a542b0c0a5;
                auVar422._12_4_ = 0x42b0c0a5;
                auVar358 = vminps_avx(auVar161,auVar422);
                auVar434._8_4_ = 0xc2b0c0a5;
                auVar434._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar434._12_4_ = 0xc2b0c0a5;
                auVar393 = vmaxps_avx(auVar434,auVar358);
                auVar441._8_4_ = 0x3fb8aa3b;
                auVar441._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar441._12_4_ = 0x3fb8aa3b;
                auVar358 = vfmadd213ps_fma(auVar441,auVar393,auVar158);
                auVar465._0_4_ = (int)auVar358._0_4_;
                auVar465._4_4_ = (int)auVar358._4_4_;
                auVar465._8_4_ = (int)auVar358._8_4_;
                auVar465._12_4_ = (int)auVar358._12_4_;
                auVar398 = vcvtdq2ps_avx(auVar465);
                auVar358 = vcmpps_avx(auVar358,auVar398,1);
                auVar358 = vandps_avx(auVar358,auVar62);
                auVar358 = vsubps_avx(auVar398,auVar358);
                auVar423._8_4_ = 0x3f318000;
                auVar423._0_8_ = 0x3f3180003f318000;
                auVar423._12_4_ = 0x3f318000;
                auVar398 = vfmsub231ps_fma(auVar393,auVar358,auVar423);
                auVar328._8_4_ = 0xb95e8083;
                auVar328._0_8_ = 0xb95e8083b95e8083;
                auVar328._12_4_ = 0xb95e8083;
                auVar393 = vfnmsub231ps_fma(auVar398,auVar358,auVar328);
                auVar466._0_4_ = auVar393._0_4_ * auVar393._0_4_;
                auVar466._4_4_ = auVar393._4_4_ * auVar393._4_4_;
                auVar466._8_4_ = auVar393._8_4_ * auVar393._8_4_;
                auVar466._12_4_ = auVar393._12_4_ * auVar393._12_4_;
                auVar336._8_4_ = 0x39506967;
                auVar336._0_8_ = 0x3950696739506967;
                auVar336._12_4_ = 0x39506967;
                auVar398 = vfmadd213ps_fma(auVar336,auVar393,auVar447);
                auVar250._8_4_ = 0x3c088908;
                auVar250._0_8_ = 0x3c0889083c088908;
                auVar250._12_4_ = 0x3c088908;
                auVar398 = vfmadd213ps_fma(auVar398,auVar393,auVar250);
                auVar262._8_4_ = 0x3d2aa9c1;
                auVar262._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar262._12_4_ = 0x3d2aa9c1;
                auVar398 = vfmadd213ps_fma(auVar398,auVar393,auVar262);
                auVar263._8_4_ = 0x3e2aaaaa;
                auVar263._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar263._12_4_ = 0x3e2aaaaa;
                auVar398 = vfmadd213ps_fma(auVar398,auVar393,auVar263);
                auVar398 = vfmadd213ps_fma(auVar398,auVar393,auVar158);
                auVar398 = vfmadd213ps_fma(auVar398,auVar466,auVar393);
                auVar168._0_4_ = auVar398._0_4_ + 1.0;
                auVar168._4_4_ = auVar398._4_4_ + 1.0;
                auVar168._8_4_ = auVar398._8_4_ + 1.0;
                auVar168._12_4_ = auVar398._12_4_ + 1.0;
                auVar93._0_4_ = (int)auVar358._0_4_;
                auVar93._4_4_ = (int)auVar358._4_4_;
                auVar93._8_4_ = (int)auVar358._8_4_;
                auVar93._12_4_ = (int)auVar358._12_4_;
                auVar358 = vpslld_avx(auVar93,0x17);
                auVar358 = vpaddd_avx(auVar358,auVar62);
                auVar159 = vfmadd213ps_fma(auVar358,auVar168,auVar62);
                auVar169._8_4_ = 0x800000;
                auVar169._0_8_ = 0x80000000800000;
                auVar169._12_4_ = 0x800000;
                auVar358 = vmaxps_avx(auVar159,auVar169);
                auVar398 = vpsrld_avx(auVar358,0x17);
                auVar264._8_4_ = 0xffffff82;
                auVar264._0_8_ = 0xffffff82ffffff82;
                auVar264._12_4_ = 0xffffff82;
                auVar398 = vpaddd_avx(auVar398,auVar264);
                auVar265._8_4_ = 0x807fffff;
                auVar265._0_8_ = 0x807fffff807fffff;
                auVar265._12_4_ = 0x807fffff;
                auVar358 = vandps_avx(auVar358,auVar265);
                auVar58 = vorps_avx(auVar358,auVar158);
                auVar393 = vcvtdq2ps_avx(auVar398);
                auVar266._8_4_ = 0x3f3504f3;
                auVar266._0_8_ = 0x3f3504f33f3504f3;
                auVar266._12_4_ = 0x3f3504f3;
                auVar398 = vcmpps_avx(auVar58,auVar266,1);
                auVar358 = vandps_avx(auVar398,auVar58);
                auVar170._0_4_ = auVar58._0_4_ + -1.0 + auVar358._0_4_;
                auVar170._4_4_ = auVar58._4_4_ + -1.0 + auVar358._4_4_;
                auVar170._8_4_ = auVar58._8_4_ + -1.0 + auVar358._8_4_;
                auVar170._12_4_ = auVar58._12_4_ + -1.0 + auVar358._12_4_;
                auVar358 = vandps_avx(auVar398,auVar62);
                auVar398 = vsubps_avx(auVar393,auVar358);
                auVar399._0_4_ = auVar170._0_4_ * auVar170._0_4_;
                auVar399._4_4_ = auVar170._4_4_ * auVar170._4_4_;
                auVar399._8_4_ = auVar170._8_4_ * auVar170._8_4_;
                auVar399._12_4_ = auVar170._12_4_ * auVar170._12_4_;
                auVar467._8_4_ = 0x3d9021bb;
                auVar467._0_8_ = 0x3d9021bb3d9021bb;
                auVar467._12_4_ = 0x3d9021bb;
                auVar360._8_4_ = 0xbdebd1b8;
                auVar360._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar360._12_4_ = 0xbdebd1b8;
                auVar358 = vfmadd213ps_fma(auVar467,auVar170,auVar360);
                auVar361._8_4_ = 0x3def251a;
                auVar361._0_8_ = 0x3def251a3def251a;
                auVar361._12_4_ = 0x3def251a;
                auVar358 = vfmadd213ps_fma(auVar358,auVar170,auVar361);
                auVar362._8_4_ = 0xbdfe5d4f;
                auVar362._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar362._12_4_ = 0xbdfe5d4f;
                auVar358 = vfmadd213ps_fma(auVar358,auVar170,auVar362);
                auVar363._8_4_ = 0x3e11e9bf;
                auVar363._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar363._12_4_ = 0x3e11e9bf;
                auVar358 = vfmadd213ps_fma(auVar358,auVar170,auVar363);
                auVar364._8_4_ = 0xbe2aae50;
                auVar364._0_8_ = 0xbe2aae50be2aae50;
                auVar364._12_4_ = 0xbe2aae50;
                auVar358 = vfmadd213ps_fma(auVar358,auVar170,auVar364);
                auVar365._8_4_ = 0x3e4cceac;
                auVar365._0_8_ = 0x3e4cceac3e4cceac;
                auVar365._12_4_ = 0x3e4cceac;
                auVar358 = vfmadd213ps_fma(auVar358,auVar170,auVar365);
                auVar366._8_4_ = 0xbe7ffffc;
                auVar366._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar366._12_4_ = 0xbe7ffffc;
                auVar358 = vfmadd213ps_fma(auVar358,auVar170,auVar366);
                auVar367._8_4_ = 0x3eaaaaaa;
                auVar367._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar367._12_4_ = 0x3eaaaaaa;
                auVar358 = vfmadd213ps_fma(auVar358,auVar170,auVar367);
                auVar368._0_4_ = auVar399._0_4_ * auVar170._0_4_ * auVar358._0_4_;
                auVar368._4_4_ = auVar399._4_4_ * auVar170._4_4_ * auVar358._4_4_;
                auVar368._8_4_ = auVar399._8_4_ * auVar170._8_4_ * auVar358._8_4_;
                auVar368._12_4_ = auVar399._12_4_ * auVar170._12_4_ * auVar358._12_4_;
                auVar358 = vfmadd231ps_fma(auVar368,auVar398,auVar328);
                auVar393 = vfmsub231ps_fma(auVar358,auVar158,auVar399);
                auVar358 = vcmpps_avx(auVar159,_DAT_004d6070,2);
                auVar393 = vsubps_avx(auVar393,auVar170);
                auVar398 = vfnmadd231ps_fma(auVar393,auVar423,auVar398);
                auVar171._0_4_ = auVar398._0_4_ + auVar398._0_4_;
                auVar171._4_4_ = auVar398._4_4_ + auVar398._4_4_;
                auVar171._8_4_ = auVar398._8_4_ + auVar398._8_4_;
                auVar171._12_4_ = auVar398._12_4_ + auVar398._12_4_;
                auVar267._8_4_ = 0x7fffffff;
                auVar267._0_8_ = 0x7fffffff7fffffff;
                auVar267._12_4_ = 0x7fffffff;
                auVar358 = vblendvps_avx(auVar171,auVar267,auVar358);
                auVar172._8_4_ = 0x42b0c0a5;
                auVar172._0_8_ = 0x42b0c0a542b0c0a5;
                auVar172._12_4_ = 0x42b0c0a5;
                auVar358 = vminps_avx(auVar358,auVar172);
                auVar393 = vmaxps_avx(auVar434,auVar358);
                auVar358 = vfmadd213ps_fma(auVar441,auVar393,auVar158);
                auVar268._0_4_ = (int)auVar358._0_4_;
                auVar268._4_4_ = (int)auVar358._4_4_;
                auVar268._8_4_ = (int)auVar358._8_4_;
                auVar268._12_4_ = (int)auVar358._12_4_;
                auVar398 = vcvtdq2ps_avx(auVar268);
                auVar358 = vcmpps_avx(auVar358,auVar398,1);
                auVar358 = vandps_avx(auVar358,auVar62);
                auVar358 = vsubps_avx(auVar398,auVar358);
                auVar398 = vfmsub231ps_fma(auVar393,auVar358,auVar423);
                auVar393 = vfnmsub231ps_fma(auVar398,auVar358,auVar328);
                auVar269._0_4_ = auVar393._0_4_ * auVar393._0_4_;
                auVar269._4_4_ = auVar393._4_4_ * auVar393._4_4_;
                auVar269._8_4_ = auVar393._8_4_ * auVar393._8_4_;
                auVar269._12_4_ = auVar393._12_4_ * auVar393._12_4_;
                auVar398 = vfmadd213ps_fma(auVar336,auVar393,auVar447);
                auVar398 = vfmadd213ps_fma(auVar398,auVar393,auVar250);
                auVar258 = ZEXT1664(auVar158);
                auVar327 = ZEXT864(0);
                auVar329._8_4_ = 0x3d2aa9c1;
                auVar329._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar329._12_4_ = 0x3d2aa9c1;
                auVar398 = vfmadd213ps_fma(auVar398,auVar393,auVar329);
                auVar330._8_4_ = 0x3e2aaaaa;
                auVar330._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar330._12_4_ = 0x3e2aaaaa;
                auVar398 = vfmadd213ps_fma(auVar398,auVar393,auVar330);
                auVar158 = vfmadd213ps_fma(auVar398,auVar393,auVar158);
                auVar158 = vfmadd213ps_fma(auVar158,auVar269,auVar393);
                auVar270._0_4_ = auVar158._0_4_ + 1.0;
                auVar270._4_4_ = auVar158._4_4_ + 1.0;
                auVar270._8_4_ = auVar158._8_4_ + 1.0;
                auVar270._12_4_ = auVar158._12_4_ + 1.0;
                auVar94._0_4_ = (int)auVar358._0_4_;
                auVar94._4_4_ = (int)auVar358._4_4_;
                auVar94._8_4_ = (int)auVar358._8_4_;
                auVar94._12_4_ = (int)auVar358._12_4_;
                auVar158 = vpslld_avx(auVar94,0x17);
                auVar158 = vpaddd_avx(auVar158,auVar62);
                auVar358 = vfmadd213ps_fma(auVar158,auVar270,auVar62);
                auVar158 = vrcpps_avx(auVar358);
                auVar271._0_4_ = auVar158._0_4_ + auVar158._0_4_;
                auVar271._4_4_ = auVar158._4_4_ + auVar158._4_4_;
                auVar271._8_4_ = auVar158._8_4_ + auVar158._8_4_;
                auVar271._12_4_ = auVar158._12_4_ + auVar158._12_4_;
                auVar331._8_4_ = 0x40000000;
                auVar331._0_8_ = 0x4000000040000000;
                auVar331._12_4_ = 0x40000000;
                auVar358 = vfmsub213ps_fma(auVar358,auVar271,auVar331);
                auVar158 = vfnmadd213ps_fma(auVar358,auVar158,auVar271);
                auVar99 = vfmsub213ps_fma(auVar158,auVar161,auVar161);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar98._4_4_ = uVar1;
                auVar98._0_4_ = uVar1;
                auVar98._8_4_ = uVar1;
                auVar98._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar181._4_4_ = uVar1;
                auVar181._0_4_ = uVar1;
                auVar181._8_4_ = uVar1;
                auVar181._12_4_ = uVar1;
                auVar161 = vfmadd231ps_fma(auVar181,auVar161,auVar98);
                auVar161 = vmaxps_avx(auVar161,auVar358);
                auVar161 = vminps_avx(auVar161,auVar62);
                auVar99._0_4_ = auVar86._0_4_ * auVar161._0_4_;
                auVar99._4_4_ = auVar86._4_4_ * auVar161._4_4_;
                auVar99._8_4_ = auVar86._8_4_ * auVar161._8_4_;
                auVar99._12_4_ = auVar86._12_4_ * auVar161._12_4_;
              }
            }
            *pauVar44 = auVar99;
            pauVar44 = pauVar44 + 1;
          }
        }
      }
      if ((iVar4 == 4) && (_elempack == 4)) {
        uVar37 = 0;
        if (0 < iVar33) {
          uVar37 = (ulong)(uint)iVar33;
        }
        pvVar36 = (void *)0x0;
        if (0 < iVar49) {
          pvVar36 = pvVar34;
        }
        auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar305._8_4_ = 0x3f000000;
        auVar305._0_8_ = 0x3f0000003f000000;
        auVar305._12_4_ = 0x3f000000;
        auVar258 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar435._8_4_ = 0xc2b0c0a5;
        auVar435._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar435._12_4_ = 0xc2b0c0a5;
        auVar332._8_4_ = 0xb95e8083;
        auVar332._0_8_ = 0xb95e8083b95e8083;
        auVar332._12_4_ = 0xb95e8083;
        auVar448._8_4_ = 0x3ab743ce;
        auVar448._0_8_ = 0x3ab743ce3ab743ce;
        auVar448._12_4_ = 0x3ab743ce;
        auVar251._8_4_ = 0x3c088908;
        auVar251._0_8_ = 0x3c0889083c088908;
        auVar251._12_4_ = 0x3c088908;
        for (pvVar41 = (void *)0x0; pvVar41 != pvVar36; pvVar41 = (void *)((long)pvVar41 + 1)) {
          pauVar44 = (undefined1 (*) [16])
                     ((long)top_blob->w * (long)pvVar41 * top_blob->elemsize + (long)top_blob->data)
          ;
          pp_Var7 = this->_vptr_Convolution1D_x86_fma;
          for (iVar48 = 0; iVar48 <= iVar51; iVar48 = iVar48 + 1) {
            p_Var6 = pp_Var7[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
              auVar161 = ZEXT816(0) << 0x40;
            }
            else {
              auVar161 = *(undefined1 (*) [16])
                          (*(long *)(&this->field_0x190 + (long)p_Var6) + (long)pvVar41 * 0x10);
            }
            auVar86 = ZEXT1664(auVar161);
            pauVar54 = (undefined1 (*) [16])
                       ((this->weight_data_packed).cstep * (long)pvVar41 *
                        (this->weight_data_packed).elemsize + (long)(this->weight_data_packed).data)
            ;
            for (uVar40 = 0; uVar40 != uVar37; uVar40 = uVar40 + 1) {
              p_Var8 = this->_vptr_Convolution1D_x86_fma[-3];
              puVar45 = (undefined4 *)
                        ((long)(_func_int ***)local_98.data +
                        (long)(*(int *)(&this->field_0xdc + (long)p_Var8) * iVar48 * 4) * 4 +
                        (long)local_98.w * local_98.elemsize * uVar40);
              iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var8);
              if (*(int *)(&this->field_0xd4 + (long)p_Var8) < 1) {
                iVar42 = 0;
              }
              while (bVar55 = iVar42 != 0, iVar42 = iVar42 + -1, bVar55) {
                uVar1 = *puVar45;
                auVar100._4_4_ = uVar1;
                auVar100._0_4_ = uVar1;
                auVar100._8_4_ = uVar1;
                auVar100._12_4_ = uVar1;
                uVar1 = puVar45[1];
                auVar182._4_4_ = uVar1;
                auVar182._0_4_ = uVar1;
                auVar182._8_4_ = uVar1;
                auVar182._12_4_ = uVar1;
                uVar1 = puVar45[2];
                auVar272._4_4_ = uVar1;
                auVar272._0_4_ = uVar1;
                auVar272._8_4_ = uVar1;
                auVar272._12_4_ = uVar1;
                auVar161 = vfmadd132ps_fma(auVar100,auVar86._0_16_,*pauVar54);
                auVar161 = vfmadd231ps_fma(auVar161,auVar182,pauVar54[1]);
                auVar161 = vfmadd231ps_fma(auVar161,auVar272,pauVar54[2]);
                uVar1 = puVar45[3];
                auVar183._4_4_ = uVar1;
                auVar183._0_4_ = uVar1;
                auVar183._8_4_ = uVar1;
                auVar183._12_4_ = uVar1;
                auVar161 = vfmadd231ps_fma(auVar161,auVar183,pauVar54[3]);
                puVar45 = puVar45 + (long)*(int *)(&this->field_0xd8 + (long)p_Var8) * 4;
                pauVar54 = pauVar54 + 4;
                auVar86 = ZEXT1664(auVar161);
              }
            }
            auVar161 = auVar86._0_16_;
            auVar107 = auVar161;
            if (*(int *)(&this->field_0xf4 + (long)p_Var6) - 1U < 6) {
              auVar358 = auVar327._0_16_;
              auVar107 = vmaxps_avx(auVar161,auVar358);
              auVar158 = auVar258._0_16_;
              fVar57 = auVar258._0_4_;
              fVar56 = auVar258._4_4_;
              fVar2 = auVar258._8_4_;
              fVar3 = auVar258._12_4_;
              switch(*(int *)(&this->field_0xf4 + (long)p_Var6)) {
              case 2:
                auVar161 = vminps_avx(auVar161,auVar358);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar471._4_4_ = uVar1;
                auVar471._0_4_ = uVar1;
                auVar471._8_4_ = uVar1;
                auVar471._12_4_ = uVar1;
                auVar107 = vfmadd231ps_fma(auVar107,auVar161,auVar471);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar103._4_4_ = uVar1;
                auVar103._0_4_ = uVar1;
                auVar103._8_4_ = uVar1;
                auVar103._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar475._4_4_ = uVar1;
                auVar475._0_4_ = uVar1;
                auVar475._8_4_ = uVar1;
                auVar475._12_4_ = uVar1;
                auVar161 = vmaxps_avx(auVar161,auVar103);
                auVar107 = vminps_avx(auVar475,auVar161);
                break;
              case 4:
                auVar104._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
                auVar104._8_4_ = -auVar86._8_4_;
                auVar104._12_4_ = -auVar86._12_4_;
                auVar190._8_4_ = 0x42b0c0a5;
                auVar190._0_8_ = 0x42b0c0a542b0c0a5;
                auVar190._12_4_ = 0x42b0c0a5;
                auVar161 = vminps_avx(auVar104,auVar190);
                auVar191._8_4_ = 0xc2b0c0a5;
                auVar191._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar191._12_4_ = 0xc2b0c0a5;
                auVar398 = vmaxps_avx(auVar161,auVar191);
                auVar353._8_4_ = 0x3fb8aa3b;
                auVar353._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar353._12_4_ = 0x3fb8aa3b;
                auVar161 = vfmadd213ps_fma(auVar353,auVar398,auVar305);
                auVar476._0_4_ = (int)auVar161._0_4_;
                auVar476._4_4_ = (int)auVar161._4_4_;
                auVar476._8_4_ = (int)auVar161._8_4_;
                auVar476._12_4_ = (int)auVar161._12_4_;
                auVar358 = vcvtdq2ps_avx(auVar476);
                auVar161 = vcmpps_avx(auVar161,auVar358,1);
                auVar161 = vandps_avx(auVar161,auVar158);
                auVar161 = vsubps_avx(auVar358,auVar161);
                auVar192._8_4_ = 0x3f318000;
                auVar192._0_8_ = 0x3f3180003f318000;
                auVar192._12_4_ = 0x3f318000;
                auVar358 = vfmsub231ps_fma(auVar398,auVar161,auVar192);
                auVar193._8_4_ = 0x395e8083;
                auVar193._0_8_ = 0x395e8083395e8083;
                auVar193._12_4_ = 0x395e8083;
                auVar398 = vfmsub231ps_fma(auVar358,auVar161,auVar193);
                auVar477._0_4_ = auVar398._0_4_ * auVar398._0_4_;
                auVar477._4_4_ = auVar398._4_4_ * auVar398._4_4_;
                auVar477._8_4_ = auVar398._8_4_ * auVar398._8_4_;
                auVar477._12_4_ = auVar398._12_4_ * auVar398._12_4_;
                auVar403._8_4_ = 0x39506967;
                auVar403._0_8_ = 0x3950696739506967;
                auVar403._12_4_ = 0x39506967;
                auVar194._8_4_ = 0x3ab743ce;
                auVar194._0_8_ = 0x3ab743ce3ab743ce;
                auVar194._12_4_ = 0x3ab743ce;
                auVar358 = vfmadd213ps_fma(auVar403,auVar398,auVar194);
                auVar195._8_4_ = 0x3c088908;
                auVar195._0_8_ = 0x3c0889083c088908;
                auVar195._12_4_ = 0x3c088908;
                auVar358 = vfmadd213ps_fma(auVar358,auVar398,auVar195);
                auVar66._8_4_ = 0x3d2aa9c1;
                auVar66._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar66._12_4_ = 0x3d2aa9c1;
                auVar358 = vfmadd213ps_fma(auVar358,auVar398,auVar66);
                auVar67._8_4_ = 0x3e2aaaaa;
                auVar67._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar67._12_4_ = 0x3e2aaaaa;
                auVar358 = vfmadd213ps_fma(auVar358,auVar398,auVar67);
                auVar358 = vfmadd213ps_fma(auVar358,auVar398,auVar305);
                auVar358 = vfmadd213ps_fma(auVar358,auVar477,auVar398);
                auVar404._0_4_ = auVar358._0_4_ + fVar57;
                auVar404._4_4_ = auVar358._4_4_ + fVar56;
                auVar404._8_4_ = auVar358._8_4_ + fVar2;
                auVar404._12_4_ = auVar358._12_4_ + fVar3;
                auVar105._0_4_ = (int)auVar161._0_4_;
                auVar105._4_4_ = (int)auVar161._4_4_;
                auVar105._8_4_ = (int)auVar161._8_4_;
                auVar105._12_4_ = (int)auVar161._12_4_;
                auVar161 = vpslld_avx(auVar105,0x17);
                auVar161 = vpaddd_avx(auVar161,auVar158);
                auVar358 = vfmadd213ps_fma(auVar161,auVar404,auVar158);
                auVar327 = ZEXT464(0) << 0x20;
                auVar161 = vrcpps_avx(auVar358);
                auVar158 = vfmsub213ps_fma(auVar358,auVar161,auVar158);
                auVar107 = vfnmadd132ps_fma(auVar158,auVar161,auVar161);
                break;
              case 5:
                auVar424._8_4_ = 0x42b0c0a5;
                auVar424._0_8_ = 0x42b0c0a542b0c0a5;
                auVar424._12_4_ = 0x42b0c0a5;
                auVar358 = vminps_avx(auVar161,auVar424);
                auVar393 = vmaxps_avx(auVar435,auVar358);
                auVar442._8_4_ = 0x3fb8aa3b;
                auVar442._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar442._12_4_ = 0x3fb8aa3b;
                auVar358 = vfmadd213ps_fma(auVar442,auVar393,auVar305);
                auVar472._0_4_ = (int)auVar358._0_4_;
                auVar472._4_4_ = (int)auVar358._4_4_;
                auVar472._8_4_ = (int)auVar358._8_4_;
                auVar472._12_4_ = (int)auVar358._12_4_;
                auVar398 = vcvtdq2ps_avx(auVar472);
                auVar358 = vcmpps_avx(auVar358,auVar398,1);
                auVar358 = vandps_avx(auVar358,auVar158);
                auVar358 = vsubps_avx(auVar398,auVar358);
                auVar425._8_4_ = 0x3f318000;
                auVar425._0_8_ = 0x3f3180003f318000;
                auVar425._12_4_ = 0x3f318000;
                auVar398 = vfmsub231ps_fma(auVar393,auVar358,auVar425);
                auVar393 = vfnmsub231ps_fma(auVar398,auVar358,auVar332);
                auVar473._0_4_ = auVar393._0_4_ * auVar393._0_4_;
                auVar473._4_4_ = auVar393._4_4_ * auVar393._4_4_;
                auVar473._8_4_ = auVar393._8_4_ * auVar393._8_4_;
                auVar473._12_4_ = auVar393._12_4_ * auVar393._12_4_;
                auVar184._8_4_ = 0x39506967;
                auVar184._0_8_ = 0x3950696739506967;
                auVar184._12_4_ = 0x39506967;
                auVar398 = vfmadd213ps_fma(auVar184,auVar393,auVar448);
                auVar398 = vfmadd213ps_fma(auVar398,auVar393,auVar251);
                auVar273._8_4_ = 0x3d2aa9c1;
                auVar273._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar273._12_4_ = 0x3d2aa9c1;
                auVar398 = vfmadd213ps_fma(auVar398,auVar393,auVar273);
                auVar274._8_4_ = 0x3e2aaaaa;
                auVar274._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar274._12_4_ = 0x3e2aaaaa;
                auVar398 = vfmadd213ps_fma(auVar398,auVar393,auVar274);
                auVar398 = vfmadd213ps_fma(auVar398,auVar393,auVar305);
                auVar398 = vfmadd213ps_fma(auVar398,auVar473,auVar393);
                auVar185._0_4_ = auVar398._0_4_ + fVar57;
                auVar185._4_4_ = auVar398._4_4_ + fVar56;
                auVar185._8_4_ = auVar398._8_4_ + fVar2;
                auVar185._12_4_ = auVar398._12_4_ + fVar3;
                auVar101._0_4_ = (int)auVar358._0_4_;
                auVar101._4_4_ = (int)auVar358._4_4_;
                auVar101._8_4_ = (int)auVar358._8_4_;
                auVar101._12_4_ = (int)auVar358._12_4_;
                auVar358 = vpslld_avx(auVar101,0x17);
                auVar358 = vpaddd_avx(auVar358,auVar158);
                auVar159 = vfmadd213ps_fma(auVar358,auVar185,auVar158);
                auVar186._8_4_ = 0x800000;
                auVar186._0_8_ = 0x80000000800000;
                auVar186._12_4_ = 0x800000;
                auVar358 = vmaxps_avx(auVar159,auVar186);
                auVar398 = vpsrld_avx(auVar358,0x17);
                auVar275._8_4_ = 0xffffff82;
                auVar275._0_8_ = 0xffffff82ffffff82;
                auVar275._12_4_ = 0xffffff82;
                auVar398 = vpaddd_avx(auVar398,auVar275);
                auVar276._8_4_ = 0x807fffff;
                auVar276._0_8_ = 0x807fffff807fffff;
                auVar276._12_4_ = 0x807fffff;
                auVar358 = vandps_avx(auVar358,auVar276);
                auVar58 = vorps_avx(auVar358,auVar305);
                auVar393 = vcvtdq2ps_avx(auVar398);
                auVar277._8_4_ = 0x3f3504f3;
                auVar277._0_8_ = 0x3f3504f33f3504f3;
                auVar277._12_4_ = 0x3f3504f3;
                auVar398 = vcmpps_avx(auVar58,auVar277,1);
                auVar358 = vandps_avx(auVar398,auVar58);
                auVar187._0_4_ = auVar58._0_4_ + -1.0 + auVar358._0_4_;
                auVar187._4_4_ = auVar58._4_4_ + -1.0 + auVar358._4_4_;
                auVar187._8_4_ = auVar58._8_4_ + -1.0 + auVar358._8_4_;
                auVar187._12_4_ = auVar58._12_4_ + -1.0 + auVar358._12_4_;
                auVar358 = vandps_avx(auVar398,auVar158);
                auVar398 = vsubps_avx(auVar393,auVar358);
                auVar402._0_4_ = auVar187._0_4_ * auVar187._0_4_;
                auVar402._4_4_ = auVar187._4_4_ * auVar187._4_4_;
                auVar402._8_4_ = auVar187._8_4_ * auVar187._8_4_;
                auVar402._12_4_ = auVar187._12_4_ * auVar187._12_4_;
                auVar474._8_4_ = 0x3d9021bb;
                auVar474._0_8_ = 0x3d9021bb3d9021bb;
                auVar474._12_4_ = 0x3d9021bb;
                auVar337._8_4_ = 0xbdebd1b8;
                auVar337._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar337._12_4_ = 0xbdebd1b8;
                auVar358 = vfmadd213ps_fma(auVar474,auVar187,auVar337);
                auVar338._8_4_ = 0x3def251a;
                auVar338._0_8_ = 0x3def251a3def251a;
                auVar338._12_4_ = 0x3def251a;
                auVar358 = vfmadd213ps_fma(auVar358,auVar187,auVar338);
                auVar339._8_4_ = 0xbdfe5d4f;
                auVar339._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar339._12_4_ = 0xbdfe5d4f;
                auVar358 = vfmadd213ps_fma(auVar358,auVar187,auVar339);
                auVar340._8_4_ = 0x3e11e9bf;
                auVar340._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar340._12_4_ = 0x3e11e9bf;
                auVar358 = vfmadd213ps_fma(auVar358,auVar187,auVar340);
                auVar341._8_4_ = 0xbe2aae50;
                auVar341._0_8_ = 0xbe2aae50be2aae50;
                auVar341._12_4_ = 0xbe2aae50;
                auVar358 = vfmadd213ps_fma(auVar358,auVar187,auVar341);
                auVar342._8_4_ = 0x3e4cceac;
                auVar342._0_8_ = 0x3e4cceac3e4cceac;
                auVar342._12_4_ = 0x3e4cceac;
                auVar358 = vfmadd213ps_fma(auVar358,auVar187,auVar342);
                auVar343._8_4_ = 0xbe7ffffc;
                auVar343._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar343._12_4_ = 0xbe7ffffc;
                auVar358 = vfmadd213ps_fma(auVar358,auVar187,auVar343);
                auVar344._8_4_ = 0x3eaaaaaa;
                auVar344._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar344._12_4_ = 0x3eaaaaaa;
                auVar358 = vfmadd213ps_fma(auVar358,auVar187,auVar344);
                auVar369._0_4_ = auVar402._0_4_ * auVar187._0_4_ * auVar358._0_4_;
                auVar369._4_4_ = auVar402._4_4_ * auVar187._4_4_ * auVar358._4_4_;
                auVar369._8_4_ = auVar402._8_4_ * auVar187._8_4_ * auVar358._8_4_;
                auVar369._12_4_ = auVar402._12_4_ * auVar187._12_4_ * auVar358._12_4_;
                auVar358 = vfmadd231ps_fma(auVar369,auVar398,auVar332);
                auVar393 = vfmsub231ps_fma(auVar358,auVar305,auVar402);
                auVar28._12_4_ = 0;
                auVar28._0_12_ = ZEXT412(0);
                auVar327 = ZEXT1264(ZEXT412(0)) << 0x20;
                auVar358 = vcmpps_avx(auVar159,auVar28 << 0x20,2);
                auVar393 = vsubps_avx(auVar393,auVar187);
                auVar398 = vfnmadd231ps_fma(auVar393,auVar425,auVar398);
                auVar188._0_4_ = auVar398._0_4_ + auVar398._0_4_;
                auVar188._4_4_ = auVar398._4_4_ + auVar398._4_4_;
                auVar188._8_4_ = auVar398._8_4_ + auVar398._8_4_;
                auVar188._12_4_ = auVar398._12_4_ + auVar398._12_4_;
                auVar278._8_4_ = 0x7fffffff;
                auVar278._0_8_ = 0x7fffffff7fffffff;
                auVar278._12_4_ = 0x7fffffff;
                auVar358 = vblendvps_avx(auVar188,auVar278,auVar358);
                auVar189._8_4_ = 0x42b0c0a5;
                auVar189._0_8_ = 0x42b0c0a542b0c0a5;
                auVar189._12_4_ = 0x42b0c0a5;
                auVar358 = vminps_avx(auVar358,auVar189);
                auVar393 = vmaxps_avx(auVar435,auVar358);
                auVar358 = vfmadd213ps_fma(auVar442,auVar393,auVar305);
                auVar279._0_4_ = (int)auVar358._0_4_;
                auVar279._4_4_ = (int)auVar358._4_4_;
                auVar279._8_4_ = (int)auVar358._8_4_;
                auVar279._12_4_ = (int)auVar358._12_4_;
                auVar398 = vcvtdq2ps_avx(auVar279);
                auVar358 = vcmpps_avx(auVar358,auVar398,1);
                auVar358 = vandps_avx(auVar358,auVar158);
                auVar358 = vsubps_avx(auVar398,auVar358);
                auVar398 = vfmsub231ps_fma(auVar393,auVar358,auVar425);
                auVar258 = ZEXT1664(auVar158);
                auVar393 = vfnmsub231ps_fma(auVar398,auVar358,auVar332);
                auVar280._0_4_ = auVar393._0_4_ * auVar393._0_4_;
                auVar280._4_4_ = auVar393._4_4_ * auVar393._4_4_;
                auVar280._8_4_ = auVar393._8_4_ * auVar393._8_4_;
                auVar280._12_4_ = auVar393._12_4_ * auVar393._12_4_;
                auVar370._8_4_ = 0x39506967;
                auVar370._0_8_ = 0x3950696739506967;
                auVar370._12_4_ = 0x39506967;
                auVar398 = vfmadd213ps_fma(auVar370,auVar393,auVar448);
                auVar398 = vfmadd213ps_fma(auVar398,auVar393,auVar251);
                auVar63._8_4_ = 0x3d2aa9c1;
                auVar63._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar63._12_4_ = 0x3d2aa9c1;
                auVar398 = vfmadd213ps_fma(auVar398,auVar393,auVar63);
                auVar64._8_4_ = 0x3e2aaaaa;
                auVar64._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar64._12_4_ = 0x3e2aaaaa;
                auVar398 = vfmadd213ps_fma(auVar398,auVar393,auVar64);
                auVar398 = vfmadd213ps_fma(auVar398,auVar393,auVar305);
                auVar398 = vfmadd213ps_fma(auVar398,auVar280,auVar393);
                auVar281._0_4_ = auVar398._0_4_ + fVar57;
                auVar281._4_4_ = auVar398._4_4_ + fVar56;
                auVar281._8_4_ = auVar398._8_4_ + fVar2;
                auVar281._12_4_ = auVar398._12_4_ + fVar3;
                auVar102._0_4_ = (int)auVar358._0_4_;
                auVar102._4_4_ = (int)auVar358._4_4_;
                auVar102._8_4_ = (int)auVar358._8_4_;
                auVar102._12_4_ = (int)auVar358._12_4_;
                auVar358 = vpslld_avx(auVar102,0x17);
                auVar358 = vpaddd_avx(auVar358,auVar158);
                auVar358 = vfmadd213ps_fma(auVar358,auVar281,auVar158);
                auVar158 = vrcpps_avx(auVar358);
                auVar282._0_4_ = auVar158._0_4_ + auVar158._0_4_;
                auVar282._4_4_ = auVar158._4_4_ + auVar158._4_4_;
                auVar282._8_4_ = auVar158._8_4_ + auVar158._8_4_;
                auVar282._12_4_ = auVar158._12_4_ + auVar158._12_4_;
                auVar65._8_4_ = 0x40000000;
                auVar65._0_8_ = 0x4000000040000000;
                auVar65._12_4_ = 0x40000000;
                auVar358 = vfmsub213ps_fma(auVar358,auVar282,auVar65);
                auVar158 = vfnmadd213ps_fma(auVar358,auVar158,auVar282);
                auVar107 = vfmsub213ps_fma(auVar158,auVar161,auVar161);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar106._4_4_ = uVar1;
                auVar106._0_4_ = uVar1;
                auVar106._8_4_ = uVar1;
                auVar106._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar196._4_4_ = uVar1;
                auVar196._0_4_ = uVar1;
                auVar196._8_4_ = uVar1;
                auVar196._12_4_ = uVar1;
                auVar161 = vfmadd231ps_fma(auVar196,auVar161,auVar106);
                auVar161 = vmaxps_avx(auVar358,auVar161);
                auVar161 = vminps_avx(auVar161,auVar158);
                auVar107._0_4_ = auVar86._0_4_ * auVar161._0_4_;
                auVar107._4_4_ = auVar86._4_4_ * auVar161._4_4_;
                auVar107._8_4_ = auVar86._8_4_ * auVar161._8_4_;
                auVar107._12_4_ = auVar86._12_4_ * auVar161._12_4_;
              }
            }
            *pauVar44 = auVar107;
            pauVar44 = pauVar44 + 1;
          }
        }
      }
      if ((iVar4 == 1) && (_elempack == 4)) {
        uVar37 = 0;
        if (0 < iVar33) {
          uVar37 = (ulong)(uint)iVar33;
        }
        pvVar36 = (void *)0x0;
        if (0 < iVar49) {
          pvVar36 = pvVar34;
        }
        auVar258 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar306._8_4_ = 0x3f000000;
        auVar306._0_8_ = 0x3f0000003f000000;
        auVar306._12_4_ = 0x3f000000;
        auVar449._8_4_ = 0x3f800000;
        auVar449._0_8_ = 0x3f8000003f800000;
        auVar449._12_4_ = 0x3f800000;
        auVar436._8_4_ = 0xc2b0c0a5;
        auVar436._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar436._12_4_ = 0xc2b0c0a5;
        auVar333._8_4_ = 0xb95e8083;
        auVar333._0_8_ = 0xb95e8083b95e8083;
        auVar333._12_4_ = 0xb95e8083;
        auVar252._8_4_ = 0x3ab743ce;
        auVar252._0_8_ = 0x3ab743ce3ab743ce;
        auVar252._12_4_ = 0x3ab743ce;
        for (pvVar41 = (void *)0x0; pvVar41 != pvVar36; pvVar41 = (void *)((long)pvVar41 + 1)) {
          pauVar44 = (undefined1 (*) [16])
                     ((long)top_blob->w * (long)pvVar41 * top_blob->elemsize + (long)top_blob->data)
          ;
          pp_Var7 = this->_vptr_Convolution1D_x86_fma;
          for (iVar48 = 0; iVar48 <= iVar51; iVar48 = iVar48 + 1) {
            p_Var6 = pp_Var7[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
              auVar161 = ZEXT816(0) << 0x40;
            }
            else {
              auVar161 = *(undefined1 (*) [16])
                          (*(long *)(&this->field_0x190 + (long)p_Var6) + (long)pvVar41 * 0x10);
            }
            auVar327 = ZEXT1664(auVar161);
            pauVar54 = (undefined1 (*) [16])
                       ((this->weight_data_packed).cstep * (long)pvVar41 *
                        (this->weight_data_packed).elemsize + (long)(this->weight_data_packed).data)
            ;
            for (uVar40 = 0; uVar40 != uVar37; uVar40 = uVar40 + 1) {
              p_Var8 = this->_vptr_Convolution1D_x86_fma[-3];
              puVar45 = (undefined4 *)
                        ((long)(_func_int ***)local_98.data +
                        (long)*(int *)(&this->field_0xdc + (long)p_Var8) * (long)iVar48 * 4 +
                        (long)local_98.w * local_98.elemsize * uVar40);
              iVar42 = *(int *)(&this->field_0xd4 + (long)p_Var8);
              if (iVar42 < 1) {
                iVar42 = 0;
              }
              while (bVar55 = iVar42 != 0, iVar42 = iVar42 + -1, bVar55) {
                uVar1 = *puVar45;
                auVar108._4_4_ = uVar1;
                auVar108._0_4_ = uVar1;
                auVar108._8_4_ = uVar1;
                auVar108._12_4_ = uVar1;
                auVar161 = vfmadd231ps_fma(auVar327._0_16_,auVar108,*pauVar54);
                auVar327 = ZEXT1664(auVar161);
                puVar45 = puVar45 + *(int *)(&this->field_0xd8 + (long)p_Var8);
                pauVar54 = pauVar54 + 1;
              }
            }
            auVar161 = auVar327._0_16_;
            auVar115 = auVar161;
            if (*(int *)(&this->field_0xf4 + (long)p_Var6) - 1U < 6) {
              auVar158 = auVar258._0_16_;
              auVar115 = vmaxps_avx(auVar161,auVar158);
              switch(*(int *)(&this->field_0xf4 + (long)p_Var6)) {
              case 2:
                auVar161 = vminps_avx(auVar161,auVar158);
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar478._4_4_ = uVar1;
                auVar478._0_4_ = uVar1;
                auVar478._8_4_ = uVar1;
                auVar478._12_4_ = uVar1;
                auVar115 = vfmadd231ps_fma(auVar115,auVar161,auVar478);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar111._4_4_ = uVar1;
                auVar111._0_4_ = uVar1;
                auVar111._8_4_ = uVar1;
                auVar111._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar482._4_4_ = uVar1;
                auVar482._0_4_ = uVar1;
                auVar482._8_4_ = uVar1;
                auVar482._12_4_ = uVar1;
                auVar161 = vmaxps_avx(auVar161,auVar111);
                auVar115 = vminps_avx(auVar482,auVar161);
                break;
              case 4:
                auVar112._0_8_ = auVar327._0_8_ ^ 0x8000000080000000;
                auVar112._8_4_ = -auVar327._8_4_;
                auVar112._12_4_ = -auVar327._12_4_;
                auVar203._8_4_ = 0x42b0c0a5;
                auVar203._0_8_ = 0x42b0c0a542b0c0a5;
                auVar203._12_4_ = 0x42b0c0a5;
                auVar161 = vminps_avx(auVar112,auVar203);
                auVar204._8_4_ = 0xc2b0c0a5;
                auVar204._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar204._12_4_ = 0xc2b0c0a5;
                auVar358 = vmaxps_avx(auVar161,auVar204);
                auVar354._8_4_ = 0x3fb8aa3b;
                auVar354._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar354._12_4_ = 0x3fb8aa3b;
                auVar161 = vfmadd213ps_fma(auVar354,auVar358,auVar306);
                auVar483._0_4_ = (int)auVar161._0_4_;
                auVar483._4_4_ = (int)auVar161._4_4_;
                auVar483._8_4_ = (int)auVar161._8_4_;
                auVar483._12_4_ = (int)auVar161._12_4_;
                auVar158 = vcvtdq2ps_avx(auVar483);
                auVar161 = vcmpps_avx(auVar161,auVar158,1);
                auVar161 = vandps_avx(auVar161,auVar449);
                auVar161 = vsubps_avx(auVar158,auVar161);
                auVar205._8_4_ = 0x3f318000;
                auVar205._0_8_ = 0x3f3180003f318000;
                auVar205._12_4_ = 0x3f318000;
                auVar158 = vfmsub231ps_fma(auVar358,auVar161,auVar205);
                auVar206._8_4_ = 0x395e8083;
                auVar206._0_8_ = 0x395e8083395e8083;
                auVar206._12_4_ = 0x395e8083;
                auVar358 = vfmsub231ps_fma(auVar158,auVar161,auVar206);
                auVar484._0_4_ = auVar358._0_4_ * auVar358._0_4_;
                auVar484._4_4_ = auVar358._4_4_ * auVar358._4_4_;
                auVar484._8_4_ = auVar358._8_4_ * auVar358._8_4_;
                auVar484._12_4_ = auVar358._12_4_ * auVar358._12_4_;
                auVar406._8_4_ = 0x39506967;
                auVar406._0_8_ = 0x3950696739506967;
                auVar406._12_4_ = 0x39506967;
                auVar207._8_4_ = 0x3ab743ce;
                auVar207._0_8_ = 0x3ab743ce3ab743ce;
                auVar207._12_4_ = 0x3ab743ce;
                auVar158 = vfmadd213ps_fma(auVar406,auVar358,auVar207);
                auVar208._8_4_ = 0x3c088908;
                auVar208._0_8_ = 0x3c0889083c088908;
                auVar208._12_4_ = 0x3c088908;
                auVar158 = vfmadd213ps_fma(auVar158,auVar358,auVar208);
                auVar71._8_4_ = 0x3d2aa9c1;
                auVar71._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar71._12_4_ = 0x3d2aa9c1;
                auVar158 = vfmadd213ps_fma(auVar158,auVar358,auVar71);
                auVar72._8_4_ = 0x3e2aaaaa;
                auVar72._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar72._12_4_ = 0x3e2aaaaa;
                auVar158 = vfmadd213ps_fma(auVar158,auVar358,auVar72);
                auVar158 = vfmadd213ps_fma(auVar158,auVar358,auVar306);
                auVar158 = vfmadd213ps_fma(auVar158,auVar484,auVar358);
                auVar407._0_4_ = auVar158._0_4_ + 1.0;
                auVar407._4_4_ = auVar158._4_4_ + 1.0;
                auVar407._8_4_ = auVar158._8_4_ + 1.0;
                auVar407._12_4_ = auVar158._12_4_ + 1.0;
                auVar113._0_4_ = (int)auVar161._0_4_;
                auVar113._4_4_ = (int)auVar161._4_4_;
                auVar113._8_4_ = (int)auVar161._8_4_;
                auVar113._12_4_ = (int)auVar161._12_4_;
                auVar161 = vpslld_avx(auVar113,0x17);
                auVar161 = vpaddd_avx(auVar449,auVar161);
                auVar158 = vfmadd213ps_fma(auVar161,auVar407,auVar449);
                auVar258 = ZEXT464(0) << 0x20;
                auVar161 = vrcpps_avx(auVar158);
                auVar158 = vfmsub213ps_fma(auVar158,auVar161,auVar449);
                auVar115 = vfnmadd132ps_fma(auVar158,auVar161,auVar161);
                break;
              case 5:
                auVar426._8_4_ = 0x42b0c0a5;
                auVar426._0_8_ = 0x42b0c0a542b0c0a5;
                auVar426._12_4_ = 0x42b0c0a5;
                auVar158 = vminps_avx(auVar161,auVar426);
                auVar398 = vmaxps_avx(auVar436,auVar158);
                auVar443._8_4_ = 0x3fb8aa3b;
                auVar443._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar443._12_4_ = 0x3fb8aa3b;
                auVar158 = vfmadd213ps_fma(auVar443,auVar398,auVar306);
                auVar479._0_4_ = (int)auVar158._0_4_;
                auVar479._4_4_ = (int)auVar158._4_4_;
                auVar479._8_4_ = (int)auVar158._8_4_;
                auVar479._12_4_ = (int)auVar158._12_4_;
                auVar358 = vcvtdq2ps_avx(auVar479);
                auVar158 = vcmpps_avx(auVar158,auVar358,1);
                auVar158 = vandps_avx(auVar158,auVar449);
                auVar158 = vsubps_avx(auVar358,auVar158);
                auVar427._8_4_ = 0x3f318000;
                auVar427._0_8_ = 0x3f3180003f318000;
                auVar427._12_4_ = 0x3f318000;
                auVar358 = vfmsub231ps_fma(auVar398,auVar158,auVar427);
                auVar398 = vfnmsub231ps_fma(auVar358,auVar158,auVar333);
                auVar480._0_4_ = auVar398._0_4_ * auVar398._0_4_;
                auVar480._4_4_ = auVar398._4_4_ * auVar398._4_4_;
                auVar480._8_4_ = auVar398._8_4_ * auVar398._8_4_;
                auVar480._12_4_ = auVar398._12_4_ * auVar398._12_4_;
                auVar197._8_4_ = 0x39506967;
                auVar197._0_8_ = 0x3950696739506967;
                auVar197._12_4_ = 0x39506967;
                auVar358 = vfmadd213ps_fma(auVar197,auVar398,auVar252);
                auVar345._8_4_ = 0x3c088908;
                auVar345._0_8_ = 0x3c0889083c088908;
                auVar345._12_4_ = 0x3c088908;
                auVar358 = vfmadd213ps_fma(auVar358,auVar398,auVar345);
                auVar346._8_4_ = 0x3d2aa9c1;
                auVar346._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar346._12_4_ = 0x3d2aa9c1;
                auVar358 = vfmadd213ps_fma(auVar358,auVar398,auVar346);
                auVar283._8_4_ = 0x3e2aaaaa;
                auVar283._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar283._12_4_ = 0x3e2aaaaa;
                auVar358 = vfmadd213ps_fma(auVar358,auVar398,auVar283);
                auVar358 = vfmadd213ps_fma(auVar358,auVar398,auVar306);
                auVar358 = vfmadd213ps_fma(auVar358,auVar480,auVar398);
                auVar198._0_4_ = auVar358._0_4_ + 1.0;
                auVar198._4_4_ = auVar358._4_4_ + 1.0;
                auVar198._8_4_ = auVar358._8_4_ + 1.0;
                auVar198._12_4_ = auVar358._12_4_ + 1.0;
                auVar109._0_4_ = (int)auVar158._0_4_;
                auVar109._4_4_ = (int)auVar158._4_4_;
                auVar109._8_4_ = (int)auVar158._8_4_;
                auVar109._12_4_ = (int)auVar158._12_4_;
                auVar158 = vpslld_avx(auVar109,0x17);
                auVar158 = vpaddd_avx(auVar449,auVar158);
                auVar58 = vfmadd213ps_fma(auVar158,auVar198,auVar449);
                auVar199._8_4_ = 0x800000;
                auVar199._0_8_ = 0x80000000800000;
                auVar199._12_4_ = 0x800000;
                auVar158 = vmaxps_avx(auVar58,auVar199);
                auVar358 = vpsrld_avx(auVar158,0x17);
                auVar284._8_4_ = 0xffffff82;
                auVar284._0_8_ = 0xffffff82ffffff82;
                auVar284._12_4_ = 0xffffff82;
                auVar358 = vpaddd_avx(auVar358,auVar284);
                auVar285._8_4_ = 0x807fffff;
                auVar285._0_8_ = 0x807fffff807fffff;
                auVar285._12_4_ = 0x807fffff;
                auVar158 = vandps_avx(auVar158,auVar285);
                auVar393 = vorps_avx(auVar158,auVar306);
                auVar398 = vcvtdq2ps_avx(auVar358);
                auVar286._8_4_ = 0x3f3504f3;
                auVar286._0_8_ = 0x3f3504f33f3504f3;
                auVar286._12_4_ = 0x3f3504f3;
                auVar358 = vcmpps_avx(auVar393,auVar286,1);
                auVar158 = vandps_avx(auVar358,auVar393);
                auVar200._0_4_ = auVar393._0_4_ + -1.0 + auVar158._0_4_;
                auVar200._4_4_ = auVar393._4_4_ + -1.0 + auVar158._4_4_;
                auVar200._8_4_ = auVar393._8_4_ + -1.0 + auVar158._8_4_;
                auVar200._12_4_ = auVar393._12_4_ + -1.0 + auVar158._12_4_;
                auVar158 = vandps_avx(auVar358,auVar449);
                auVar358 = vsubps_avx(auVar398,auVar158);
                auVar405._0_4_ = auVar200._0_4_ * auVar200._0_4_;
                auVar405._4_4_ = auVar200._4_4_ * auVar200._4_4_;
                auVar405._8_4_ = auVar200._8_4_ * auVar200._8_4_;
                auVar405._12_4_ = auVar200._12_4_ * auVar200._12_4_;
                auVar481._8_4_ = 0x3d9021bb;
                auVar481._0_8_ = 0x3d9021bb3d9021bb;
                auVar481._12_4_ = 0x3d9021bb;
                auVar371._8_4_ = 0xbdebd1b8;
                auVar371._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar371._12_4_ = 0xbdebd1b8;
                auVar158 = vfmadd213ps_fma(auVar481,auVar200,auVar371);
                auVar372._8_4_ = 0x3def251a;
                auVar372._0_8_ = 0x3def251a3def251a;
                auVar372._12_4_ = 0x3def251a;
                auVar158 = vfmadd213ps_fma(auVar158,auVar200,auVar372);
                auVar373._8_4_ = 0xbdfe5d4f;
                auVar373._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar373._12_4_ = 0xbdfe5d4f;
                auVar158 = vfmadd213ps_fma(auVar158,auVar200,auVar373);
                auVar374._8_4_ = 0x3e11e9bf;
                auVar374._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar374._12_4_ = 0x3e11e9bf;
                auVar158 = vfmadd213ps_fma(auVar158,auVar200,auVar374);
                auVar375._8_4_ = 0xbe2aae50;
                auVar375._0_8_ = 0xbe2aae50be2aae50;
                auVar375._12_4_ = 0xbe2aae50;
                auVar158 = vfmadd213ps_fma(auVar158,auVar200,auVar375);
                auVar376._8_4_ = 0x3e4cceac;
                auVar376._0_8_ = 0x3e4cceac3e4cceac;
                auVar376._12_4_ = 0x3e4cceac;
                auVar158 = vfmadd213ps_fma(auVar158,auVar200,auVar376);
                auVar377._8_4_ = 0xbe7ffffc;
                auVar377._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar377._12_4_ = 0xbe7ffffc;
                auVar158 = vfmadd213ps_fma(auVar158,auVar200,auVar377);
                auVar378._8_4_ = 0x3eaaaaaa;
                auVar378._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar378._12_4_ = 0x3eaaaaaa;
                auVar158 = vfmadd213ps_fma(auVar158,auVar200,auVar378);
                auVar379._0_4_ = auVar405._0_4_ * auVar200._0_4_ * auVar158._0_4_;
                auVar379._4_4_ = auVar405._4_4_ * auVar200._4_4_ * auVar158._4_4_;
                auVar379._8_4_ = auVar405._8_4_ * auVar200._8_4_ * auVar158._8_4_;
                auVar379._12_4_ = auVar405._12_4_ * auVar200._12_4_ * auVar158._12_4_;
                auVar158 = vfmadd231ps_fma(auVar379,auVar358,auVar333);
                auVar398 = vfmsub231ps_fma(auVar158,auVar306,auVar405);
                auVar29._12_4_ = 0;
                auVar29._0_12_ = ZEXT412(0);
                auVar258 = ZEXT1264(ZEXT412(0)) << 0x20;
                auVar158 = vcmpps_avx(auVar58,auVar29 << 0x20,2);
                auVar398 = vsubps_avx(auVar398,auVar200);
                auVar358 = vfnmadd231ps_fma(auVar398,auVar427,auVar358);
                auVar201._0_4_ = auVar358._0_4_ + auVar358._0_4_;
                auVar201._4_4_ = auVar358._4_4_ + auVar358._4_4_;
                auVar201._8_4_ = auVar358._8_4_ + auVar358._8_4_;
                auVar201._12_4_ = auVar358._12_4_ + auVar358._12_4_;
                auVar287._8_4_ = 0x7fffffff;
                auVar287._0_8_ = 0x7fffffff7fffffff;
                auVar287._12_4_ = 0x7fffffff;
                auVar158 = vblendvps_avx(auVar201,auVar287,auVar158);
                auVar202._8_4_ = 0x42b0c0a5;
                auVar202._0_8_ = 0x42b0c0a542b0c0a5;
                auVar202._12_4_ = 0x42b0c0a5;
                auVar158 = vminps_avx(auVar158,auVar202);
                auVar398 = vmaxps_avx(auVar436,auVar158);
                auVar158 = vfmadd213ps_fma(auVar443,auVar398,auVar306);
                auVar288._0_4_ = (int)auVar158._0_4_;
                auVar288._4_4_ = (int)auVar158._4_4_;
                auVar288._8_4_ = (int)auVar158._8_4_;
                auVar288._12_4_ = (int)auVar158._12_4_;
                auVar358 = vcvtdq2ps_avx(auVar288);
                auVar158 = vcmpps_avx(auVar158,auVar358,1);
                auVar158 = vandps_avx(auVar449,auVar158);
                auVar158 = vsubps_avx(auVar358,auVar158);
                auVar358 = vfmsub231ps_fma(auVar398,auVar158,auVar427);
                auVar398 = vfnmsub231ps_fma(auVar358,auVar158,auVar333);
                auVar289._0_4_ = auVar398._0_4_ * auVar398._0_4_;
                auVar289._4_4_ = auVar398._4_4_ * auVar398._4_4_;
                auVar289._8_4_ = auVar398._8_4_ * auVar398._8_4_;
                auVar289._12_4_ = auVar398._12_4_ * auVar398._12_4_;
                auVar380._8_4_ = 0x39506967;
                auVar380._0_8_ = 0x3950696739506967;
                auVar380._12_4_ = 0x39506967;
                auVar358 = vfmadd213ps_fma(auVar380,auVar398,auVar252);
                auVar68._8_4_ = 0x3c088908;
                auVar68._0_8_ = 0x3c0889083c088908;
                auVar68._12_4_ = 0x3c088908;
                auVar358 = vfmadd213ps_fma(auVar358,auVar398,auVar68);
                auVar358 = vfmadd213ps_fma(auVar358,auVar398,auVar346);
                auVar69._8_4_ = 0x3e2aaaaa;
                auVar69._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar69._12_4_ = 0x3e2aaaaa;
                auVar358 = vfmadd213ps_fma(auVar358,auVar398,auVar69);
                auVar358 = vfmadd213ps_fma(auVar358,auVar398,auVar306);
                auVar358 = vfmadd213ps_fma(auVar358,auVar289,auVar398);
                auVar290._0_4_ = auVar358._0_4_ + 1.0;
                auVar290._4_4_ = auVar358._4_4_ + 1.0;
                auVar290._8_4_ = auVar358._8_4_ + 1.0;
                auVar290._12_4_ = auVar358._12_4_ + 1.0;
                auVar110._0_4_ = (int)auVar158._0_4_;
                auVar110._4_4_ = (int)auVar158._4_4_;
                auVar110._8_4_ = (int)auVar158._8_4_;
                auVar110._12_4_ = (int)auVar158._12_4_;
                auVar158 = vpslld_avx(auVar110,0x17);
                auVar158 = vpaddd_avx(auVar449,auVar158);
                auVar358 = vfmadd213ps_fma(auVar158,auVar290,auVar449);
                auVar158 = vrcpps_avx(auVar358);
                auVar291._0_4_ = auVar158._0_4_ + auVar158._0_4_;
                auVar291._4_4_ = auVar158._4_4_ + auVar158._4_4_;
                auVar291._8_4_ = auVar158._8_4_ + auVar158._8_4_;
                auVar291._12_4_ = auVar158._12_4_ + auVar158._12_4_;
                auVar70._8_4_ = 0x40000000;
                auVar70._0_8_ = 0x4000000040000000;
                auVar70._12_4_ = 0x40000000;
                auVar358 = vfmsub213ps_fma(auVar358,auVar291,auVar70);
                auVar158 = vfnmadd213ps_fma(auVar358,auVar158,auVar291);
                auVar115 = vfmsub213ps_fma(auVar158,auVar161,auVar161);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar114._4_4_ = uVar1;
                auVar114._0_4_ = uVar1;
                auVar114._8_4_ = uVar1;
                auVar114._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar209._4_4_ = uVar1;
                auVar209._0_4_ = uVar1;
                auVar209._8_4_ = uVar1;
                auVar209._12_4_ = uVar1;
                auVar161 = vfmadd231ps_fma(auVar209,auVar161,auVar114);
                auVar161 = vmaxps_avx(auVar158,auVar161);
                auVar161 = vminps_avx(auVar449,auVar161);
                auVar115._0_4_ = auVar327._0_4_ * auVar161._0_4_;
                auVar115._4_4_ = auVar327._4_4_ * auVar161._4_4_;
                auVar115._8_4_ = auVar327._8_4_ * auVar161._8_4_;
                auVar115._12_4_ = auVar327._12_4_ * auVar161._12_4_;
              }
            }
            *pauVar44 = auVar115;
            pauVar44 = pauVar44 + 1;
          }
        }
      }
      if ((iVar4 == 4) && (_elempack == 1)) {
        local_40 = top_blob->data;
        local_48 = (void *)((long)top_blob->w * top_blob->elemsize);
        uVar37 = 0;
        if (0 < iVar33) {
          uVar37 = (ulong)(uint)iVar33;
        }
        pvVar36 = (void *)0x0;
        if (0 < iVar49) {
          pvVar36 = pvVar34;
        }
        for (pvVar41 = (void *)0x0; pvVar11 = local_40, pvVar41 != pvVar36;
            pvVar41 = (void *)((long)pvVar41 + 1)) {
          lVar38 = (long)local_48 * (long)pvVar41;
          sVar9 = (this->weight_data_packed).cstep;
          sVar10 = (this->weight_data_packed).elemsize;
          pp_Var7 = this->_vptr_Convolution1D_x86_fma;
          pvVar12 = (this->weight_data_packed).data;
          for (lVar53 = 0; lVar53 <= lVar35; lVar53 = lVar53 + 1) {
            p_Var6 = pp_Var7[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
              auVar258 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar258 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var6) +
                                          (long)pvVar41 * 4));
            }
            pfVar46 = (float *)(sVar9 * (long)pvVar41 * sVar10 + (long)pvVar12);
            for (uVar40 = 0; uVar40 != uVar37; uVar40 = uVar40 + 1) {
              p_Var8 = this->_vptr_Convolution1D_x86_fma[-3];
              pfVar50 = (float *)((long)(_func_int ***)local_98.data +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var8) * (int)lVar53 * 4
                                       ) * 4 + (long)local_98.w * local_98.elemsize * uVar40);
              iVar51 = *(int *)(&this->field_0xd4 + (long)p_Var8);
              if (*(int *)(&this->field_0xd4 + (long)p_Var8) < 1) {
                iVar51 = 0;
              }
              while (bVar55 = iVar51 != 0, iVar51 = iVar51 + -1, bVar55) {
                auVar73._0_4_ = *pfVar46 * *pfVar50;
                auVar73._4_4_ = pfVar46[1] * pfVar50[1];
                auVar73._8_4_ = pfVar46[2] * pfVar50[2];
                auVar73._12_4_ = pfVar46[3] * pfVar50[3];
                auVar161 = vshufpd_avx(auVar73,auVar73,1);
                auVar74._0_4_ = auVar161._0_4_ + auVar73._0_4_;
                auVar74._4_4_ = auVar161._4_4_ + auVar73._4_4_;
                auVar74._8_4_ = auVar161._8_4_ + auVar73._8_4_;
                auVar74._12_4_ = auVar161._12_4_ + auVar73._12_4_;
                auVar161 = vmovshdup_avx(auVar74);
                auVar258 = ZEXT464((uint)(auVar161._0_4_ + auVar258._0_4_ + auVar74._0_4_));
                pfVar50 = pfVar50 + (long)*(int *)(&this->field_0xd8 + (long)p_Var8) * 4;
                pfVar46 = pfVar46 + 4;
              }
            }
            auVar161 = auVar258._0_16_;
            fVar56 = auVar258._0_4_;
            fVar57 = fVar56;
            switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
            case 1:
              auVar161 = vmaxss_avx(auVar161,ZEXT416(0));
              fVar57 = auVar161._0_4_;
              break;
            case 2:
              auVar161 = vcmpss_avx(ZEXT816(0) << 0x40,auVar161,1);
              auVar211._8_4_ = 0x3f800000;
              auVar211._0_8_ = 0x3f8000003f800000;
              auVar211._12_4_ = 0x3f800000;
              auVar161 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var6)),
                                       auVar211,auVar161);
              fVar57 = auVar161._0_4_ * fVar56;
              break;
            case 3:
              fVar56 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var6))[1];
              auVar161 = vmaxss_avx(auVar161,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var6)))
              ;
              fVar57 = auVar161._0_4_;
              if (fVar56 < auVar161._0_4_) {
                fVar57 = fVar56;
              }
              break;
            case 4:
              auVar161 = vminss_avx(auVar161,ZEXT416(0x42b0c0a5));
              auVar116._0_8_ = auVar161._0_8_ ^ 0x8000000080000000;
              auVar116._8_4_ = auVar161._8_4_ ^ 0x80000000;
              auVar116._12_4_ = auVar161._12_4_ ^ 0x80000000;
              auVar161 = vcmpss_avx(auVar161,ZEXT416(0xc2b0c0a5),1);
              auVar210._8_4_ = 0x42b0c0a5;
              auVar210._0_8_ = 0x42b0c0a542b0c0a5;
              auVar210._12_4_ = 0x42b0c0a5;
              auVar161 = vblendvps_avx(auVar116,auVar210,auVar161);
              fVar57 = expf(auVar161._0_4_);
              fVar57 = 1.0 / (fVar57 + 1.0);
              break;
            case 5:
              fVar57 = expf(fVar56);
              fVar57 = logf(fVar57 + 1.0);
              fVar57 = tanhf(fVar57);
              fVar57 = fVar57 * fVar56;
              break;
            case 6:
              fVar2 = **(float **)(&this->field_0xf8 + (long)p_Var6);
              fVar3 = (*(float **)(&this->field_0xf8 + (long)p_Var6))[1];
              fVar249 = -fVar3 / fVar2;
              fVar57 = 0.0;
              if ((fVar249 <= fVar56) && (fVar57 = fVar56, fVar56 <= fVar249 + 1.0 / fVar2)) {
                auVar161 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar161,ZEXT416((uint)fVar3));
                fVar57 = auVar161._0_4_ * fVar56;
              }
            }
            *(float *)((long)pvVar11 + lVar53 * 4 + lVar38) = fVar57;
          }
        }
      }
      local_d0 = 0;
      if ((iVar4 == 1) && (_elempack == 1)) {
        pvVar36 = top_blob->data;
        iVar4 = top_blob->w;
        sVar9 = top_blob->elemsize;
        uVar37 = 0;
        if (0 < iVar33) {
          uVar37 = (ulong)(uint)iVar33;
        }
        local_d0 = 0;
        if (iVar49 < 1) {
          pvVar34 = (void *)0x0;
        }
        for (pvVar41 = (void *)0x0; pvVar41 != pvVar34; pvVar41 = (void *)((long)pvVar41 + 1)) {
          pp_Var7 = this->_vptr_Convolution1D_x86_fma;
          for (lVar38 = 0; lVar38 <= lVar35; lVar38 = lVar38 + 1) {
            p_Var6 = pp_Var7[-3];
            if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
              auVar258 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar258 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var6) +
                                          (long)pvVar41 * 4));
            }
            iVar51 = *(int *)(&this->field_0xd4 + (long)p_Var6);
            puVar39 = (uint *)((long)(iVar33 * (int)pvVar41 * iVar51) * 4 +
                              *(long *)(&this->field_0x148 + (long)p_Var6));
            if (iVar51 < 1) {
              iVar51 = 0;
            }
            for (uVar40 = 0; uVar40 != uVar37; uVar40 = uVar40 + 1) {
              puVar47 = (uint *)((long)(_func_int ***)local_98.data +
                                (long)*(int *)(&this->field_0xdc + (long)p_Var6) * (long)(int)lVar38
                                * 4 + (long)local_98.w * local_98.elemsize * uVar40);
              iVar49 = iVar51;
              while (bVar55 = iVar49 != 0, iVar49 = iVar49 + -1, bVar55) {
                auVar161 = vfmadd231ss_fma(auVar258._0_16_,ZEXT416(*puVar39),ZEXT416(*puVar47));
                auVar258 = ZEXT1664(auVar161);
                puVar47 = puVar47 + *(int *)(&this->field_0xd8 + (long)p_Var6);
                puVar39 = puVar39 + 1;
              }
            }
            auVar161 = auVar258._0_16_;
            fVar56 = auVar258._0_4_;
            fVar57 = fVar56;
            switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
            case 1:
              auVar161 = vmaxss_avx(auVar161,ZEXT416(0));
              fVar57 = auVar161._0_4_;
              break;
            case 2:
              auVar161 = vcmpss_avx(ZEXT816(0) << 0x40,auVar161,1);
              auVar213._8_4_ = 0x3f800000;
              auVar213._0_8_ = 0x3f8000003f800000;
              auVar213._12_4_ = 0x3f800000;
              auVar161 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var6)),
                                       auVar213,auVar161);
              fVar57 = auVar161._0_4_ * fVar56;
              break;
            case 3:
              fVar56 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var6))[1];
              auVar161 = vmaxss_avx(auVar161,ZEXT416(**(uint **)(&this->field_0xf8 + (long)p_Var6)))
              ;
              fVar57 = auVar161._0_4_;
              if (fVar56 < auVar161._0_4_) {
                fVar57 = fVar56;
              }
              break;
            case 4:
              auVar161 = vminss_avx(auVar161,ZEXT416(0x42b0c0a5));
              auVar117._0_8_ = auVar161._0_8_ ^ 0x8000000080000000;
              auVar117._8_4_ = auVar161._8_4_ ^ 0x80000000;
              auVar117._12_4_ = auVar161._12_4_ ^ 0x80000000;
              auVar161 = vcmpss_avx(auVar161,ZEXT416(0xc2b0c0a5),1);
              auVar212._8_4_ = 0x42b0c0a5;
              auVar212._0_8_ = 0x42b0c0a542b0c0a5;
              auVar212._12_4_ = 0x42b0c0a5;
              auVar161 = vblendvps_avx(auVar117,auVar212,auVar161);
              fVar57 = expf(auVar161._0_4_);
              fVar57 = 1.0 / (fVar57 + 1.0);
              break;
            case 5:
              fVar57 = expf(fVar56);
              fVar57 = logf(fVar57 + 1.0);
              fVar57 = tanhf(fVar57);
              fVar57 = fVar57 * fVar56;
              break;
            case 6:
              fVar2 = **(float **)(&this->field_0xf8 + (long)p_Var6);
              fVar3 = (*(float **)(&this->field_0xf8 + (long)p_Var6))[1];
              fVar249 = -fVar3 / fVar2;
              fVar57 = 0.0;
              if ((fVar249 <= fVar56) && (fVar57 = fVar56, fVar56 <= fVar249 + 1.0 / fVar2)) {
                auVar161 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar161,ZEXT416((uint)fVar3));
                fVar57 = auVar161._0_4_ * fVar56;
              }
            }
            *(float *)((long)pvVar36 + lVar38 * 4 + (long)iVar4 * sVar9 * (long)pvVar41) = fVar57;
          }
        }
      }
    }
  }
  piVar30 = (int *)CONCAT44(local_98.refcount._4_4_,(int)local_98.refcount);
  if (piVar30 != (int *)0x0) {
    LOCK();
    *piVar30 = *piVar30 + -1;
    UNLOCK();
    if (*piVar30 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        free(local_98.data);
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_d0;
}

Assistant:

int Convolution1D_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_blob, tmp, 8, opt);

        Mat tmpout;
        forward(tmp, tmpout, opt);

        convert_packing(tmpout, top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}